

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  uint uVar102;
  ulong uVar103;
  ulong uVar104;
  long lVar105;
  uint uVar106;
  long lVar107;
  uint uVar108;
  uint uVar109;
  uint uVar110;
  bool bVar111;
  __m128 a;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar137;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar120 [16];
  undefined1 auVar131 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar132 [32];
  undefined1 auVar123 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar138;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar153 [16];
  float fVar169;
  float fVar170;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar190;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar189;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar179 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar231;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar226 [32];
  undefined1 auVar221 [28];
  float fVar229;
  float fVar230;
  float fVar232;
  undefined1 auVar222 [32];
  undefined1 auVar227 [32];
  float fVar233;
  undefined1 auVar228 [64];
  float fVar234;
  float fVar253;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar257;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar241 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  float fVar258;
  float fVar277;
  float fVar278;
  float fVar282;
  float fVar283;
  undefined1 auVar263 [32];
  float fVar268;
  float fVar270;
  float fVar272;
  float fVar274;
  float fVar275;
  float fVar279;
  float fVar280;
  float fVar284;
  float fVar285;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar267;
  float fVar269;
  float fVar273;
  float fVar276;
  float fVar281;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar271;
  undefined1 auVar266 [64];
  float fVar286;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  float fVar299;
  float fVar315;
  float fVar320;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar330;
  float fVar335;
  float fVar340;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar311 [32];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar357;
  float fVar358;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar352 [32];
  undefined1 auVar356 [64];
  float fVar359;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [64];
  undefined1 auVar375 [16];
  float fVar374;
  float fVar386;
  float fVar387;
  float fVar389;
  float fVar390;
  float fVar391;
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  float fVar388;
  float fVar392;
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar395 [16];
  float fVar393;
  float fVar394;
  float fVar403;
  float fVar405;
  float fVar409;
  float fVar411;
  float fVar413;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  float fVar404;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar410;
  float fVar412;
  float fVar414;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar415 [16];
  undefined1 auVar416 [28];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  float fVar421;
  undefined1 auVar422 [28];
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  float fVar432;
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_c80 [32];
  undefined1 local_c50 [8];
  float fStack_c48;
  float fStack_c44;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 (*local_af0) [16];
  ulong local_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 auStack_ab0 [16];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  Primitive *local_950;
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  RTCHitN local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  uint local_7d0;
  uint uStack_7cc;
  uint uStack_7c8;
  uint uStack_7c4;
  undefined1 auStack_7c0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar385 [64];
  undefined1 auVar402 [64];
  
  PVar19 = prim[1];
  uVar103 = (ulong)(byte)PVar19;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 5 + 6)));
  auVar304 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 5 + 10)));
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 6)));
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 10)));
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 6)));
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 10)));
  lVar105 = uVar103 * 0x25;
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x11 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x11 + 10)));
  fVar210 = *(float *)(prim + lVar105 + 0x12);
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar141 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar141 = vinsertps_avx(auVar141,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar31 = vsubps_avx(auVar31,*(undefined1 (*) [16])(prim + lVar105 + 6));
  local_c50._4_4_ = fVar210 * auVar31._4_4_;
  local_c50._0_4_ = fVar210 * auVar31._0_4_;
  fStack_c48 = fVar210 * auVar31._8_4_;
  fStack_c44 = fVar210 * auVar31._12_4_;
  auVar348._0_4_ = fVar210 * auVar141._0_4_;
  auVar348._4_4_ = fVar210 * auVar141._4_4_;
  auVar348._8_4_ = fVar210 * auVar141._8_4_;
  auVar348._12_4_ = fVar210 * auVar141._12_4_;
  auVar241._16_16_ = auVar196;
  auVar241._0_16_ = auVar33;
  auVar222._16_16_ = auVar304;
  auVar222._0_16_ = auVar34;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 6)));
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 10)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 10)));
  _local_a00 = vcvtdq2ps_avx(auVar222);
  auVar154._16_16_ = auVar173;
  auVar154._0_16_ = auVar115;
  auVar126 = vcvtdq2ps_avx(auVar154);
  auVar261._16_16_ = auVar142;
  auVar261._0_16_ = auVar117;
  auVar180._16_16_ = auVar35;
  auVar180._0_16_ = auVar116;
  _local_9e0 = vcvtdq2ps_avx(auVar180);
  auVar181._16_16_ = auVar36;
  auVar181._0_16_ = auVar119;
  auVar134 = vcvtdq2ps_avx(auVar181);
  auVar287._16_16_ = auVar141;
  auVar287._0_16_ = auVar31;
  auVar376._16_16_ = auVar196;
  auVar376._0_16_ = auVar33;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 6)));
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 10)));
  auVar417._16_16_ = auVar141;
  auVar417._0_16_ = auVar31;
  auVar31 = vshufps_avx(auVar348,auVar348,0x55);
  auVar141 = vshufps_avx(auVar348,auVar348,0xaa);
  fVar210 = auVar141._0_4_;
  fVar138 = auVar141._4_4_;
  fVar229 = auVar141._8_4_;
  fVar169 = auVar141._12_4_;
  fVar190 = auVar31._0_4_;
  fVar232 = auVar31._4_4_;
  fVar233 = auVar31._8_4_;
  fVar258 = auVar31._12_4_;
  auVar304 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar105 + 0x16)) *
                           *(float *)(prim + lVar105 + 0x1a)));
  _local_ac0 = ZEXT1632(auVar304);
  auVar26 = vcvtdq2ps_avx(auVar241);
  auVar27 = vcvtdq2ps_avx(auVar261);
  auVar28 = vcvtdq2ps_avx(auVar287);
  auVar29 = vcvtdq2ps_avx(auVar376);
  auVar30 = vcvtdq2ps_avx(auVar417);
  auVar31 = vshufps_avx(auVar348,auVar348,0);
  fVar230 = auVar31._0_4_;
  fVar137 = auVar31._4_4_;
  fVar231 = auVar31._8_4_;
  fVar170 = auVar31._12_4_;
  auVar423._0_4_ = fVar230 * auVar26._0_4_ + fVar190 * local_a00._0_4_ + fVar210 * auVar126._0_4_;
  auVar423._4_4_ = fVar137 * auVar26._4_4_ + fVar232 * local_a00._4_4_ + fVar138 * auVar126._4_4_;
  auVar423._8_4_ = fVar231 * auVar26._8_4_ + fVar233 * local_a00._8_4_ + fVar229 * auVar126._8_4_;
  auVar423._12_4_ =
       fVar170 * auVar26._12_4_ + fVar258 * local_a00._12_4_ + fVar169 * auVar126._12_4_;
  auVar423._16_4_ =
       fVar230 * auVar26._16_4_ + fVar190 * local_a00._16_4_ + fVar210 * auVar126._16_4_;
  auVar423._20_4_ =
       fVar137 * auVar26._20_4_ + fVar232 * local_a00._20_4_ + fVar138 * auVar126._20_4_;
  auVar423._24_4_ =
       fVar231 * auVar26._24_4_ + fVar233 * local_a00._24_4_ + fVar229 * auVar126._24_4_;
  auVar423._28_4_ = auVar196._12_4_ + 0.0;
  auVar396._0_4_ = fVar230 * auVar27._0_4_ + fVar190 * local_9e0._0_4_ + fVar210 * auVar134._0_4_;
  auVar396._4_4_ = fVar137 * auVar27._4_4_ + fVar232 * local_9e0._4_4_ + fVar138 * auVar134._4_4_;
  auVar396._8_4_ = fVar231 * auVar27._8_4_ + fVar233 * local_9e0._8_4_ + fVar229 * auVar134._8_4_;
  auVar396._12_4_ =
       fVar170 * auVar27._12_4_ + fVar258 * local_9e0._12_4_ + fVar169 * auVar134._12_4_;
  auVar396._16_4_ =
       fVar230 * auVar27._16_4_ + fVar190 * local_9e0._16_4_ + fVar210 * auVar134._16_4_;
  auVar396._20_4_ =
       fVar137 * auVar27._20_4_ + fVar232 * local_9e0._20_4_ + fVar138 * auVar134._20_4_;
  auVar396._24_4_ =
       fVar231 * auVar27._24_4_ + fVar233 * local_9e0._24_4_ + fVar229 * auVar134._24_4_;
  auVar396._28_4_ = 0;
  auVar377._0_4_ = fVar230 * auVar28._0_4_ + fVar190 * auVar29._0_4_ + fVar210 * auVar30._0_4_;
  auVar377._4_4_ = fVar137 * auVar28._4_4_ + fVar232 * auVar29._4_4_ + fVar138 * auVar30._4_4_;
  auVar377._8_4_ = fVar231 * auVar28._8_4_ + fVar233 * auVar29._8_4_ + fVar229 * auVar30._8_4_;
  auVar377._12_4_ = fVar170 * auVar28._12_4_ + fVar258 * auVar29._12_4_ + fVar169 * auVar30._12_4_;
  auVar377._16_4_ = fVar230 * auVar28._16_4_ + fVar190 * auVar29._16_4_ + fVar210 * auVar30._16_4_;
  auVar377._20_4_ = fVar137 * auVar28._20_4_ + fVar232 * auVar29._20_4_ + fVar138 * auVar30._20_4_;
  auVar377._24_4_ = fVar231 * auVar28._24_4_ + fVar233 * auVar29._24_4_ + fVar229 * auVar30._24_4_;
  auVar377._28_4_ = auVar196._12_4_ + fVar169 + 0.0;
  auVar31 = vshufps_avx(_local_c50,_local_c50,0x55);
  auVar141 = vshufps_avx(_local_c50,_local_c50,0xaa);
  fVar232 = auVar141._0_4_;
  fVar233 = auVar141._4_4_;
  fVar258 = auVar141._8_4_;
  fVar267 = auVar141._12_4_;
  fVar230 = auVar31._0_4_;
  fVar137 = auVar31._4_4_;
  fVar231 = auVar31._8_4_;
  fVar170 = auVar31._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar103 * 7 + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar103 * 7 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar141);
  fVar190 = auVar134._28_4_ + 0.0;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 0xe);
  auVar196 = vpmovsxwd_avx(auVar196);
  auVar34 = vshufps_avx(_local_c50,_local_c50,0);
  fVar210 = auVar34._0_4_;
  fVar138 = auVar34._4_4_;
  fVar229 = auVar34._8_4_;
  fVar169 = auVar34._12_4_;
  auVar155._0_4_ = auVar26._0_4_ * fVar210 + fVar230 * local_a00._0_4_ + fVar232 * auVar126._0_4_;
  auVar155._4_4_ = auVar26._4_4_ * fVar138 + fVar137 * local_a00._4_4_ + fVar233 * auVar126._4_4_;
  auVar155._8_4_ = auVar26._8_4_ * fVar229 + fVar231 * local_a00._8_4_ + fVar258 * auVar126._8_4_;
  auVar155._12_4_ =
       auVar26._12_4_ * fVar169 + fVar170 * local_a00._12_4_ + fVar267 * auVar126._12_4_;
  auVar155._16_4_ =
       auVar26._16_4_ * fVar210 + fVar230 * local_a00._16_4_ + fVar232 * auVar126._16_4_;
  auVar155._20_4_ =
       auVar26._20_4_ * fVar138 + fVar137 * local_a00._20_4_ + fVar233 * auVar126._20_4_;
  auVar155._24_4_ =
       auVar26._24_4_ * fVar229 + fVar231 * local_a00._24_4_ + fVar258 * auVar126._24_4_;
  auVar155._28_4_ = fVar170 + auVar126._28_4_ + 0.0;
  auVar124._0_4_ = fVar210 * auVar27._0_4_ + fVar230 * local_9e0._0_4_ + fVar232 * auVar134._0_4_;
  auVar124._4_4_ = fVar138 * auVar27._4_4_ + fVar137 * local_9e0._4_4_ + fVar233 * auVar134._4_4_;
  auVar124._8_4_ = fVar229 * auVar27._8_4_ + fVar231 * local_9e0._8_4_ + fVar258 * auVar134._8_4_;
  auVar124._12_4_ =
       fVar169 * auVar27._12_4_ + fVar170 * local_9e0._12_4_ + fVar267 * auVar134._12_4_;
  auVar124._16_4_ =
       fVar210 * auVar27._16_4_ + fVar230 * local_9e0._16_4_ + fVar232 * auVar134._16_4_;
  auVar124._20_4_ =
       fVar138 * auVar27._20_4_ + fVar137 * local_9e0._20_4_ + fVar233 * auVar134._20_4_;
  auVar124._24_4_ =
       fVar229 * auVar27._24_4_ + fVar231 * local_9e0._24_4_ + fVar258 * auVar134._24_4_;
  auVar124._28_4_ = fVar170 + fVar190;
  auVar262._8_4_ = 0x7fffffff;
  auVar262._0_8_ = 0x7fffffff7fffffff;
  auVar262._12_4_ = 0x7fffffff;
  auVar262._16_4_ = 0x7fffffff;
  auVar262._20_4_ = 0x7fffffff;
  auVar262._24_4_ = 0x7fffffff;
  auVar262._28_4_ = 0x7fffffff;
  auVar307._8_4_ = 0x219392ef;
  auVar307._0_8_ = 0x219392ef219392ef;
  auVar307._12_4_ = 0x219392ef;
  auVar307._16_4_ = 0x219392ef;
  auVar307._20_4_ = 0x219392ef;
  auVar307._24_4_ = 0x219392ef;
  auVar307._28_4_ = 0x219392ef;
  auVar126 = vandps_avx(auVar423,auVar262);
  auVar126 = vcmpps_avx(auVar126,auVar307,1);
  auVar134 = vblendvps_avx(auVar423,auVar307,auVar126);
  auVar126 = vandps_avx(auVar396,auVar262);
  auVar126 = vcmpps_avx(auVar126,auVar307,1);
  auVar26 = vblendvps_avx(auVar396,auVar307,auVar126);
  auVar126 = vandps_avx(auVar377,auVar262);
  auVar126 = vcmpps_avx(auVar126,auVar307,1);
  auVar126 = vblendvps_avx(auVar377,auVar307,auVar126);
  auVar182._0_4_ = fVar210 * auVar28._0_4_ + auVar29._0_4_ * fVar230 + fVar232 * auVar30._0_4_;
  auVar182._4_4_ = fVar138 * auVar28._4_4_ + auVar29._4_4_ * fVar137 + fVar233 * auVar30._4_4_;
  auVar182._8_4_ = fVar229 * auVar28._8_4_ + auVar29._8_4_ * fVar231 + fVar258 * auVar30._8_4_;
  auVar182._12_4_ = fVar169 * auVar28._12_4_ + auVar29._12_4_ * fVar170 + fVar267 * auVar30._12_4_;
  auVar182._16_4_ = fVar210 * auVar28._16_4_ + auVar29._16_4_ * fVar230 + fVar232 * auVar30._16_4_;
  auVar182._20_4_ = fVar138 * auVar28._20_4_ + auVar29._20_4_ * fVar137 + fVar233 * auVar30._20_4_;
  auVar182._24_4_ = fVar229 * auVar28._24_4_ + auVar29._24_4_ * fVar231 + fVar258 * auVar30._24_4_;
  auVar182._28_4_ = fVar190 + fVar170 + fVar267;
  auVar27 = vrcpps_avx(auVar134);
  fVar210 = auVar27._0_4_;
  fVar229 = auVar27._4_4_;
  auVar28._4_4_ = auVar134._4_4_ * fVar229;
  auVar28._0_4_ = auVar134._0_4_ * fVar210;
  fVar230 = auVar27._8_4_;
  auVar28._8_4_ = auVar134._8_4_ * fVar230;
  fVar231 = auVar27._12_4_;
  auVar28._12_4_ = auVar134._12_4_ * fVar231;
  fVar190 = auVar27._16_4_;
  auVar28._16_4_ = auVar134._16_4_ * fVar190;
  fVar232 = auVar27._20_4_;
  auVar28._20_4_ = auVar134._20_4_ * fVar232;
  fVar233 = auVar27._24_4_;
  auVar28._24_4_ = auVar134._24_4_ * fVar233;
  auVar28._28_4_ = auVar134._28_4_;
  auVar360._8_4_ = 0x3f800000;
  auVar360._0_8_ = 0x3f8000003f800000;
  auVar360._12_4_ = 0x3f800000;
  auVar360._16_4_ = 0x3f800000;
  auVar360._20_4_ = 0x3f800000;
  auVar360._24_4_ = 0x3f800000;
  auVar360._28_4_ = 0x3f800000;
  auVar29 = vsubps_avx(auVar360,auVar28);
  auVar28 = vrcpps_avx(auVar26);
  fVar210 = fVar210 + fVar210 * auVar29._0_4_;
  fVar229 = fVar229 + fVar229 * auVar29._4_4_;
  fVar230 = fVar230 + fVar230 * auVar29._8_4_;
  fVar231 = fVar231 + fVar231 * auVar29._12_4_;
  fVar190 = fVar190 + fVar190 * auVar29._16_4_;
  fVar232 = fVar232 + fVar232 * auVar29._20_4_;
  fVar233 = fVar233 + fVar233 * auVar29._24_4_;
  fVar234 = auVar28._0_4_;
  fVar251 = auVar28._4_4_;
  auVar134._4_4_ = fVar251 * auVar26._4_4_;
  auVar134._0_4_ = fVar234 * auVar26._0_4_;
  fVar252 = auVar28._8_4_;
  auVar134._8_4_ = fVar252 * auVar26._8_4_;
  fVar253 = auVar28._12_4_;
  auVar134._12_4_ = fVar253 * auVar26._12_4_;
  fVar254 = auVar28._16_4_;
  auVar134._16_4_ = fVar254 * auVar26._16_4_;
  fVar255 = auVar28._20_4_;
  auVar134._20_4_ = fVar255 * auVar26._20_4_;
  fVar256 = auVar28._24_4_;
  auVar134._24_4_ = fVar256 * auVar26._24_4_;
  auVar134._28_4_ = auVar27._28_4_;
  auVar26 = vsubps_avx(auVar360,auVar134);
  fVar234 = fVar234 + fVar234 * auVar26._0_4_;
  fVar251 = fVar251 + fVar251 * auVar26._4_4_;
  fVar252 = fVar252 + fVar252 * auVar26._8_4_;
  fVar253 = fVar253 + fVar253 * auVar26._12_4_;
  fVar254 = fVar254 + fVar254 * auVar26._16_4_;
  fVar255 = fVar255 + fVar255 * auVar26._20_4_;
  fVar256 = fVar256 + fVar256 * auVar26._24_4_;
  auVar134 = vrcpps_avx(auVar126);
  fVar258 = auVar134._0_4_;
  fVar267 = auVar134._4_4_;
  auVar30._4_4_ = fVar267 * auVar126._4_4_;
  auVar30._0_4_ = fVar258 * auVar126._0_4_;
  fVar269 = auVar134._8_4_;
  auVar30._8_4_ = fVar269 * auVar126._8_4_;
  fVar271 = auVar134._12_4_;
  auVar30._12_4_ = fVar271 * auVar126._12_4_;
  fVar273 = auVar134._16_4_;
  auVar30._16_4_ = fVar273 * auVar126._16_4_;
  fVar276 = auVar134._20_4_;
  auVar30._20_4_ = fVar276 * auVar126._20_4_;
  fVar281 = auVar134._24_4_;
  auVar30._24_4_ = fVar281 * auVar126._24_4_;
  auVar30._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar360,auVar30);
  fVar258 = fVar258 + fVar258 * auVar126._0_4_;
  fVar267 = fVar267 + fVar267 * auVar126._4_4_;
  fVar269 = fVar269 + fVar269 * auVar126._8_4_;
  fVar271 = fVar271 + fVar271 * auVar126._12_4_;
  fVar273 = fVar273 + fVar273 * auVar126._16_4_;
  fVar276 = fVar276 + fVar276 * auVar126._20_4_;
  fVar281 = fVar281 + fVar281 * auVar126._24_4_;
  auVar34 = vpermilps_avx(auVar304,0);
  auVar288._16_16_ = auVar141;
  auVar288._0_16_ = auVar31;
  auVar126 = vcvtdq2ps_avx(auVar288);
  auVar308._16_16_ = auVar196;
  auVar308._0_16_ = auVar33;
  auVar134 = vcvtdq2ps_avx(auVar308);
  auVar134 = vsubps_avx(auVar134,auVar126);
  fVar138 = auVar34._0_4_;
  fVar169 = auVar34._4_4_;
  fVar137 = auVar34._8_4_;
  fVar170 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar103 * 9 + 6);
  auVar31 = vpmovsxwd_avx(auVar34);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = *(ulong *)(prim + uVar103 * 9 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar304);
  auVar289._0_4_ = auVar134._0_4_ * fVar138 + auVar126._0_4_;
  auVar289._4_4_ = auVar134._4_4_ * fVar169 + auVar126._4_4_;
  auVar289._8_4_ = auVar134._8_4_ * fVar137 + auVar126._8_4_;
  auVar289._12_4_ = auVar134._12_4_ * fVar170 + auVar126._12_4_;
  auVar289._16_4_ = auVar134._16_4_ * fVar138 + auVar126._16_4_;
  auVar289._20_4_ = auVar134._20_4_ * fVar169 + auVar126._20_4_;
  auVar289._24_4_ = auVar134._24_4_ * fVar137 + auVar126._24_4_;
  auVar289._28_4_ = auVar134._28_4_ + auVar126._28_4_;
  auVar309._16_16_ = auVar141;
  auVar309._0_16_ = auVar31;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar31 = vpmovsxwd_avx(auVar115);
  auVar126 = vcvtdq2ps_avx(auVar309);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 0xe);
  auVar141 = vpmovsxwd_avx(auVar173);
  auVar349._16_16_ = auVar141;
  auVar349._0_16_ = auVar31;
  auVar134 = vcvtdq2ps_avx(auVar349);
  auVar134 = vsubps_avx(auVar134,auVar126);
  auVar310._0_4_ = auVar126._0_4_ + auVar134._0_4_ * fVar138;
  auVar310._4_4_ = auVar126._4_4_ + auVar134._4_4_ * fVar169;
  auVar310._8_4_ = auVar126._8_4_ + auVar134._8_4_ * fVar137;
  auVar310._12_4_ = auVar126._12_4_ + auVar134._12_4_ * fVar170;
  auVar310._16_4_ = auVar126._16_4_ + auVar134._16_4_ * fVar138;
  auVar310._20_4_ = auVar126._20_4_ + auVar134._20_4_ * fVar169;
  auVar310._24_4_ = auVar126._24_4_ + auVar134._24_4_ * fVar137;
  auVar310._28_4_ = auVar126._28_4_ + auVar134._28_4_;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar31 = vpmovsxwd_avx(auVar117);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar142);
  auVar350._16_16_ = auVar141;
  auVar350._0_16_ = auVar31;
  auVar126 = vcvtdq2ps_avx(auVar350);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar103 * 0x16 + 6);
  auVar31 = vpmovsxwd_avx(auVar116);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar103 * 0x16 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar35);
  auVar361._16_16_ = auVar141;
  auVar361._0_16_ = auVar31;
  auVar134 = vcvtdq2ps_avx(auVar361);
  auVar134 = vsubps_avx(auVar134,auVar126);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar103 * 0x14 + 6);
  auVar31 = vpmovsxwd_avx(auVar119);
  auVar351._0_4_ = auVar126._0_4_ + auVar134._0_4_ * fVar138;
  auVar351._4_4_ = auVar126._4_4_ + auVar134._4_4_ * fVar169;
  auVar351._8_4_ = auVar126._8_4_ + auVar134._8_4_ * fVar137;
  auVar351._12_4_ = auVar126._12_4_ + auVar134._12_4_ * fVar170;
  auVar351._16_4_ = auVar126._16_4_ + auVar134._16_4_ * fVar138;
  auVar351._20_4_ = auVar126._20_4_ + auVar134._20_4_ * fVar169;
  auVar351._24_4_ = auVar126._24_4_ + auVar134._24_4_ * fVar137;
  auVar351._28_4_ = auVar126._28_4_ + auVar134._28_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar103 * 0x14 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar36);
  auVar362._16_16_ = auVar141;
  auVar362._0_16_ = auVar31;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 6);
  auVar31 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar10);
  auVar126 = vcvtdq2ps_avx(auVar362);
  auVar378._16_16_ = auVar141;
  auVar378._0_16_ = auVar31;
  auVar134 = vcvtdq2ps_avx(auVar378);
  auVar134 = vsubps_avx(auVar134,auVar126);
  auVar363._0_4_ = auVar126._0_4_ + auVar134._0_4_ * fVar138;
  auVar363._4_4_ = auVar126._4_4_ + auVar134._4_4_ * fVar169;
  auVar363._8_4_ = auVar126._8_4_ + auVar134._8_4_ * fVar137;
  auVar363._12_4_ = auVar126._12_4_ + auVar134._12_4_ * fVar170;
  auVar363._16_4_ = auVar126._16_4_ + auVar134._16_4_ * fVar138;
  auVar363._20_4_ = auVar126._20_4_ + auVar134._20_4_ * fVar169;
  auVar363._24_4_ = auVar126._24_4_ + auVar134._24_4_ * fVar137;
  auVar363._28_4_ = auVar126._28_4_ + auVar134._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 6);
  auVar31 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 0xe);
  auVar141 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar103 * 0x21 + 6);
  auVar33 = vpmovsxwd_avx(auVar13);
  auVar379._16_16_ = auVar141;
  auVar379._0_16_ = auVar31;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar103 * 0x21 + 0xe);
  auVar31 = vpmovsxwd_avx(auVar14);
  auVar397._16_16_ = auVar31;
  auVar397._0_16_ = auVar33;
  auVar126 = vcvtdq2ps_avx(auVar379);
  auVar134 = vcvtdq2ps_avx(auVar397);
  auVar134 = vsubps_avx(auVar134,auVar126);
  auVar380._0_4_ = auVar126._0_4_ + auVar134._0_4_ * fVar138;
  auVar380._4_4_ = auVar126._4_4_ + auVar134._4_4_ * fVar169;
  auVar380._8_4_ = auVar126._8_4_ + auVar134._8_4_ * fVar137;
  auVar380._12_4_ = auVar126._12_4_ + auVar134._12_4_ * fVar170;
  auVar380._16_4_ = auVar126._16_4_ + auVar134._16_4_ * fVar138;
  auVar380._20_4_ = auVar126._20_4_ + auVar134._20_4_ * fVar169;
  auVar380._24_4_ = auVar126._24_4_ + auVar134._24_4_ * fVar137;
  auVar380._28_4_ = auVar126._28_4_ + auVar134._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar103 * 0x1f + 6);
  auVar31 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar103 * 0x1f + 0xe);
  auVar141 = vpmovsxwd_avx(auVar16);
  auVar398._16_16_ = auVar141;
  auVar398._0_16_ = auVar31;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 6);
  auVar31 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 0xe);
  auVar141 = vpmovsxwd_avx(auVar18);
  auVar418._16_16_ = auVar141;
  auVar418._0_16_ = auVar31;
  auVar126 = vcvtdq2ps_avx(auVar398);
  auVar134 = vcvtdq2ps_avx(auVar418);
  auVar134 = vsubps_avx(auVar134,auVar126);
  auVar399._0_4_ = auVar126._0_4_ + auVar134._0_4_ * fVar138;
  auVar399._4_4_ = auVar126._4_4_ + auVar134._4_4_ * fVar169;
  auVar399._8_4_ = auVar126._8_4_ + auVar134._8_4_ * fVar137;
  auVar399._12_4_ = auVar126._12_4_ + auVar134._12_4_ * fVar170;
  auVar399._16_4_ = auVar126._16_4_ + auVar134._16_4_ * fVar138;
  auVar399._20_4_ = auVar126._20_4_ + auVar134._20_4_ * fVar169;
  auVar399._24_4_ = auVar126._24_4_ + auVar134._24_4_ * fVar137;
  auVar399._28_4_ = auVar126._28_4_ + fVar170;
  auVar126 = vsubps_avx(auVar289,auVar155);
  auVar191._0_4_ = fVar210 * auVar126._0_4_;
  auVar191._4_4_ = fVar229 * auVar126._4_4_;
  auVar191._8_4_ = fVar230 * auVar126._8_4_;
  auVar191._12_4_ = fVar231 * auVar126._12_4_;
  auVar365._16_4_ = fVar190 * auVar126._16_4_;
  auVar365._0_16_ = auVar191;
  auVar365._20_4_ = fVar232 * auVar126._20_4_;
  auVar365._24_4_ = fVar233 * auVar126._24_4_;
  auVar365._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar310,auVar155);
  auVar211._0_4_ = fVar210 * auVar126._0_4_;
  auVar211._4_4_ = fVar229 * auVar126._4_4_;
  auVar211._8_4_ = fVar230 * auVar126._8_4_;
  auVar211._12_4_ = fVar231 * auVar126._12_4_;
  auVar37._16_4_ = fVar190 * auVar126._16_4_;
  auVar37._0_16_ = auVar211;
  auVar37._20_4_ = fVar232 * auVar126._20_4_;
  auVar37._24_4_ = fVar233 * auVar126._24_4_;
  auVar37._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar126 = vsubps_avx(auVar351,auVar124);
  auVar139._0_4_ = fVar234 * auVar126._0_4_;
  auVar139._4_4_ = fVar251 * auVar126._4_4_;
  auVar139._8_4_ = fVar252 * auVar126._8_4_;
  auVar139._12_4_ = fVar253 * auVar126._12_4_;
  auVar27._16_4_ = fVar254 * auVar126._16_4_;
  auVar27._0_16_ = auVar139;
  auVar27._20_4_ = fVar255 * auVar126._20_4_;
  auVar27._24_4_ = fVar256 * auVar126._24_4_;
  auVar27._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar363,auVar124);
  auVar235._0_4_ = fVar234 * auVar126._0_4_;
  auVar235._4_4_ = fVar251 * auVar126._4_4_;
  auVar235._8_4_ = fVar252 * auVar126._8_4_;
  auVar235._12_4_ = fVar253 * auVar126._12_4_;
  auVar29._16_4_ = fVar254 * auVar126._16_4_;
  auVar29._0_16_ = auVar235;
  auVar29._20_4_ = fVar255 * auVar126._20_4_;
  auVar29._24_4_ = fVar256 * auVar126._24_4_;
  auVar29._28_4_ = auVar28._28_4_ + auVar26._28_4_;
  auVar126 = vsubps_avx(auVar380,auVar182);
  auVar112._0_4_ = fVar258 * auVar126._0_4_;
  auVar112._4_4_ = fVar267 * auVar126._4_4_;
  auVar112._8_4_ = fVar269 * auVar126._8_4_;
  auVar112._12_4_ = fVar271 * auVar126._12_4_;
  auVar26._16_4_ = fVar273 * auVar126._16_4_;
  auVar26._0_16_ = auVar112;
  auVar26._20_4_ = fVar276 * auVar126._20_4_;
  auVar26._24_4_ = fVar281 * auVar126._24_4_;
  auVar26._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar399,auVar182);
  auVar171._0_4_ = fVar258 * auVar126._0_4_;
  auVar171._4_4_ = fVar267 * auVar126._4_4_;
  auVar171._8_4_ = fVar269 * auVar126._8_4_;
  auVar171._12_4_ = fVar271 * auVar126._12_4_;
  auVar312._16_4_ = fVar273 * auVar126._16_4_;
  auVar312._0_16_ = auVar171;
  auVar312._20_4_ = fVar276 * auVar126._20_4_;
  auVar312._24_4_ = fVar281 * auVar126._24_4_;
  auVar312._28_4_ = auVar126._28_4_;
  auVar31 = vpminsd_avx(auVar365._16_16_,auVar37._16_16_);
  auVar141 = vpminsd_avx(auVar191,auVar211);
  auVar311._16_16_ = auVar31;
  auVar311._0_16_ = auVar141;
  auVar31 = vpminsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar141 = vpminsd_avx(auVar139,auVar235);
  auVar352._16_16_ = auVar31;
  auVar352._0_16_ = auVar141;
  auVar126 = vmaxps_avx(auVar311,auVar352);
  auVar31 = vpminsd_avx(auVar26._16_16_,auVar312._16_16_);
  auVar141 = vpminsd_avx(auVar112,auVar171);
  auVar419._16_16_ = auVar31;
  auVar419._0_16_ = auVar141;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar424._4_4_ = uVar8;
  auVar424._0_4_ = uVar8;
  auVar424._8_4_ = uVar8;
  auVar424._12_4_ = uVar8;
  auVar424._16_4_ = uVar8;
  auVar424._20_4_ = uVar8;
  auVar424._24_4_ = uVar8;
  auVar424._28_4_ = uVar8;
  auVar134 = vmaxps_avx(auVar419,auVar424);
  auVar126 = vmaxps_avx(auVar126,auVar134);
  local_3a0._4_4_ = auVar126._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar126._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar126._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar126._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar126._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar126._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar126._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar126._28_4_;
  auVar31 = vpmaxsd_avx(auVar365._16_16_,auVar37._16_16_);
  auVar141 = vpmaxsd_avx(auVar191,auVar211);
  auVar204._16_16_ = auVar31;
  auVar204._0_16_ = auVar141;
  auVar31 = vpmaxsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar141 = vpmaxsd_avx(auVar139,auVar235);
  auVar156._16_16_ = auVar31;
  auVar156._0_16_ = auVar141;
  auVar126 = vminps_avx(auVar204,auVar156);
  auVar31 = vpmaxsd_avx(auVar26._16_16_,auVar312._16_16_);
  auVar141 = vpmaxsd_avx(auVar112,auVar171);
  auVar125._16_16_ = auVar31;
  auVar125._0_16_ = auVar141;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar183._4_4_ = uVar8;
  auVar183._0_4_ = uVar8;
  auVar183._8_4_ = uVar8;
  auVar183._12_4_ = uVar8;
  auVar183._16_4_ = uVar8;
  auVar183._20_4_ = uVar8;
  auVar183._24_4_ = uVar8;
  auVar183._28_4_ = uVar8;
  auVar134 = vminps_avx(auVar125,auVar183);
  auVar126 = vminps_avx(auVar126,auVar134);
  auVar38._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar38._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar38._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar38._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar38._16_4_ = auVar126._16_4_ * 1.0000004;
  auVar38._20_4_ = auVar126._20_4_ * 1.0000004;
  auVar38._24_4_ = auVar126._24_4_ * 1.0000004;
  auVar38._28_4_ = auVar126._28_4_;
  auVar126 = vcmpps_avx(local_3a0,auVar38,2);
  auVar31 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar157._16_16_ = auVar31;
  auVar157._0_16_ = auVar31;
  auVar134 = vcvtdq2ps_avx(auVar157);
  auVar134 = vcmpps_avx(_DAT_01f7b060,auVar134,1);
  auVar126 = vandps_avx(auVar126,auVar134);
  uVar106 = vmovmskps_avx(auVar126);
  auVar126._16_16_ = mm_lookupmask_ps._240_16_;
  auVar126._0_16_ = mm_lookupmask_ps._240_16_;
  local_600 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,0x80);
  local_af0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_950 = prim;
LAB_00ace738:
  local_948 = (ulong)uVar106;
  if (local_948 == 0) {
    return;
  }
  lVar105 = 0;
  if (local_948 != 0) {
    for (; (uVar106 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
    }
  }
  uVar106 = *(uint *)(local_950 + 2);
  local_ae8 = (ulong)*(uint *)(local_950 + lVar105 * 4 + 6);
  pGVar20 = (context->scene->geometries).items[uVar106].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                            local_ae8 *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar210 = (pGVar20->time_range).lower;
  fVar210 = pGVar20->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar210) / ((pGVar20->time_range).upper - fVar210));
  auVar31 = vroundss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),9);
  auVar31 = vminss_avx(auVar31,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
  auVar31 = vmaxss_avx(ZEXT816(0) << 0x20,auVar31);
  fVar210 = fVar210 - auVar31._0_4_;
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar107 = (long)(int)auVar31._0_4_ * 0x38;
  lVar22 = *(long *)(_Var21 + 0x10 + lVar107);
  lVar23 = *(long *)(_Var21 + 0x38 + lVar107);
  lVar24 = *(long *)(_Var21 + 0x48 + lVar107);
  auVar31 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
  pfVar1 = (float *)(lVar23 + uVar103 * lVar24);
  fVar137 = auVar31._0_4_;
  fVar231 = auVar31._4_4_;
  fVar170 = auVar31._8_4_;
  fVar190 = auVar31._12_4_;
  pfVar2 = (float *)(lVar23 + (uVar103 + 1) * lVar24);
  pfVar3 = (float *)(lVar23 + (uVar103 + 2) * lVar24);
  pfVar4 = (float *)(lVar23 + lVar24 * (uVar103 + 3));
  lVar23 = *(long *)(_Var21 + lVar107);
  auVar31 = vshufps_avx(ZEXT416((uint)(1.0 - fVar210)),ZEXT416((uint)(1.0 - fVar210)),0);
  pfVar5 = (float *)(lVar23 + lVar22 * uVar103);
  fVar138 = auVar31._0_4_;
  fVar229 = auVar31._4_4_;
  fVar169 = auVar31._8_4_;
  fVar230 = auVar31._12_4_;
  pfVar6 = (float *)(lVar23 + lVar22 * (uVar103 + 1));
  pfVar7 = (float *)(lVar23 + lVar22 * (uVar103 + 2));
  auVar172._0_4_ = fVar137 * *pfVar1 + fVar138 * *pfVar5;
  auVar172._4_4_ = fVar231 * pfVar1[1] + fVar229 * pfVar5[1];
  auVar172._8_4_ = fVar170 * pfVar1[2] + fVar169 * pfVar5[2];
  auVar172._12_4_ = fVar190 * pfVar1[3] + fVar230 * pfVar5[3];
  auVar140._0_4_ = fVar138 * *pfVar6 + fVar137 * *pfVar2;
  auVar140._4_4_ = fVar229 * pfVar6[1] + fVar231 * pfVar2[1];
  auVar140._8_4_ = fVar169 * pfVar6[2] + fVar170 * pfVar2[2];
  auVar140._12_4_ = fVar230 * pfVar6[3] + fVar190 * pfVar2[3];
  pfVar1 = (float *)(lVar23 + lVar22 * (uVar103 + 3));
  auVar192._0_4_ = fVar138 * *pfVar7 + fVar137 * *pfVar3;
  auVar192._4_4_ = fVar229 * pfVar7[1] + fVar231 * pfVar3[1];
  auVar192._8_4_ = fVar169 * pfVar7[2] + fVar170 * pfVar3[2];
  auVar192._12_4_ = fVar230 * pfVar7[3] + fVar190 * pfVar3[3];
  auVar31 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar141 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar210 = *(float *)(ray + k * 4 + 0x40);
  auVar375._4_4_ = fVar210;
  auVar375._0_4_ = fVar210;
  auVar375._8_4_ = fVar210;
  auVar375._12_4_ = fVar210;
  fStack_930 = fVar210;
  _local_940 = auVar375;
  fStack_92c = fVar210;
  fStack_928 = fVar210;
  fStack_924 = fVar210;
  auVar385 = ZEXT3264(_local_940);
  auVar236._0_4_ = fVar138 * *pfVar1 + fVar137 * *pfVar4;
  auVar236._4_4_ = fVar229 * pfVar1[1] + fVar231 * pfVar4[1];
  auVar236._8_4_ = fVar169 * pfVar1[2] + fVar170 * pfVar4[2];
  auVar236._12_4_ = fVar230 * pfVar1[3] + fVar190 * pfVar4[3];
  fVar138 = *(float *)(ray + k * 4 + 0x50);
  auVar395._4_4_ = fVar138;
  auVar395._0_4_ = fVar138;
  auVar395._8_4_ = fVar138;
  auVar395._12_4_ = fVar138;
  fStack_750 = fVar138;
  _local_760 = auVar395;
  fStack_74c = fVar138;
  fStack_748 = fVar138;
  fStack_744 = fVar138;
  auVar402 = ZEXT3264(_local_760);
  auVar31 = vunpcklps_avx(auVar375,auVar395);
  fVar229 = *(float *)(ray + k * 4 + 0x60);
  auVar415._4_4_ = fVar229;
  auVar415._0_4_ = fVar229;
  auVar415._8_4_ = fVar229;
  auVar415._12_4_ = fVar229;
  fStack_770 = fVar229;
  _local_780 = auVar415;
  fStack_76c = fVar229;
  fStack_768 = fVar229;
  fStack_764 = fVar229;
  _local_a50 = vinsertps_avx(auVar31,auVar415,0x28);
  auVar356 = ZEXT1664(_local_a50);
  auVar113._0_4_ = (auVar172._0_4_ + auVar140._0_4_ + auVar192._0_4_ + auVar236._0_4_) * 0.25;
  auVar113._4_4_ = (auVar172._4_4_ + auVar140._4_4_ + auVar192._4_4_ + auVar236._4_4_) * 0.25;
  auVar113._8_4_ = (auVar172._8_4_ + auVar140._8_4_ + auVar192._8_4_ + auVar236._8_4_) * 0.25;
  auVar113._12_4_ = (auVar172._12_4_ + auVar140._12_4_ + auVar192._12_4_ + auVar236._12_4_) * 0.25;
  auVar31 = vsubps_avx(auVar113,auVar141);
  auVar31 = vdpps_avx(auVar31,_local_a50,0x7f);
  local_a60 = vdpps_avx(_local_a50,_local_a50,0x7f);
  auVar367 = ZEXT1664(local_a60);
  auVar33 = vrcpss_avx(local_a60,local_a60);
  fVar169 = auVar31._0_4_ * auVar33._0_4_ * (2.0 - local_a60._0_4_ * auVar33._0_4_);
  auVar292 = ZEXT464((uint)fVar169);
  auVar33 = vshufps_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),0);
  auVar212._0_4_ = auVar141._0_4_ + local_a50._0_4_ * auVar33._0_4_;
  auVar212._4_4_ = auVar141._4_4_ + local_a50._4_4_ * auVar33._4_4_;
  auVar212._8_4_ = auVar141._8_4_ + local_a50._8_4_ * auVar33._8_4_;
  auVar212._12_4_ = auVar141._12_4_ + local_a50._12_4_ * auVar33._12_4_;
  auVar31 = vblendps_avx(auVar212,_DAT_01f45a50,8);
  auVar196 = vsubps_avx(auVar172,auVar31);
  auVar266 = ZEXT1664(auVar196);
  auVar34 = vsubps_avx(auVar192,auVar31);
  auVar304 = vsubps_avx(auVar140,auVar31);
  auVar115 = vsubps_avx(auVar236,auVar31);
  auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar31 = vshufps_avx(auVar196,auVar196,0);
  auVar141 = vshufps_avx(auVar196,auVar196,0x55);
  register0x00001250 = auVar141;
  _local_1e0 = auVar141;
  auVar141 = vshufps_avx(auVar196,auVar196,0xaa);
  register0x00001250 = auVar141;
  _local_200 = auVar141;
  _local_ac0 = auVar196;
  auVar141 = vshufps_avx(auVar196,auVar196,0xff);
  register0x00001290 = auVar141;
  _local_220 = auVar141;
  auVar141 = vshufps_avx(auVar304,auVar304,0);
  register0x00001290 = auVar141;
  _local_240 = auVar141;
  auVar141 = vshufps_avx(auVar304,auVar304,0x55);
  register0x00001290 = auVar141;
  _local_260 = auVar141;
  auVar141 = vshufps_avx(auVar304,auVar304,0xaa);
  register0x00001290 = auVar141;
  _local_280 = auVar141;
  _local_9e0 = auVar304;
  auVar141 = vshufps_avx(auVar304,auVar304,0xff);
  register0x00001290 = auVar141;
  _local_4e0 = auVar141;
  auVar141 = vshufps_avx(auVar34,auVar34,0);
  register0x00001290 = auVar141;
  _local_500 = auVar141;
  auVar141 = vshufps_avx(auVar34,auVar34,0x55);
  register0x00001290 = auVar141;
  _local_520 = auVar141;
  auVar141 = vshufps_avx(auVar34,auVar34,0xaa);
  register0x00001290 = auVar141;
  _local_540 = auVar141;
  auVar141 = vshufps_avx(auVar34,auVar34,0xff);
  register0x00001290 = auVar141;
  _local_560 = auVar141;
  auVar141 = vshufps_avx(auVar115,auVar115,0);
  register0x00001290 = auVar141;
  _local_580 = auVar141;
  auVar141 = vshufps_avx(auVar115,auVar115,0x55);
  register0x00001290 = auVar141;
  _local_5a0 = auVar141;
  auVar141 = vshufps_avx(auVar115,auVar115,0xaa);
  register0x00001290 = auVar141;
  _local_5c0 = auVar141;
  _local_a00 = auVar115;
  auVar141 = vshufps_avx(auVar115,auVar115,0xff);
  register0x00001290 = auVar141;
  _local_5e0 = auVar141;
  auVar141 = ZEXT416((uint)(fVar210 * fVar210 + fVar138 * fVar138 + fVar229 * fVar229));
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  local_2a0._16_16_ = auVar141;
  local_2a0._0_16_ = auVar141;
  auVar250 = ZEXT3264(local_2a0);
  fVar210 = *(float *)(ray + k * 4 + 0x30);
  local_970 = ZEXT416((uint)fVar169);
  auVar141 = vshufps_avx(ZEXT416((uint)(fVar210 - fVar169)),ZEXT416((uint)(fVar210 - fVar169)),0);
  local_380._16_16_ = auVar141;
  local_380._0_16_ = auVar141;
  local_850 = vpshufd_avx(ZEXT416(uVar106),0);
  local_860 = vpshufd_avx(ZEXT416(*(uint *)(local_950 + lVar105 * 4 + 6)),0);
  register0x00001210 = auVar33;
  _local_a40 = auVar33;
  uVar109 = 0;
  uVar108 = 1;
  auVar127._8_4_ = 0x7fffffff;
  auVar127._0_8_ = 0x7fffffff7fffffff;
  auVar127._12_4_ = 0x7fffffff;
  auVar127._16_4_ = 0x7fffffff;
  auVar127._20_4_ = 0x7fffffff;
  auVar127._24_4_ = 0x7fffffff;
  auVar127._28_4_ = 0x7fffffff;
  local_660 = vandps_avx(local_2a0,auVar127);
  auVar141 = vsqrtss_avx(local_a60,local_a60);
  auVar33 = vsqrtss_avx(local_a60,local_a60);
  local_690 = ZEXT816(0x3f80000000000000);
  do {
    auVar196 = vmovshdup_avx(local_690);
    auVar115 = vsubps_avx(auVar196,local_690);
    auVar196 = vshufps_avx(local_690,local_690,0);
    local_6c0._16_16_ = auVar196;
    local_6c0._0_16_ = auVar196;
    auVar304 = vshufps_avx(auVar115,auVar115,0);
    local_6e0._16_16_ = auVar304;
    local_6e0._0_16_ = auVar304;
    fVar433 = auVar304._0_4_;
    fVar434 = auVar304._4_4_;
    fVar435 = auVar304._8_4_;
    fVar437 = auVar304._12_4_;
    fVar438 = auVar196._0_4_;
    auVar205._0_4_ = fVar438 + fVar433 * 0.0;
    fVar439 = auVar196._4_4_;
    auVar205._4_4_ = fVar439 + fVar434 * 0.14285715;
    fVar440 = auVar196._8_4_;
    auVar205._8_4_ = fVar440 + fVar435 * 0.2857143;
    fVar189 = auVar196._12_4_;
    auVar205._12_4_ = fVar189 + fVar437 * 0.42857146;
    auVar205._16_4_ = fVar438 + fVar433 * 0.5714286;
    auVar205._20_4_ = fVar439 + fVar434 * 0.71428573;
    auVar205._24_4_ = fVar440 + fVar435 * 0.8571429;
    auVar205._28_4_ = fVar189 + fVar437;
    auVar126 = vsubps_avx(auVar228._0_32_,auVar205);
    fVar138 = auVar126._0_4_;
    fVar229 = auVar126._4_4_;
    fVar169 = auVar126._8_4_;
    fVar230 = auVar126._12_4_;
    fVar137 = auVar126._16_4_;
    fVar231 = auVar126._20_4_;
    fVar170 = auVar126._24_4_;
    fVar232 = fVar138 * fVar138 * fVar138;
    fVar281 = fVar229 * fVar229 * fVar229;
    fVar251 = fVar169 * fVar169 * fVar169;
    fVar253 = fVar230 * fVar230 * fVar230;
    fVar255 = fVar137 * fVar137 * fVar137;
    fVar277 = fVar231 * fVar231 * fVar231;
    fVar282 = fVar170 * fVar170 * fVar170;
    fVar286 = auVar205._0_4_ * auVar205._0_4_ * auVar205._0_4_;
    fVar293 = auVar205._4_4_ * auVar205._4_4_ * auVar205._4_4_;
    fVar294 = auVar205._8_4_ * auVar205._8_4_ * auVar205._8_4_;
    fVar295 = auVar205._12_4_ * auVar205._12_4_ * auVar205._12_4_;
    fVar296 = auVar205._16_4_ * auVar205._16_4_ * auVar205._16_4_;
    fVar297 = auVar205._20_4_ * auVar205._20_4_ * auVar205._20_4_;
    fVar298 = auVar205._24_4_ * auVar205._24_4_ * auVar205._24_4_;
    fVar190 = auVar205._0_4_ * fVar138;
    fVar233 = auVar205._4_4_ * fVar229;
    fVar258 = auVar205._8_4_ * fVar169;
    fVar267 = auVar205._12_4_ * fVar230;
    fVar269 = auVar205._16_4_ * fVar137;
    fVar273 = auVar205._20_4_ * fVar231;
    fVar276 = auVar205._24_4_ * fVar170;
    fVar271 = auVar367._28_4_ + auVar402._28_4_;
    fVar345 = auVar292._28_4_ + auVar250._28_4_ + fVar271;
    fVar357 = fVar271 + auVar266._28_4_ + auVar385._28_4_ + auVar356._28_4_;
    fVar271 = fVar232 * 0.16666667;
    fVar234 = fVar281 * 0.16666667;
    fVar252 = fVar251 * 0.16666667;
    fVar254 = fVar253 * 0.16666667;
    fVar256 = fVar255 * 0.16666667;
    fVar278 = fVar277 * 0.16666667;
    fVar283 = fVar282 * 0.16666667;
    fVar299 = (fVar286 + fVar232 * 4.0 + fVar138 * fVar190 * 12.0 + auVar205._0_4_ * fVar190 * 6.0)
              * 0.16666667;
    fVar315 = (fVar293 + fVar281 * 4.0 + fVar229 * fVar233 * 12.0 + auVar205._4_4_ * fVar233 * 6.0)
              * 0.16666667;
    fVar320 = (fVar294 + fVar251 * 4.0 + fVar169 * fVar258 * 12.0 + auVar205._8_4_ * fVar258 * 6.0)
              * 0.16666667;
    fVar325 = (fVar295 + fVar253 * 4.0 + fVar230 * fVar267 * 12.0 + auVar205._12_4_ * fVar267 * 6.0)
              * 0.16666667;
    fVar330 = (fVar296 + fVar255 * 4.0 + fVar137 * fVar269 * 12.0 + auVar205._16_4_ * fVar269 * 6.0)
              * 0.16666667;
    fVar335 = (fVar297 + fVar277 * 4.0 + fVar231 * fVar273 * 12.0 + auVar205._20_4_ * fVar273 * 6.0)
              * 0.16666667;
    fVar340 = (fVar298 + fVar282 * 4.0 + fVar170 * fVar276 * 12.0 + auVar205._24_4_ * fVar276 * 6.0)
              * 0.16666667;
    fVar232 = (fVar286 * 4.0 + fVar232 + auVar205._0_4_ * fVar190 * 12.0 + fVar138 * fVar190 * 6.0)
              * 0.16666667;
    fVar281 = (fVar293 * 4.0 + fVar281 + auVar205._4_4_ * fVar233 * 12.0 + fVar229 * fVar233 * 6.0)
              * 0.16666667;
    fVar251 = (fVar294 * 4.0 + fVar251 + auVar205._8_4_ * fVar258 * 12.0 + fVar169 * fVar258 * 6.0)
              * 0.16666667;
    fVar253 = (fVar295 * 4.0 + fVar253 + auVar205._12_4_ * fVar267 * 12.0 + fVar230 * fVar267 * 6.0)
              * 0.16666667;
    fVar255 = (fVar296 * 4.0 + fVar255 + auVar205._16_4_ * fVar269 * 12.0 + fVar137 * fVar269 * 6.0)
              * 0.16666667;
    fVar277 = (fVar297 * 4.0 + fVar277 + auVar205._20_4_ * fVar273 * 12.0 + fVar231 * fVar273 * 6.0)
              * 0.16666667;
    fVar282 = (fVar298 * 4.0 + fVar282 + auVar205._24_4_ * fVar276 * 12.0 + fVar170 * fVar276 * 6.0)
              * 0.16666667;
    fVar286 = fVar286 * 0.16666667;
    fVar293 = fVar293 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar295 = fVar295 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar297 = fVar297 * 0.16666667;
    fVar298 = fVar298 * 0.16666667;
    fVar392 = auVar385._28_4_ + 12.0;
    fVar358 = fVar357 + 12.166667;
    fVar274 = auVar31._0_4_;
    fVar279 = auVar31._4_4_;
    fVar284 = auVar31._8_4_;
    fVar436 = auVar31._12_4_;
    fVar300 = fVar274 * fVar271 +
              fVar299 * (float)local_240._0_4_ +
              fVar286 * (float)local_580._0_4_ + fVar232 * (float)local_500._0_4_;
    fVar316 = fVar279 * fVar234 +
              fVar315 * (float)local_240._4_4_ +
              fVar293 * (float)local_580._4_4_ + fVar281 * (float)local_500._4_4_;
    fVar321 = fVar284 * fVar252 + fVar320 * fStack_238 + fVar294 * fStack_578 + fVar251 * fStack_4f8
    ;
    fVar326 = fVar436 * fVar254 + fVar325 * fStack_234 + fVar295 * fStack_574 + fVar253 * fStack_4f4
    ;
    fVar331 = fVar274 * fVar256 + fVar330 * fStack_230 + fVar296 * fStack_570 + fVar255 * fStack_4f0
    ;
    fVar336 = fVar279 * fVar278 + fVar335 * fStack_22c + fVar297 * fStack_56c + fVar277 * fStack_4ec
    ;
    fVar341 = fVar284 * fVar283 + fVar340 * fStack_228 + fVar298 * fStack_568 + fVar282 * fStack_4e8
    ;
    fVar346 = fVar345 + fVar358;
    fVar301 = (float)local_1e0._0_4_ * fVar271 +
              (float)local_260._0_4_ * fVar299 +
              fVar286 * (float)local_5a0._0_4_ + fVar232 * (float)local_520._0_4_;
    fVar317 = (float)local_1e0._4_4_ * fVar234 +
              (float)local_260._4_4_ * fVar315 +
              fVar293 * (float)local_5a0._4_4_ + fVar281 * (float)local_520._4_4_;
    fVar322 = fStack_1d8 * fVar252 +
              fStack_258 * fVar320 + fVar294 * fStack_598 + fVar251 * fStack_518;
    fVar327 = fStack_1d4 * fVar254 +
              fStack_254 * fVar325 + fVar295 * fStack_594 + fVar253 * fStack_514;
    fVar332 = fStack_1d0 * fVar256 +
              fStack_250 * fVar330 + fVar296 * fStack_590 + fVar255 * fStack_510;
    fVar337 = fStack_1cc * fVar278 +
              fStack_24c * fVar335 + fVar297 * fStack_58c + fVar277 * fStack_50c;
    fVar342 = fStack_1c8 * fVar283 +
              fStack_248 * fVar340 + fVar298 * fStack_588 + fVar282 * fStack_508;
    fVar347 = fVar346 + fVar392 + 12.166667;
    local_a20 = (float)local_200._0_4_ * fVar271 +
                (float)local_280._0_4_ * fVar299 +
                fVar286 * (float)local_5c0._0_4_ + fVar232 * (float)local_540._0_4_;
    fStack_a1c = (float)local_200._4_4_ * fVar234 +
                 (float)local_280._4_4_ * fVar315 +
                 fVar293 * (float)local_5c0._4_4_ + fVar281 * (float)local_540._4_4_;
    fStack_a18 = fStack_1f8 * fVar252 +
                 fStack_278 * fVar320 + fVar294 * fStack_5b8 + fVar251 * fStack_538;
    fStack_a14 = fStack_1f4 * fVar254 +
                 fStack_274 * fVar325 + fVar295 * fStack_5b4 + fVar253 * fStack_534;
    fStack_a10 = fStack_1f0 * fVar256 +
                 fStack_270 * fVar330 + fVar296 * fStack_5b0 + fVar255 * fStack_530;
    fStack_a0c = fStack_1ec * fVar278 +
                 fStack_26c * fVar335 + fVar297 * fStack_5ac + fVar277 * fStack_52c;
    fStack_a08 = fStack_1e8 * fVar283 +
                 fStack_268 * fVar340 + fVar298 * fStack_5a8 + fVar282 * fStack_528;
    fStack_a04 = fVar347 + fVar392 + auVar402._28_4_ + 12.0;
    local_b20._0_4_ =
         (float)local_220._0_4_ * fVar271 +
         fVar299 * (float)local_4e0._0_4_ +
         fVar232 * (float)local_560._0_4_ + fVar286 * (float)local_5e0._0_4_;
    local_b20._4_4_ =
         (float)local_220._4_4_ * fVar234 +
         fVar315 * (float)local_4e0._4_4_ +
         fVar281 * (float)local_560._4_4_ + fVar293 * (float)local_5e0._4_4_;
    fStack_b18 = fStack_218 * fVar252 +
                 fVar320 * fStack_4d8 + fVar251 * fStack_558 + fVar294 * fStack_5d8;
    fStack_b14 = fStack_214 * fVar254 +
                 fVar325 * fStack_4d4 + fVar253 * fStack_554 + fVar295 * fStack_5d4;
    fStack_b10 = fStack_210 * fVar256 +
                 fVar330 * fStack_4d0 + fVar255 * fStack_550 + fVar296 * fStack_5d0;
    fStack_b0c = fStack_20c * fVar278 +
                 fVar335 * fStack_4cc + fVar277 * fStack_54c + fVar297 * fStack_5cc;
    fStack_b08 = fStack_208 * fVar283 +
                 fVar340 * fStack_4c8 + fVar282 * fStack_548 + fVar298 * fStack_5c8;
    fStack_b04 = auVar266._28_4_ + fVar345 + fVar357 + auVar292._28_4_;
    auVar39._4_4_ = auVar205._4_4_ * -auVar205._4_4_;
    auVar39._0_4_ = auVar205._0_4_ * -auVar205._0_4_;
    auVar39._8_4_ = auVar205._8_4_ * -auVar205._8_4_;
    auVar39._12_4_ = auVar205._12_4_ * -auVar205._12_4_;
    auVar39._16_4_ = auVar205._16_4_ * -auVar205._16_4_;
    auVar39._20_4_ = auVar205._20_4_ * -auVar205._20_4_;
    auVar39._24_4_ = auVar205._24_4_ * -auVar205._24_4_;
    auVar39._28_4_ = auVar205._28_4_;
    auVar40._4_4_ = fVar233 * 4.0;
    auVar40._0_4_ = fVar190 * 4.0;
    auVar40._8_4_ = fVar258 * 4.0;
    auVar40._12_4_ = fVar267 * 4.0;
    auVar40._16_4_ = fVar269 * 4.0;
    auVar40._20_4_ = fVar273 * 4.0;
    auVar40._24_4_ = fVar276 * 4.0;
    auVar40._28_4_ = auVar250._28_4_;
    auVar126 = vsubps_avx(auVar39,auVar40);
    fVar277 = fVar138 * -fVar138 * 0.5;
    fVar278 = fVar229 * -fVar229 * 0.5;
    fVar282 = fVar169 * -fVar169 * 0.5;
    fVar283 = fVar230 * -fVar230 * 0.5;
    fVar294 = fVar137 * -fVar137 * 0.5;
    fVar295 = fVar231 * -fVar231 * 0.5;
    fVar296 = fVar170 * -fVar170 * 0.5;
    fVar281 = auVar126._0_4_ * 0.5;
    fVar234 = auVar126._4_4_ * 0.5;
    fVar251 = auVar126._8_4_ * 0.5;
    fVar252 = auVar126._12_4_ * 0.5;
    fVar254 = auVar126._16_4_ * 0.5;
    fVar255 = auVar126._20_4_ * 0.5;
    fVar256 = auVar126._24_4_ * 0.5;
    fVar232 = (fVar138 * fVar138 + fVar190 * 4.0) * 0.5;
    fVar233 = (fVar229 * fVar229 + fVar233 * 4.0) * 0.5;
    fVar258 = (fVar169 * fVar169 + fVar258 * 4.0) * 0.5;
    fVar267 = (fVar230 * fVar230 + fVar267 * 4.0) * 0.5;
    fVar271 = (fVar137 * fVar137 + fVar269 * 4.0) * 0.5;
    fVar273 = (fVar231 * fVar231 + fVar273 * 4.0) * 0.5;
    fVar276 = (fVar170 * fVar170 + fVar276 * 4.0) * 0.5;
    fVar138 = auVar205._0_4_ * auVar205._0_4_ * 0.5;
    fVar229 = auVar205._4_4_ * auVar205._4_4_ * 0.5;
    fVar169 = auVar205._8_4_ * auVar205._8_4_ * 0.5;
    fVar230 = auVar205._12_4_ * auVar205._12_4_ * 0.5;
    fVar231 = auVar205._16_4_ * auVar205._16_4_ * 0.5;
    fVar170 = auVar205._20_4_ * auVar205._20_4_ * 0.5;
    fVar190 = auVar205._24_4_ * auVar205._24_4_ * 0.5;
    auVar196 = vpermilps_avx(ZEXT416((uint)(auVar115._0_4_ * 0.04761905)),0);
    fVar137 = auVar196._0_4_;
    fVar302 = fVar137 * (fVar274 * fVar277 +
                        (float)local_240._0_4_ * fVar281 +
                        fVar232 * (float)local_500._0_4_ + fVar138 * (float)local_580._0_4_);
    fVar269 = auVar196._4_4_;
    fVar318 = fVar269 * (fVar279 * fVar278 +
                        (float)local_240._4_4_ * fVar234 +
                        fVar233 * (float)local_500._4_4_ + fVar229 * (float)local_580._4_4_);
    auVar41._4_4_ = fVar318;
    auVar41._0_4_ = fVar302;
    fVar253 = auVar196._8_4_;
    fVar323 = fVar253 * (fVar284 * fVar282 +
                        fStack_238 * fVar251 + fVar258 * fStack_4f8 + fVar169 * fStack_578);
    auVar41._8_4_ = fVar323;
    fVar286 = auVar196._12_4_;
    fVar328 = fVar286 * (fVar436 * fVar283 +
                        fStack_234 * fVar252 + fVar267 * fStack_4f4 + fVar230 * fStack_574);
    auVar41._12_4_ = fVar328;
    fVar333 = fVar137 * (fVar274 * fVar294 +
                        fStack_230 * fVar254 + fVar271 * fStack_4f0 + fVar231 * fStack_570);
    auVar41._16_4_ = fVar333;
    fVar338 = fVar269 * (fVar279 * fVar295 +
                        fStack_22c * fVar255 + fVar273 * fStack_4ec + fVar170 * fStack_56c);
    auVar41._20_4_ = fVar338;
    fVar343 = fVar253 * (fVar284 * fVar296 +
                        fStack_228 * fVar256 + fVar276 * fStack_4e8 + fVar190 * fStack_568);
    auVar41._24_4_ = fVar343;
    auVar41._28_4_ = fStack_a04 + fVar358;
    fVar374 = fVar137 * ((float)local_1e0._0_4_ * fVar277 +
                        (float)local_260._0_4_ * fVar281 +
                        fVar232 * (float)local_520._0_4_ + fVar138 * (float)local_5a0._0_4_);
    fVar386 = fVar269 * ((float)local_1e0._4_4_ * fVar278 +
                        (float)local_260._4_4_ * fVar234 +
                        fVar233 * (float)local_520._4_4_ + fVar229 * (float)local_5a0._4_4_);
    auVar42._4_4_ = fVar386;
    auVar42._0_4_ = fVar374;
    fVar387 = fVar253 * (fStack_1d8 * fVar282 +
                        fStack_258 * fVar251 + fVar258 * fStack_518 + fVar169 * fStack_598);
    auVar42._8_4_ = fVar387;
    fVar388 = fVar286 * (fStack_1d4 * fVar283 +
                        fStack_254 * fVar252 + fVar267 * fStack_514 + fVar230 * fStack_594);
    auVar42._12_4_ = fVar388;
    fVar389 = fVar137 * (fStack_1d0 * fVar294 +
                        fStack_250 * fVar254 + fVar271 * fStack_510 + fVar231 * fStack_590);
    auVar42._16_4_ = fVar389;
    fVar390 = fVar269 * (fStack_1cc * fVar295 +
                        fStack_24c * fVar255 + fVar273 * fStack_50c + fVar170 * fStack_58c);
    auVar42._20_4_ = fVar390;
    fVar391 = fVar253 * (fStack_1c8 * fVar296 +
                        fStack_248 * fVar256 + fVar276 * fStack_508 + fVar190 * fStack_588);
    auVar42._24_4_ = fVar391;
    auVar42._28_4_ = fStack_204;
    fVar393 = fVar137 * ((float)local_200._0_4_ * fVar277 +
                        fVar138 * (float)local_5c0._0_4_ + fVar232 * (float)local_540._0_4_ +
                        (float)local_280._0_4_ * fVar281);
    fVar403 = fVar269 * ((float)local_200._4_4_ * fVar278 +
                        fVar229 * (float)local_5c0._4_4_ + fVar233 * (float)local_540._4_4_ +
                        (float)local_280._4_4_ * fVar234);
    auVar43._4_4_ = fVar403;
    auVar43._0_4_ = fVar393;
    fVar405 = fVar253 * (fStack_1f8 * fVar282 +
                        fVar169 * fStack_5b8 + fVar258 * fStack_538 + fStack_278 * fVar251);
    auVar43._8_4_ = fVar405;
    fVar407 = fVar286 * (fStack_1f4 * fVar283 +
                        fVar230 * fStack_5b4 + fVar267 * fStack_534 + fStack_274 * fVar252);
    auVar43._12_4_ = fVar407;
    fVar409 = fVar137 * (fStack_1f0 * fVar294 +
                        fVar231 * fStack_5b0 + fVar271 * fStack_530 + fStack_270 * fVar254);
    auVar43._16_4_ = fVar409;
    fVar411 = fVar269 * (fStack_1ec * fVar295 +
                        fVar170 * fStack_5ac + fVar273 * fStack_52c + fStack_26c * fVar255);
    auVar43._20_4_ = fVar411;
    fVar413 = fVar253 * (fStack_1e8 * fVar296 +
                        fVar190 * fStack_5a8 + fVar276 * fStack_528 + fStack_268 * fVar256);
    auVar43._24_4_ = fVar413;
    auVar43._28_4_ = fStack_1c4;
    fVar232 = fVar137 * ((float)local_220._0_4_ * fVar277 +
                        fVar281 * (float)local_4e0._0_4_ +
                        fVar138 * (float)local_5e0._0_4_ + fVar232 * (float)local_560._0_4_);
    fVar281 = fVar269 * ((float)local_220._4_4_ * fVar278 +
                        fVar234 * (float)local_4e0._4_4_ +
                        fVar229 * (float)local_5e0._4_4_ + fVar233 * (float)local_560._4_4_);
    auVar44._4_4_ = fVar281;
    auVar44._0_4_ = fVar232;
    fVar277 = fVar253 * (fStack_218 * fVar282 +
                        fVar251 * fStack_4d8 + fVar169 * fStack_5d8 + fVar258 * fStack_558);
    auVar44._8_4_ = fVar277;
    fVar293 = fVar286 * (fStack_214 * fVar283 +
                        fVar252 * fStack_4d4 + fVar230 * fStack_5d4 + fVar267 * fStack_554);
    auVar44._12_4_ = fVar293;
    fVar137 = fVar137 * (fStack_210 * fVar294 +
                        fVar254 * fStack_4d0 + fVar231 * fStack_5d0 + fVar271 * fStack_550);
    auVar44._16_4_ = fVar137;
    fVar269 = fVar269 * (fStack_20c * fVar295 +
                        fVar255 * fStack_4cc + fVar170 * fStack_5cc + fVar273 * fStack_54c);
    auVar44._20_4_ = fVar269;
    fVar253 = fVar253 * (fStack_208 * fVar296 +
                        fVar256 * fStack_4c8 + fVar190 * fStack_5c8 + fVar276 * fStack_548);
    auVar44._24_4_ = fVar253;
    auVar44._28_4_ = fVar286;
    auVar93._4_4_ = fVar317;
    auVar93._0_4_ = fVar301;
    auVar93._8_4_ = fVar322;
    auVar93._12_4_ = fVar327;
    auVar93._16_4_ = fVar332;
    auVar93._20_4_ = fVar337;
    auVar93._24_4_ = fVar342;
    auVar93._28_4_ = fVar347;
    auVar126 = vperm2f128_avx(auVar93,auVar93,1);
    auVar126 = vshufps_avx(auVar126,auVar93,0x30);
    local_ae0 = vshufps_avx(auVar93,auVar126,0x29);
    auVar99._4_4_ = fStack_a1c;
    auVar99._0_4_ = local_a20;
    auVar99._8_4_ = fStack_a18;
    auVar99._12_4_ = fStack_a14;
    auVar99._16_4_ = fStack_a10;
    auVar99._20_4_ = fStack_a0c;
    auVar99._24_4_ = fStack_a08;
    auVar99._28_4_ = fStack_a04;
    auVar126 = vperm2f128_avx(auVar99,auVar99,1);
    auVar126 = vshufps_avx(auVar126,auVar99,0x30);
    auVar27 = vshufps_avx(auVar99,auVar126,0x29);
    auVar134 = vsubps_avx(_local_b20,auVar44);
    auVar126 = vperm2f128_avx(auVar134,auVar134,1);
    auVar126 = vshufps_avx(auVar126,auVar134,0x30);
    auVar28 = vshufps_avx(auVar134,auVar126,0x29);
    local_620 = vsubps_avx(local_ae0,auVar93);
    local_300 = vsubps_avx(auVar27,auVar99);
    fVar229 = local_620._0_4_;
    fVar231 = local_620._4_4_;
    auVar45._4_4_ = fVar403 * fVar231;
    auVar45._0_4_ = fVar393 * fVar229;
    fVar233 = local_620._8_4_;
    auVar45._8_4_ = fVar405 * fVar233;
    fVar271 = local_620._12_4_;
    auVar45._12_4_ = fVar407 * fVar271;
    fVar234 = local_620._16_4_;
    auVar45._16_4_ = fVar409 * fVar234;
    fVar254 = local_620._20_4_;
    auVar45._20_4_ = fVar411 * fVar254;
    fVar278 = local_620._24_4_;
    auVar45._24_4_ = fVar413 * fVar278;
    auVar45._28_4_ = auVar134._28_4_;
    fVar169 = local_300._0_4_;
    fVar170 = local_300._4_4_;
    auVar46._4_4_ = fVar386 * fVar170;
    auVar46._0_4_ = fVar374 * fVar169;
    fVar258 = local_300._8_4_;
    auVar46._8_4_ = fVar387 * fVar258;
    fVar273 = local_300._12_4_;
    auVar46._12_4_ = fVar388 * fVar273;
    fVar251 = local_300._16_4_;
    auVar46._16_4_ = fVar389 * fVar251;
    fVar255 = local_300._20_4_;
    auVar46._20_4_ = fVar390 * fVar255;
    fVar282 = local_300._24_4_;
    auVar46._24_4_ = fVar391 * fVar282;
    auVar46._28_4_ = auVar126._28_4_;
    auVar26 = vsubps_avx(auVar46,auVar45);
    auVar95._4_4_ = fVar316;
    auVar95._0_4_ = fVar300;
    auVar95._8_4_ = fVar321;
    auVar95._12_4_ = fVar326;
    auVar95._16_4_ = fVar331;
    auVar95._20_4_ = fVar336;
    auVar95._24_4_ = fVar341;
    auVar95._28_4_ = fVar346;
    auVar126 = vperm2f128_avx(auVar95,auVar95,1);
    auVar126 = vshufps_avx(auVar126,auVar95,0x30);
    auVar29 = vshufps_avx(auVar95,auVar126,0x29);
    local_640 = vsubps_avx(auVar29,auVar95);
    auVar47._4_4_ = fVar318 * fVar170;
    auVar47._0_4_ = fVar302 * fVar169;
    auVar47._8_4_ = fVar323 * fVar258;
    auVar47._12_4_ = fVar328 * fVar273;
    auVar47._16_4_ = fVar333 * fVar251;
    auVar47._20_4_ = fVar338 * fVar255;
    auVar47._24_4_ = fVar343 * fVar282;
    auVar47._28_4_ = auVar29._28_4_;
    fVar230 = local_640._0_4_;
    fVar190 = local_640._4_4_;
    auVar48._4_4_ = fVar403 * fVar190;
    auVar48._0_4_ = fVar393 * fVar230;
    fVar267 = local_640._8_4_;
    auVar48._8_4_ = fVar405 * fVar267;
    fVar276 = local_640._12_4_;
    auVar48._12_4_ = fVar407 * fVar276;
    fVar252 = local_640._16_4_;
    auVar48._16_4_ = fVar409 * fVar252;
    fVar256 = local_640._20_4_;
    auVar48._20_4_ = fVar411 * fVar256;
    fVar283 = local_640._24_4_;
    auVar48._24_4_ = fVar413 * fVar283;
    auVar48._28_4_ = fVar358;
    auVar30 = vsubps_avx(auVar48,auVar47);
    auVar49._4_4_ = fVar386 * fVar190;
    auVar49._0_4_ = fVar374 * fVar230;
    auVar49._8_4_ = fVar387 * fVar267;
    auVar49._12_4_ = fVar388 * fVar276;
    auVar49._16_4_ = fVar389 * fVar252;
    auVar49._20_4_ = fVar390 * fVar256;
    auVar49._24_4_ = fVar391 * fVar283;
    auVar49._28_4_ = fVar358;
    auVar50._4_4_ = fVar318 * fVar231;
    auVar50._0_4_ = fVar302 * fVar229;
    auVar50._8_4_ = fVar323 * fVar233;
    auVar50._12_4_ = fVar328 * fVar271;
    auVar50._16_4_ = fVar333 * fVar234;
    auVar50._20_4_ = fVar338 * fVar254;
    auVar50._24_4_ = fVar343 * fVar278;
    auVar50._28_4_ = uStack_1e4;
    auVar365 = vsubps_avx(auVar50,auVar49);
    fVar138 = auVar365._28_4_;
    auVar184._0_4_ = fVar230 * fVar230 + fVar229 * fVar229 + fVar169 * fVar169;
    auVar184._4_4_ = fVar190 * fVar190 + fVar231 * fVar231 + fVar170 * fVar170;
    auVar184._8_4_ = fVar267 * fVar267 + fVar233 * fVar233 + fVar258 * fVar258;
    auVar184._12_4_ = fVar276 * fVar276 + fVar271 * fVar271 + fVar273 * fVar273;
    auVar184._16_4_ = fVar252 * fVar252 + fVar234 * fVar234 + fVar251 * fVar251;
    auVar184._20_4_ = fVar256 * fVar256 + fVar254 * fVar254 + fVar255 * fVar255;
    auVar184._24_4_ = fVar283 * fVar283 + fVar278 * fVar278 + fVar282 * fVar282;
    auVar184._28_4_ = fVar138 + fVar138 + auVar26._28_4_;
    auVar126 = vrcpps_avx(auVar184);
    fVar294 = auVar126._0_4_;
    fVar295 = auVar126._4_4_;
    auVar51._4_4_ = fVar295 * auVar184._4_4_;
    auVar51._0_4_ = fVar294 * auVar184._0_4_;
    fVar296 = auVar126._8_4_;
    auVar51._8_4_ = fVar296 * auVar184._8_4_;
    fVar297 = auVar126._12_4_;
    auVar51._12_4_ = fVar297 * auVar184._12_4_;
    fVar298 = auVar126._16_4_;
    auVar51._16_4_ = fVar298 * auVar184._16_4_;
    fVar299 = auVar126._20_4_;
    auVar51._20_4_ = fVar299 * auVar184._20_4_;
    fVar315 = auVar126._24_4_;
    auVar51._24_4_ = fVar315 * auVar184._24_4_;
    auVar51._28_4_ = uStack_1e4;
    auVar263._8_4_ = 0x3f800000;
    auVar263._0_8_ = 0x3f8000003f800000;
    auVar263._12_4_ = 0x3f800000;
    auVar263._16_4_ = 0x3f800000;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar263,auVar51);
    fVar294 = fVar294 + fVar294 * auVar37._0_4_;
    fVar295 = fVar295 + fVar295 * auVar37._4_4_;
    fVar296 = fVar296 + fVar296 * auVar37._8_4_;
    fVar297 = fVar297 + fVar297 * auVar37._12_4_;
    fVar298 = fVar298 + fVar298 * auVar37._16_4_;
    fVar299 = fVar299 + fVar299 * auVar37._20_4_;
    fVar315 = fVar315 + fVar315 * auVar37._24_4_;
    auVar134 = vperm2f128_avx(auVar42,auVar42,1);
    auVar134 = vshufps_avx(auVar134,auVar42,0x30);
    local_a80 = vshufps_avx(auVar42,auVar134,0x29);
    auVar134 = vperm2f128_avx(auVar43,auVar43,1);
    auVar134 = vshufps_avx(auVar134,auVar43,0x30);
    local_8a0 = vshufps_avx(auVar43,auVar134,0x29);
    fVar394 = local_8a0._0_4_;
    fVar404 = local_8a0._4_4_;
    auVar52._4_4_ = fVar404 * fVar231;
    auVar52._0_4_ = fVar394 * fVar229;
    fVar406 = local_8a0._8_4_;
    auVar52._8_4_ = fVar406 * fVar233;
    fVar408 = local_8a0._12_4_;
    auVar52._12_4_ = fVar408 * fVar271;
    fVar410 = local_8a0._16_4_;
    auVar52._16_4_ = fVar410 * fVar234;
    fVar412 = local_8a0._20_4_;
    auVar52._20_4_ = fVar412 * fVar254;
    fVar414 = local_8a0._24_4_;
    auVar52._24_4_ = fVar414 * fVar278;
    auVar52._28_4_ = auVar134._28_4_;
    fVar345 = local_a80._0_4_;
    fVar357 = local_a80._4_4_;
    auVar53._4_4_ = fVar357 * fVar170;
    auVar53._0_4_ = fVar345 * fVar169;
    fVar358 = local_a80._8_4_;
    auVar53._8_4_ = fVar358 * fVar258;
    fVar392 = local_a80._12_4_;
    auVar53._12_4_ = fVar392 * fVar273;
    fVar274 = local_a80._16_4_;
    auVar53._16_4_ = fVar274 * fVar251;
    fVar279 = local_a80._20_4_;
    auVar53._20_4_ = fVar279 * fVar255;
    fVar284 = local_a80._24_4_;
    auVar53._24_4_ = fVar284 * fVar282;
    auVar53._28_4_ = fStack_204;
    auVar312 = vsubps_avx(auVar53,auVar52);
    auVar134 = vperm2f128_avx(auVar41,auVar41,1);
    auVar134 = vshufps_avx(auVar134,auVar41,0x30);
    local_880 = vshufps_avx(auVar41,auVar134,0x29);
    fVar303 = local_880._0_4_;
    fVar319 = local_880._4_4_;
    auVar54._4_4_ = fVar319 * fVar170;
    auVar54._0_4_ = fVar303 * fVar169;
    fVar324 = local_880._8_4_;
    auVar54._8_4_ = fVar324 * fVar258;
    fVar329 = local_880._12_4_;
    auVar54._12_4_ = fVar329 * fVar273;
    fVar334 = local_880._16_4_;
    auVar54._16_4_ = fVar334 * fVar251;
    fVar339 = local_880._20_4_;
    auVar54._20_4_ = fVar339 * fVar255;
    fVar344 = local_880._24_4_;
    auVar54._24_4_ = fVar344 * fVar282;
    auVar54._28_4_ = auVar134._28_4_;
    auVar55._4_4_ = fVar404 * fVar190;
    auVar55._0_4_ = fVar394 * fVar230;
    auVar55._8_4_ = fVar406 * fVar267;
    auVar55._12_4_ = fVar408 * fVar276;
    auVar55._16_4_ = fVar410 * fVar252;
    auVar55._20_4_ = fVar412 * fVar256;
    uVar110 = local_8a0._28_4_;
    auVar55._24_4_ = fVar414 * fVar283;
    auVar55._28_4_ = uVar110;
    auVar134 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ = fVar190 * fVar357;
    auVar56._0_4_ = fVar230 * fVar345;
    auVar56._8_4_ = fVar267 * fVar358;
    auVar56._12_4_ = fVar276 * fVar392;
    auVar56._16_4_ = fVar252 * fVar274;
    auVar56._20_4_ = fVar256 * fVar279;
    auVar56._24_4_ = fVar283 * fVar284;
    auVar56._28_4_ = uVar110;
    auVar57._4_4_ = fVar319 * fVar231;
    auVar57._0_4_ = fVar303 * fVar229;
    auVar57._8_4_ = fVar324 * fVar233;
    auVar57._12_4_ = fVar329 * fVar271;
    auVar57._16_4_ = fVar334 * fVar234;
    auVar57._20_4_ = fVar339 * fVar254;
    auVar57._24_4_ = fVar344 * fVar278;
    auVar57._28_4_ = fVar347;
    auVar38 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ =
         fVar295 * (auVar26._4_4_ * auVar26._4_4_ +
                   auVar365._4_4_ * auVar365._4_4_ + auVar30._4_4_ * auVar30._4_4_);
    auVar58._0_4_ =
         fVar294 * (auVar26._0_4_ * auVar26._0_4_ +
                   auVar365._0_4_ * auVar365._0_4_ + auVar30._0_4_ * auVar30._0_4_);
    auVar58._8_4_ =
         fVar296 * (auVar26._8_4_ * auVar26._8_4_ +
                   auVar365._8_4_ * auVar365._8_4_ + auVar30._8_4_ * auVar30._8_4_);
    auVar58._12_4_ =
         fVar297 * (auVar26._12_4_ * auVar26._12_4_ +
                   auVar365._12_4_ * auVar365._12_4_ + auVar30._12_4_ * auVar30._12_4_);
    auVar58._16_4_ =
         fVar298 * (auVar26._16_4_ * auVar26._16_4_ +
                   auVar365._16_4_ * auVar365._16_4_ + auVar30._16_4_ * auVar30._16_4_);
    auVar58._20_4_ =
         fVar299 * (auVar26._20_4_ * auVar26._20_4_ +
                   auVar365._20_4_ * auVar365._20_4_ + auVar30._20_4_ * auVar30._20_4_);
    auVar58._24_4_ =
         fVar315 * (auVar26._24_4_ * auVar26._24_4_ +
                   auVar365._24_4_ * auVar365._24_4_ + auVar30._24_4_ * auVar30._24_4_);
    auVar58._28_4_ = auVar26._28_4_ + fVar138 + auVar30._28_4_;
    auVar59._4_4_ =
         (auVar312._4_4_ * auVar312._4_4_ +
         auVar134._4_4_ * auVar134._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar295;
    auVar59._0_4_ =
         (auVar312._0_4_ * auVar312._0_4_ +
         auVar134._0_4_ * auVar134._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar294;
    auVar59._8_4_ =
         (auVar312._8_4_ * auVar312._8_4_ +
         auVar134._8_4_ * auVar134._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar296;
    auVar59._12_4_ =
         (auVar312._12_4_ * auVar312._12_4_ +
         auVar134._12_4_ * auVar134._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar297;
    auVar59._16_4_ =
         (auVar312._16_4_ * auVar312._16_4_ +
         auVar134._16_4_ * auVar134._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar298;
    auVar59._20_4_ =
         (auVar312._20_4_ * auVar312._20_4_ +
         auVar134._20_4_ * auVar134._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar299;
    auVar59._24_4_ =
         (auVar312._24_4_ * auVar312._24_4_ +
         auVar134._24_4_ * auVar134._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar315;
    auVar59._28_4_ = auVar126._28_4_ + auVar37._28_4_;
    auVar126 = vmaxps_avx(auVar58,auVar59);
    auVar134 = vperm2f128_avx(_local_b20,_local_b20,1);
    auVar134 = vshufps_avx(auVar134,_local_b20,0x30);
    auVar30 = vshufps_avx(_local_b20,auVar134,0x29);
    local_700._0_4_ = (float)local_b20._0_4_ + fVar232;
    local_700._4_4_ = (float)local_b20._4_4_ + fVar281;
    local_700._8_4_ = fStack_b18 + fVar277;
    local_700._12_4_ = fStack_b14 + fVar293;
    local_700._16_4_ = fStack_b10 + fVar137;
    local_700._20_4_ = fStack_b0c + fVar269;
    local_700._24_4_ = fStack_b08 + fVar253;
    local_700._28_4_ = fStack_b04 + fVar286;
    auVar134 = vmaxps_avx(_local_b20,local_700);
    auVar26 = vmaxps_avx(auVar28,auVar30);
    auVar134 = vmaxps_avx(auVar134,auVar26);
    auVar26 = vrsqrtps_avx(auVar184);
    fVar138 = auVar26._0_4_;
    fVar137 = auVar26._4_4_;
    fVar232 = auVar26._8_4_;
    fVar269 = auVar26._12_4_;
    fVar281 = auVar26._16_4_;
    fVar253 = auVar26._20_4_;
    fVar277 = auVar26._24_4_;
    auVar60._4_4_ = fVar137 * fVar137 * fVar137 * auVar184._4_4_ * 0.5;
    auVar60._0_4_ = fVar138 * fVar138 * fVar138 * auVar184._0_4_ * 0.5;
    auVar60._8_4_ = fVar232 * fVar232 * fVar232 * auVar184._8_4_ * 0.5;
    auVar60._12_4_ = fVar269 * fVar269 * fVar269 * auVar184._12_4_ * 0.5;
    auVar60._16_4_ = fVar281 * fVar281 * fVar281 * auVar184._16_4_ * 0.5;
    auVar60._20_4_ = fVar253 * fVar253 * fVar253 * auVar184._20_4_ * 0.5;
    auVar60._24_4_ = fVar277 * fVar277 * fVar277 * auVar184._24_4_ * 0.5;
    auVar60._28_4_ = auVar184._28_4_;
    auVar61._4_4_ = fVar137 * 1.5;
    auVar61._0_4_ = fVar138 * 1.5;
    auVar61._8_4_ = fVar232 * 1.5;
    auVar61._12_4_ = fVar269 * 1.5;
    auVar61._16_4_ = fVar281 * 1.5;
    auVar61._20_4_ = fVar253 * 1.5;
    auVar61._24_4_ = fVar277 * 1.5;
    auVar61._28_4_ = auVar26._28_4_;
    local_400 = vsubps_avx(auVar61,auVar60);
    auVar94._4_4_ = fVar317;
    auVar94._0_4_ = fVar301;
    auVar94._8_4_ = fVar322;
    auVar94._12_4_ = fVar327;
    auVar94._16_4_ = fVar332;
    auVar94._20_4_ = fVar337;
    auVar94._24_4_ = fVar342;
    auVar94._28_4_ = fVar347;
    local_8c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar94);
    auVar365 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
    auVar367 = ZEXT3264(auVar365);
    fVar359 = auVar365._0_4_;
    fVar368 = auVar365._4_4_;
    fVar369 = auVar365._8_4_;
    fVar370 = auVar365._12_4_;
    fVar371 = auVar365._16_4_;
    fVar372 = auVar365._20_4_;
    fVar373 = auVar365._24_4_;
    fVar421 = local_8c0._0_4_;
    fVar427 = local_8c0._4_4_;
    fVar428 = local_8c0._8_4_;
    fVar429 = local_8c0._12_4_;
    fVar430 = local_8c0._16_4_;
    fVar431 = local_8c0._20_4_;
    fVar432 = local_8c0._24_4_;
    auVar96._4_4_ = fVar316;
    auVar96._0_4_ = fVar300;
    auVar96._8_4_ = fVar321;
    auVar96._12_4_ = fVar326;
    auVar96._16_4_ = fVar331;
    auVar96._20_4_ = fVar336;
    auVar96._24_4_ = fVar341;
    auVar96._28_4_ = fVar346;
    auVar312 = ZEXT832(0) << 0x20;
    auVar365 = vsubps_avx(auVar312,auVar96);
    fVar137 = auVar365._0_4_;
    fVar232 = auVar365._4_4_;
    fVar269 = auVar365._8_4_;
    fVar281 = auVar365._12_4_;
    fVar253 = auVar365._16_4_;
    fVar277 = auVar365._20_4_;
    fVar286 = auVar365._24_4_;
    auVar353._0_4_ =
         (float)local_940._0_4_ * fVar137 +
         fVar421 * (float)local_760._0_4_ + fVar359 * (float)local_780._0_4_;
    auVar353._4_4_ =
         (float)local_940._4_4_ * fVar232 +
         fVar427 * (float)local_760._4_4_ + fVar368 * (float)local_780._4_4_;
    auVar353._8_4_ = fStack_938 * fVar269 + fVar428 * fStack_758 + fVar369 * fStack_778;
    auVar353._12_4_ = fStack_934 * fVar281 + fVar429 * fStack_754 + fVar370 * fStack_774;
    auVar353._16_4_ = fStack_930 * fVar253 + fVar430 * fStack_750 + fVar371 * fStack_770;
    auVar353._20_4_ = fStack_92c * fVar277 + fVar431 * fStack_74c + fVar372 * fStack_76c;
    auVar353._24_4_ = fStack_928 * fVar286 + fVar432 * fStack_748 + fVar373 * fStack_768;
    auVar353._28_4_ = auVar38._28_4_ + auVar26._28_4_ + auVar184._28_4_;
    auVar400._0_4_ = fVar137 * fVar137 + fVar421 * fVar421 + fVar359 * fVar359;
    auVar400._4_4_ = fVar232 * fVar232 + fVar427 * fVar427 + fVar368 * fVar368;
    auVar400._8_4_ = fVar269 * fVar269 + fVar428 * fVar428 + fVar369 * fVar369;
    auVar400._12_4_ = fVar281 * fVar281 + fVar429 * fVar429 + fVar370 * fVar370;
    auVar400._16_4_ = fVar253 * fVar253 + fVar430 * fVar430 + fVar371 * fVar371;
    auVar400._20_4_ = fVar277 * fVar277 + fVar431 * fVar431 + fVar372 * fVar372;
    auVar400._24_4_ = fVar286 * fVar286 + fVar432 * fVar432 + fVar373 * fVar373;
    auVar400._28_4_ = fVar347 + fVar347 + auVar38._28_4_;
    fVar299 = local_400._0_4_;
    fVar315 = local_400._4_4_;
    fVar320 = local_400._8_4_;
    fVar325 = local_400._12_4_;
    fVar330 = local_400._16_4_;
    fVar335 = local_400._20_4_;
    fVar340 = local_400._24_4_;
    local_680 = (float)local_940._0_4_ * fVar230 * fVar299 +
                fVar299 * fVar229 * (float)local_760._0_4_ +
                fVar299 * fVar169 * (float)local_780._0_4_;
    fStack_67c = (float)local_940._4_4_ * fVar190 * fVar315 +
                 fVar315 * fVar231 * (float)local_760._4_4_ +
                 fVar315 * fVar170 * (float)local_780._4_4_;
    fStack_678 = fStack_938 * fVar267 * fVar320 +
                 fVar320 * fVar233 * fStack_758 + fVar320 * fVar258 * fStack_778;
    fStack_674 = fStack_934 * fVar276 * fVar325 +
                 fVar325 * fVar271 * fStack_754 + fVar325 * fVar273 * fStack_774;
    fStack_670 = fStack_930 * fVar252 * fVar330 +
                 fVar330 * fVar234 * fStack_750 + fVar330 * fVar251 * fStack_770;
    fStack_66c = fStack_92c * fVar256 * fVar335 +
                 fVar335 * fVar254 * fStack_74c + fVar335 * fVar255 * fStack_76c;
    fStack_668 = fStack_928 * fVar283 * fVar340 +
                 fVar340 * fVar278 * fStack_748 + fVar340 * fVar282 * fStack_768;
    fVar138 = fStack_924 + fStack_744 + fStack_764;
    local_aa0._0_4_ =
         fVar137 * fVar230 * fVar299 + fVar421 * fVar299 * fVar229 + fVar359 * fVar299 * fVar169;
    local_aa0._4_4_ =
         fVar232 * fVar190 * fVar315 + fVar427 * fVar315 * fVar231 + fVar368 * fVar315 * fVar170;
    local_aa0._8_4_ =
         fVar269 * fVar267 * fVar320 + fVar428 * fVar320 * fVar233 + fVar369 * fVar320 * fVar258;
    local_aa0._12_4_ =
         fVar281 * fVar276 * fVar325 + fVar429 * fVar325 * fVar271 + fVar370 * fVar325 * fVar273;
    local_aa0._16_4_ =
         fVar253 * fVar252 * fVar330 + fVar430 * fVar330 * fVar234 + fVar371 * fVar330 * fVar251;
    local_aa0._20_4_ =
         fVar277 * fVar256 * fVar335 + fVar431 * fVar335 * fVar254 + fVar372 * fVar335 * fVar255;
    local_aa0._24_4_ =
         fVar286 * fVar283 * fVar340 + fVar432 * fVar340 * fVar278 + fVar373 * fVar340 * fVar282;
    local_aa0._28_4_ = fStack_744 + fVar138;
    auVar62._4_4_ = fStack_67c * local_aa0._4_4_;
    auVar62._0_4_ = local_680 * (float)local_aa0._0_4_;
    auVar62._8_4_ = fStack_678 * local_aa0._8_4_;
    auVar62._12_4_ = fStack_674 * local_aa0._12_4_;
    auVar62._16_4_ = fStack_670 * local_aa0._16_4_;
    auVar62._20_4_ = fStack_66c * local_aa0._20_4_;
    auVar62._24_4_ = fStack_668 * local_aa0._24_4_;
    auVar62._28_4_ = fVar138;
    auVar26 = vsubps_avx(auVar353,auVar62);
    auVar63._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
    auVar63._0_4_ = (float)local_aa0._0_4_ * (float)local_aa0._0_4_;
    auVar63._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
    auVar63._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
    auVar63._16_4_ = local_aa0._16_4_ * local_aa0._16_4_;
    auVar63._20_4_ = local_aa0._20_4_ * local_aa0._20_4_;
    auVar63._24_4_ = local_aa0._24_4_ * local_aa0._24_4_;
    auVar63._28_4_ = fStack_744;
    local_720 = vsubps_avx(auVar400,auVar63);
    local_2e0 = vsqrtps_avx(auVar126);
    fVar138 = (local_2e0._0_4_ + auVar134._0_4_) * 1.0000002;
    fVar293 = (local_2e0._4_4_ + auVar134._4_4_) * 1.0000002;
    fVar294 = (local_2e0._8_4_ + auVar134._8_4_) * 1.0000002;
    fVar295 = (local_2e0._12_4_ + auVar134._12_4_) * 1.0000002;
    fVar296 = (local_2e0._16_4_ + auVar134._16_4_) * 1.0000002;
    fVar297 = (local_2e0._20_4_ + auVar134._20_4_) * 1.0000002;
    fVar298 = (local_2e0._24_4_ + auVar134._24_4_) * 1.0000002;
    auVar64._4_4_ = fVar293 * fVar293;
    auVar64._0_4_ = fVar138 * fVar138;
    auVar64._8_4_ = fVar294 * fVar294;
    auVar64._12_4_ = fVar295 * fVar295;
    auVar64._16_4_ = fVar296 * fVar296;
    auVar64._20_4_ = fVar297 * fVar297;
    auVar64._24_4_ = fVar298 * fVar298;
    auVar64._28_4_ = local_2e0._28_4_ + auVar134._28_4_;
    local_320._0_4_ = auVar26._0_4_ + auVar26._0_4_;
    local_320._4_4_ = auVar26._4_4_ + auVar26._4_4_;
    local_320._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_320._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_320._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_320._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_320._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    fVar138 = auVar26._28_4_;
    local_320._28_4_ = fVar138 + fVar138;
    auVar134 = vsubps_avx(local_720,auVar64);
    auVar65._4_4_ = fStack_67c * fStack_67c;
    auVar65._0_4_ = local_680 * local_680;
    auVar65._8_4_ = fStack_678 * fStack_678;
    auVar65._12_4_ = fStack_674 * fStack_674;
    auVar65._16_4_ = fStack_670 * fStack_670;
    auVar65._20_4_ = fStack_66c * fStack_66c;
    auVar65._24_4_ = fStack_668 * fStack_668;
    auVar65._28_4_ = fVar138;
    auVar385 = ZEXT3264(local_2a0);
    auVar26 = vsubps_avx(local_2a0,auVar65);
    local_740._4_4_ = local_320._4_4_ * local_320._4_4_;
    local_740._0_4_ = local_320._0_4_ * local_320._0_4_;
    local_740._8_4_ = local_320._8_4_ * local_320._8_4_;
    local_740._12_4_ = local_320._12_4_ * local_320._12_4_;
    local_740._16_4_ = local_320._16_4_ * local_320._16_4_;
    local_740._20_4_ = local_320._20_4_ * local_320._20_4_;
    local_740._24_4_ = local_320._24_4_ * local_320._24_4_;
    local_740._28_4_ = local_720._28_4_;
    fVar138 = auVar26._0_4_;
    local_2c0 = fVar138 * 4.0;
    fVar293 = auVar26._4_4_;
    fStack_2bc = fVar293 * 4.0;
    fVar294 = auVar26._8_4_;
    fStack_2b8 = fVar294 * 4.0;
    fVar295 = auVar26._12_4_;
    fStack_2b4 = fVar295 * 4.0;
    fVar296 = auVar26._16_4_;
    fStack_2b0 = fVar296 * 4.0;
    fVar297 = auVar26._20_4_;
    fStack_2ac = fVar297 * 4.0;
    fVar298 = auVar26._24_4_;
    fStack_2a8 = fVar298 * 4.0;
    uStack_2a4 = 0x40800000;
    auVar66._4_4_ = auVar134._4_4_ * fStack_2bc;
    auVar66._0_4_ = auVar134._0_4_ * local_2c0;
    auVar66._8_4_ = auVar134._8_4_ * fStack_2b8;
    auVar66._12_4_ = auVar134._12_4_ * fStack_2b4;
    auVar66._16_4_ = auVar134._16_4_ * fStack_2b0;
    auVar66._20_4_ = auVar134._20_4_ * fStack_2ac;
    auVar66._24_4_ = auVar134._24_4_ * fStack_2a8;
    auVar66._28_4_ = 0x40800000;
    auVar37 = vsubps_avx(local_740,auVar66);
    local_c80 = vcmpps_avx(auVar37,auVar312,5);
    auVar158._8_4_ = 0x7fffffff;
    auVar158._0_8_ = 0x7fffffff7fffffff;
    auVar158._12_4_ = 0x7fffffff;
    auVar158._16_4_ = 0x7fffffff;
    auVar158._20_4_ = 0x7fffffff;
    auVar158._24_4_ = 0x7fffffff;
    auVar158._28_4_ = 0x7fffffff;
    auVar126 = vandps_avx(auVar65,auVar158);
    local_360._0_4_ = fVar138 + fVar138;
    local_360._4_4_ = fVar293 + fVar293;
    local_360._8_4_ = fVar294 + fVar294;
    local_360._12_4_ = fVar295 + fVar295;
    local_360._16_4_ = fVar296 + fVar296;
    local_360._20_4_ = fVar297 + fVar297;
    local_360._24_4_ = fVar298 + fVar298;
    local_360._28_4_ = auVar26._28_4_ + auVar26._28_4_;
    local_420 = vandps_avx(auVar26,auVar158);
    uVar103 = CONCAT44(local_320._4_4_,local_320._0_4_);
    local_340._0_8_ = uVar103 ^ 0x8000000080000000;
    local_340._8_4_ = -local_320._8_4_;
    local_340._12_4_ = -local_320._12_4_;
    local_340._16_4_ = -local_320._16_4_;
    local_340._20_4_ = -local_320._20_4_;
    local_340._24_4_ = -local_320._24_4_;
    local_340._28_4_ = -local_320._28_4_;
    if ((((((((local_c80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_c80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_c80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_c80 >> 0x7f,0) == '\0') &&
          (local_c80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_c80 >> 0xbf,0) == '\0') &&
        (local_c80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_c80[0x1f]) {
      auVar206._8_4_ = 0x7f800000;
      auVar206._0_8_ = 0x7f8000007f800000;
      auVar206._12_4_ = 0x7f800000;
      auVar206._16_4_ = 0x7f800000;
      auVar206._20_4_ = 0x7f800000;
      auVar206._24_4_ = 0x7f800000;
      auVar206._28_4_ = 0x7f800000;
      auVar128._8_4_ = 0xff800000;
      auVar128._0_8_ = 0xff800000ff800000;
      auVar128._12_4_ = 0xff800000;
      auVar128._16_4_ = 0xff800000;
      auVar128._20_4_ = 0xff800000;
      auVar128._24_4_ = 0xff800000;
      auVar128._28_4_ = 0xff800000;
    }
    else {
      auVar124 = vsqrtps_avx(auVar37);
      auVar38 = vrcpps_avx(local_360);
      auVar26 = vcmpps_avx(auVar37,auVar312,5);
      fVar138 = auVar38._0_4_;
      fVar293 = auVar38._4_4_;
      auVar67._4_4_ = local_360._4_4_ * fVar293;
      auVar67._0_4_ = local_360._0_4_ * fVar138;
      fVar294 = auVar38._8_4_;
      auVar67._8_4_ = local_360._8_4_ * fVar294;
      fVar295 = auVar38._12_4_;
      auVar67._12_4_ = local_360._12_4_ * fVar295;
      fVar296 = auVar38._16_4_;
      auVar67._16_4_ = local_360._16_4_ * fVar296;
      fVar297 = auVar38._20_4_;
      auVar67._20_4_ = local_360._20_4_ * fVar297;
      fVar298 = auVar38._24_4_;
      auVar67._24_4_ = local_360._24_4_ * fVar298;
      auVar67._28_4_ = auVar37._28_4_;
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = 0x3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      auVar159._16_4_ = 0x3f800000;
      auVar159._20_4_ = 0x3f800000;
      auVar159._24_4_ = 0x3f800000;
      auVar159._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar159,auVar67);
      fVar138 = fVar138 + fVar138 * auVar37._0_4_;
      fVar293 = fVar293 + fVar293 * auVar37._4_4_;
      fVar294 = fVar294 + fVar294 * auVar37._8_4_;
      fVar295 = fVar295 + fVar295 * auVar37._12_4_;
      fVar296 = fVar296 + fVar296 * auVar37._16_4_;
      fVar297 = fVar297 + fVar297 * auVar37._20_4_;
      fVar298 = fVar298 + fVar298 * auVar37._24_4_;
      auVar312 = vsubps_avx(local_340,auVar124);
      fVar257 = auVar312._0_4_ * fVar138;
      fVar268 = auVar312._4_4_ * fVar293;
      auVar68._4_4_ = fVar268;
      auVar68._0_4_ = fVar257;
      fVar270 = auVar312._8_4_ * fVar294;
      auVar68._8_4_ = fVar270;
      fVar272 = auVar312._12_4_ * fVar295;
      auVar68._12_4_ = fVar272;
      fVar275 = auVar312._16_4_ * fVar296;
      auVar68._16_4_ = fVar275;
      fVar280 = auVar312._20_4_ * fVar297;
      auVar68._20_4_ = fVar280;
      fVar285 = auVar312._24_4_ * fVar298;
      auVar68._24_4_ = fVar285;
      auVar68._28_4_ = auVar312._28_4_;
      auVar312 = vsubps_avx(auVar124,local_320);
      fVar138 = auVar312._0_4_ * fVar138;
      fVar293 = auVar312._4_4_ * fVar293;
      auVar69._4_4_ = fVar293;
      auVar69._0_4_ = fVar138;
      fVar294 = auVar312._8_4_ * fVar294;
      auVar69._8_4_ = fVar294;
      fVar295 = auVar312._12_4_ * fVar295;
      auVar69._12_4_ = fVar295;
      fVar296 = auVar312._16_4_ * fVar296;
      auVar69._16_4_ = fVar296;
      fVar297 = auVar312._20_4_ * fVar297;
      auVar69._20_4_ = fVar297;
      fVar298 = auVar312._24_4_ * fVar298;
      auVar69._24_4_ = fVar298;
      auVar69._28_4_ = auVar38._28_4_ + auVar37._28_4_;
      local_3c0 = fVar299 * ((float)local_aa0._0_4_ + local_680 * fVar257);
      fStack_3bc = fVar315 * (local_aa0._4_4_ + fStack_67c * fVar268);
      fStack_3b8 = fVar320 * (local_aa0._8_4_ + fStack_678 * fVar270);
      fStack_3b4 = fVar325 * (local_aa0._12_4_ + fStack_674 * fVar272);
      fStack_3b0 = fVar330 * (local_aa0._16_4_ + fStack_670 * fVar275);
      fStack_3ac = fVar335 * (local_aa0._20_4_ + fStack_66c * fVar280);
      fStack_3a8 = fVar340 * (local_aa0._24_4_ + fStack_668 * fVar285);
      uStack_3a4 = 0x3f800000;
      local_3e0 = fVar299 * ((float)local_aa0._0_4_ + local_680 * fVar138);
      fStack_3dc = fVar315 * (local_aa0._4_4_ + fStack_67c * fVar293);
      fStack_3d8 = fVar320 * (local_aa0._8_4_ + fStack_678 * fVar294);
      fStack_3d4 = fVar325 * (local_aa0._12_4_ + fStack_674 * fVar295);
      fStack_3d0 = fVar330 * (local_aa0._16_4_ + fStack_670 * fVar296);
      fStack_3cc = fVar335 * (local_aa0._20_4_ + fStack_66c * fVar297);
      fStack_3c8 = fVar340 * (local_aa0._24_4_ + fStack_668 * fVar298);
      uStack_3c4 = 0x3f800000;
      auVar242._8_4_ = 0x7f800000;
      auVar242._0_8_ = 0x7f8000007f800000;
      auVar242._12_4_ = 0x7f800000;
      auVar242._16_4_ = 0x7f800000;
      auVar242._20_4_ = 0x7f800000;
      auVar242._24_4_ = 0x7f800000;
      auVar242._28_4_ = 0x7f800000;
      auVar206 = vblendvps_avx(auVar242,auVar68,auVar26);
      auVar243._8_4_ = 0xff800000;
      auVar243._0_8_ = 0xff800000ff800000;
      auVar243._12_4_ = 0xff800000;
      auVar243._16_4_ = 0xff800000;
      auVar243._20_4_ = 0xff800000;
      auVar243._24_4_ = 0xff800000;
      auVar243._28_4_ = 0xff800000;
      auVar128 = vblendvps_avx(auVar243,auVar69,auVar26);
      auVar37 = vmaxps_avx(local_660,auVar126);
      auVar70._4_4_ = auVar37._4_4_ * 1.9073486e-06;
      auVar70._0_4_ = auVar37._0_4_ * 1.9073486e-06;
      auVar70._8_4_ = auVar37._8_4_ * 1.9073486e-06;
      auVar70._12_4_ = auVar37._12_4_ * 1.9073486e-06;
      auVar70._16_4_ = auVar37._16_4_ * 1.9073486e-06;
      auVar70._20_4_ = auVar37._20_4_ * 1.9073486e-06;
      auVar70._24_4_ = auVar37._24_4_ * 1.9073486e-06;
      auVar70._28_4_ = auVar37._28_4_;
      auVar37 = vcmpps_avx(local_420,auVar70,1);
      auVar312 = auVar26 & auVar37;
      if ((((((((auVar312 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar312 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar312 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar312 >> 0x7f,0) != '\0') ||
            (auVar312 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar312 >> 0xbf,0) != '\0') ||
          (auVar312 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar312[0x1f] < '\0') {
        auVar37 = vandps_avx(auVar37,auVar26);
        auVar196 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
        auVar312 = vcmpps_avx(auVar134,_DAT_01f7b000,2);
        auVar401._8_4_ = 0xff800000;
        auVar401._0_8_ = 0xff800000ff800000;
        auVar401._12_4_ = 0xff800000;
        auVar401._16_4_ = 0xff800000;
        auVar401._20_4_ = 0xff800000;
        auVar401._24_4_ = 0xff800000;
        auVar401._28_4_ = 0xff800000;
        auVar384._8_4_ = 0x7f800000;
        auVar384._0_8_ = 0x7f8000007f800000;
        auVar384._12_4_ = 0x7f800000;
        auVar384._16_4_ = 0x7f800000;
        auVar384._20_4_ = 0x7f800000;
        auVar384._24_4_ = 0x7f800000;
        auVar384._28_4_ = 0x7f800000;
        auVar385 = ZEXT3264(auVar384);
        auVar134 = vblendvps_avx(auVar384,auVar401,auVar312);
        auVar304 = vpmovsxwd_avx(auVar196);
        auVar196 = vpunpckhwd_avx(auVar196,auVar196);
        auVar249._16_16_ = auVar196;
        auVar249._0_16_ = auVar304;
        auVar206 = vblendvps_avx(auVar206,auVar134,auVar249);
        auVar134 = vblendvps_avx(auVar401,auVar384,auVar312);
        auVar128 = vblendvps_avx(auVar128,auVar134,auVar249);
        auVar208._0_8_ = auVar37._0_8_ ^ 0xffffffffffffffff;
        auVar208._8_4_ = auVar37._8_4_ ^ 0xffffffff;
        auVar208._12_4_ = auVar37._12_4_ ^ 0xffffffff;
        auVar208._16_4_ = auVar37._16_4_ ^ 0xffffffff;
        auVar208._20_4_ = auVar37._20_4_ ^ 0xffffffff;
        auVar208._24_4_ = auVar37._24_4_ ^ 0xffffffff;
        auVar208._28_4_ = auVar37._28_4_ ^ 0xffffffff;
        auVar134 = vorps_avx(auVar312,auVar208);
        local_c80 = vandps_avx(auVar26,auVar134);
      }
    }
    auVar402 = ZEXT3264(auVar126);
    auVar356 = ZEXT3264(_local_a40);
    auVar292 = ZEXT3264(_local_940);
    auVar250 = ZEXT3264(local_600);
    auVar134 = local_600 & local_c80;
    auVar266 = ZEXT3264(_local_780);
    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar134 >> 0x7f,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar134 >> 0xbf,0) == '\0') &&
        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar134[0x1f])
    {
      auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
    }
    else {
      fStack_664 = fStack_924 + fStack_744 + fStack_764;
      auVar228 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar196 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_970._0_4_));
      auVar196 = vshufps_avx(auVar196,auVar196,0);
      auVar244._16_16_ = auVar196;
      auVar244._0_16_ = auVar196;
      auVar37 = vminps_avx(auVar244,auVar128);
      auVar402 = ZEXT3264(_local_780);
      fVar257 = fStack_764 + auVar196._12_4_;
      auVar160._0_4_ =
           (float)local_940._0_4_ * fVar302 +
           (float)local_760._0_4_ * fVar374 + (float)local_780._0_4_ * fVar393;
      auVar160._4_4_ =
           (float)local_940._4_4_ * fVar318 +
           (float)local_760._4_4_ * fVar386 + (float)local_780._4_4_ * fVar403;
      auVar160._8_4_ = fStack_938 * fVar323 + fStack_758 * fVar387 + fStack_778 * fVar405;
      auVar160._12_4_ = fStack_934 * fVar328 + fStack_754 * fVar388 + fStack_774 * fVar407;
      auVar160._16_4_ = fStack_930 * fVar333 + fStack_750 * fVar389 + fStack_770 * fVar409;
      auVar160._20_4_ = fStack_92c * fVar338 + fStack_74c * fVar390 + fStack_76c * fVar411;
      auVar160._24_4_ = fStack_928 * fVar343 + fStack_748 * fVar391 + fStack_768 * fVar413;
      auVar160._28_4_ = fStack_1c4 + fStack_204 + fStack_1c4;
      auVar134 = vrcpps_avx(auVar160);
      fVar138 = auVar134._0_4_;
      fVar293 = auVar134._4_4_;
      auVar71._4_4_ = auVar160._4_4_ * fVar293;
      auVar71._0_4_ = auVar160._0_4_ * fVar138;
      fVar294 = auVar134._8_4_;
      auVar71._8_4_ = auVar160._8_4_ * fVar294;
      fVar295 = auVar134._12_4_;
      auVar71._12_4_ = auVar160._12_4_ * fVar295;
      fVar296 = auVar134._16_4_;
      auVar71._16_4_ = auVar160._16_4_ * fVar296;
      fVar297 = auVar134._20_4_;
      auVar71._20_4_ = auVar160._20_4_ * fVar297;
      fVar298 = auVar134._24_4_;
      auVar71._24_4_ = auVar160._24_4_ * fVar298;
      auVar71._28_4_ = fVar257;
      auVar381._8_4_ = 0x3f800000;
      auVar381._0_8_ = 0x3f8000003f800000;
      auVar381._12_4_ = 0x3f800000;
      auVar381._16_4_ = 0x3f800000;
      auVar381._20_4_ = 0x3f800000;
      auVar381._24_4_ = 0x3f800000;
      auVar381._28_4_ = 0x3f800000;
      auVar385 = ZEXT3264(auVar381);
      auVar312 = vsubps_avx(auVar381,auVar71);
      auVar290._8_4_ = 0x7fffffff;
      auVar290._0_8_ = 0x7fffffff7fffffff;
      auVar290._12_4_ = 0x7fffffff;
      auVar290._16_4_ = 0x7fffffff;
      auVar290._20_4_ = 0x7fffffff;
      auVar290._24_4_ = 0x7fffffff;
      auVar290._28_4_ = 0x7fffffff;
      auVar134 = vandps_avx(auVar160,auVar290);
      auVar364._8_4_ = 0x219392ef;
      auVar364._0_8_ = 0x219392ef219392ef;
      auVar364._12_4_ = 0x219392ef;
      auVar364._16_4_ = 0x219392ef;
      auVar364._20_4_ = 0x219392ef;
      auVar364._24_4_ = 0x219392ef;
      auVar364._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar134,auVar364,1);
      auVar72._4_4_ =
           (fVar293 + fVar293 * auVar312._4_4_) *
           -(fVar318 * fVar232 + fVar386 * fVar427 + fVar368 * fVar403);
      auVar72._0_4_ =
           (fVar138 + fVar138 * auVar312._0_4_) *
           -(fVar302 * fVar137 + fVar374 * fVar421 + fVar359 * fVar393);
      auVar72._8_4_ =
           (fVar294 + fVar294 * auVar312._8_4_) *
           -(fVar323 * fVar269 + fVar387 * fVar428 + fVar369 * fVar405);
      auVar72._12_4_ =
           (fVar295 + fVar295 * auVar312._12_4_) *
           -(fVar328 * fVar281 + fVar388 * fVar429 + fVar370 * fVar407);
      auVar72._16_4_ =
           (fVar296 + fVar296 * auVar312._16_4_) *
           -(fVar333 * fVar253 + fVar389 * fVar430 + fVar371 * fVar409);
      auVar72._20_4_ =
           (fVar297 + fVar297 * auVar312._20_4_) *
           -(fVar338 * fVar277 + fVar390 * fVar431 + fVar372 * fVar411);
      auVar72._24_4_ =
           (fVar298 + fVar298 * auVar312._24_4_) *
           -(fVar343 * fVar286 + fVar391 * fVar432 + fVar373 * fVar413);
      auVar72._28_4_ = -(auVar365._28_4_ + fVar257);
      auVar365 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar134 = vcmpps_avx(auVar160,auVar365,1);
      auVar134 = vorps_avx(auVar26,auVar134);
      auVar420._8_4_ = 0xff800000;
      auVar420._0_8_ = 0xff800000ff800000;
      auVar420._12_4_ = 0xff800000;
      auVar420._16_4_ = 0xff800000;
      auVar420._20_4_ = 0xff800000;
      auVar420._24_4_ = 0xff800000;
      auVar420._28_4_ = 0xff800000;
      auVar134 = vblendvps_avx(auVar72,auVar420,auVar134);
      auVar365 = vcmpps_avx(auVar160,auVar365,6);
      auVar26 = vorps_avx(auVar26,auVar365);
      auVar425._8_4_ = 0x7f800000;
      auVar425._0_8_ = 0x7f8000007f800000;
      auVar425._12_4_ = 0x7f800000;
      auVar425._16_4_ = 0x7f800000;
      auVar425._20_4_ = 0x7f800000;
      auVar425._24_4_ = 0x7f800000;
      auVar425._28_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar72,auVar425,auVar26);
      auVar365 = vmaxps_avx(local_380,auVar206);
      auVar365 = vmaxps_avx(auVar365,auVar134);
      auVar37 = vminps_avx(auVar37,auVar26);
      auVar312 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar134 = vsubps_avx(auVar312,local_ae0);
      auVar26 = vsubps_avx(auVar312,auVar27);
      auVar73._4_4_ = auVar26._4_4_ * -fVar404;
      auVar73._0_4_ = auVar26._0_4_ * -fVar394;
      auVar73._8_4_ = auVar26._8_4_ * -fVar406;
      auVar73._12_4_ = auVar26._12_4_ * -fVar408;
      auVar73._16_4_ = auVar26._16_4_ * -fVar410;
      auVar73._20_4_ = auVar26._20_4_ * -fVar412;
      auVar73._24_4_ = auVar26._24_4_ * -fVar414;
      auVar73._28_4_ = auVar26._28_4_;
      auVar74._4_4_ = fVar357 * auVar134._4_4_;
      auVar74._0_4_ = fVar345 * auVar134._0_4_;
      auVar74._8_4_ = fVar358 * auVar134._8_4_;
      auVar74._12_4_ = fVar392 * auVar134._12_4_;
      auVar74._16_4_ = fVar274 * auVar134._16_4_;
      auVar74._20_4_ = fVar279 * auVar134._20_4_;
      auVar74._24_4_ = fVar284 * auVar134._24_4_;
      auVar74._28_4_ = auVar134._28_4_;
      auVar134 = vsubps_avx(auVar73,auVar74);
      auVar26 = vsubps_avx(auVar312,auVar29);
      auVar75._4_4_ = fVar319 * auVar26._4_4_;
      auVar75._0_4_ = fVar303 * auVar26._0_4_;
      auVar75._8_4_ = fVar324 * auVar26._8_4_;
      auVar75._12_4_ = fVar329 * auVar26._12_4_;
      auVar75._16_4_ = fVar334 * auVar26._16_4_;
      auVar75._20_4_ = fVar339 * auVar26._20_4_;
      uVar8 = auVar26._28_4_;
      auVar75._24_4_ = fVar344 * auVar26._24_4_;
      auVar75._28_4_ = uVar8;
      auVar27 = vsubps_avx(auVar134,auVar75);
      auVar76._4_4_ = (float)local_780._4_4_ * -fVar404;
      auVar76._0_4_ = (float)local_780._0_4_ * -fVar394;
      auVar76._8_4_ = fStack_778 * -fVar406;
      auVar76._12_4_ = fStack_774 * -fVar408;
      auVar76._16_4_ = fStack_770 * -fVar410;
      auVar76._20_4_ = fStack_76c * -fVar412;
      auVar76._24_4_ = fStack_768 * -fVar414;
      auVar76._28_4_ = uVar110 ^ 0x80000000;
      auVar77._4_4_ = (float)local_760._4_4_ * fVar357;
      auVar77._0_4_ = (float)local_760._0_4_ * fVar345;
      auVar77._8_4_ = fStack_758 * fVar358;
      auVar77._12_4_ = fStack_754 * fVar392;
      auVar77._16_4_ = fStack_750 * fVar274;
      auVar77._20_4_ = fStack_74c * fVar279;
      auVar77._24_4_ = fStack_748 * fVar284;
      auVar77._28_4_ = uVar8;
      auVar292 = ZEXT864(0) << 0x20;
      auVar134 = vsubps_avx(auVar76,auVar77);
      auVar78._4_4_ = fVar319 * (float)local_940._4_4_;
      auVar78._0_4_ = fVar303 * (float)local_940._0_4_;
      auVar78._8_4_ = fVar324 * fStack_938;
      auVar78._12_4_ = fVar329 * fStack_934;
      auVar78._16_4_ = fVar334 * fStack_930;
      auVar78._20_4_ = fVar339 * fStack_92c;
      auVar78._24_4_ = fVar344 * fStack_928;
      auVar78._28_4_ = uVar8;
      auVar29 = vsubps_avx(auVar134,auVar78);
      auVar134 = vrcpps_avx(auVar29);
      fVar138 = auVar134._0_4_;
      fVar137 = auVar134._4_4_;
      auVar79._4_4_ = auVar29._4_4_ * fVar137;
      auVar79._0_4_ = auVar29._0_4_ * fVar138;
      fVar232 = auVar134._8_4_;
      auVar79._8_4_ = auVar29._8_4_ * fVar232;
      fVar269 = auVar134._12_4_;
      auVar79._12_4_ = auVar29._12_4_ * fVar269;
      fVar281 = auVar134._16_4_;
      auVar79._16_4_ = auVar29._16_4_ * fVar281;
      fVar253 = auVar134._20_4_;
      auVar79._20_4_ = auVar29._20_4_ * fVar253;
      fVar277 = auVar134._24_4_;
      auVar79._24_4_ = auVar29._24_4_ * fVar277;
      auVar79._28_4_ = fStack_924;
      auVar312 = vsubps_avx(auVar381,auVar79);
      auVar264._8_4_ = 0x7fffffff;
      auVar264._0_8_ = 0x7fffffff7fffffff;
      auVar264._12_4_ = 0x7fffffff;
      auVar264._16_4_ = 0x7fffffff;
      auVar264._20_4_ = 0x7fffffff;
      auVar264._24_4_ = 0x7fffffff;
      auVar264._28_4_ = 0x7fffffff;
      auVar134 = vandps_avx(auVar29,auVar264);
      auVar366._8_4_ = 0x219392ef;
      auVar366._0_8_ = 0x219392ef219392ef;
      auVar366._12_4_ = 0x219392ef;
      auVar366._16_4_ = 0x219392ef;
      auVar366._20_4_ = 0x219392ef;
      auVar366._24_4_ = 0x219392ef;
      auVar366._28_4_ = 0x219392ef;
      auVar367 = ZEXT3264(auVar366);
      auVar26 = vcmpps_avx(auVar134,auVar366,1);
      auVar266 = ZEXT3264(auVar26);
      auVar80._4_4_ = (fVar137 + fVar137 * auVar312._4_4_) * -auVar27._4_4_;
      auVar80._0_4_ = (fVar138 + fVar138 * auVar312._0_4_) * -auVar27._0_4_;
      auVar80._8_4_ = (fVar232 + fVar232 * auVar312._8_4_) * -auVar27._8_4_;
      auVar80._12_4_ = (fVar269 + fVar269 * auVar312._12_4_) * -auVar27._12_4_;
      auVar80._16_4_ = (fVar281 + fVar281 * auVar312._16_4_) * -auVar27._16_4_;
      auVar80._20_4_ = (fVar253 + fVar253 * auVar312._20_4_) * -auVar27._20_4_;
      auVar80._24_4_ = (fVar277 + fVar277 * auVar312._24_4_) * -auVar27._24_4_;
      auVar80._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar134 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,1);
      auVar134 = vorps_avx(auVar26,auVar134);
      auVar134 = vblendvps_avx(auVar80,auVar420,auVar134);
      local_7a0 = vmaxps_avx(auVar365,auVar134);
      auVar250 = ZEXT3264(local_600);
      auVar134 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,6);
      auVar134 = vorps_avx(auVar26,auVar134);
      auVar26 = vblendvps_avx(auVar80,auVar425,auVar134);
      auVar134 = vandps_avx(local_c80,local_600);
      local_440 = vminps_avx(auVar37,auVar26);
      auVar26 = vcmpps_avx(local_7a0,local_440,2);
      auVar27 = auVar134 & auVar26;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar228 = ZEXT3264(auVar381);
        auVar356 = ZEXT3264(_local_a40);
      }
      else {
        auVar27 = vminps_avx(_local_b20,local_700);
        auVar28 = vminps_avx(auVar28,auVar30);
        auVar27 = vminps_avx(auVar27,auVar28);
        auVar27 = vsubps_avx(auVar27,local_2e0);
        auVar134 = vandps_avx(auVar26,auVar134);
        auVar101._4_4_ = fStack_3bc;
        auVar101._0_4_ = local_3c0;
        auVar101._8_4_ = fStack_3b8;
        auVar101._12_4_ = fStack_3b4;
        auVar101._16_4_ = fStack_3b0;
        auVar101._20_4_ = fStack_3ac;
        auVar101._24_4_ = fStack_3a8;
        auVar101._28_4_ = uStack_3a4;
        auVar26 = vminps_avx(auVar101,auVar381);
        auVar221 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar26 = vmaxps_avx(auVar26,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar438 + fVar433 * (auVar26._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar439 + fVar434 * (auVar26._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar440 + fVar435 * (auVar26._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar189 + fVar437 * (auVar26._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar438 + fVar433 * (auVar26._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar439 + fVar434 * (auVar26._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar440 + fVar435 * (auVar26._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar189 + auVar26._28_4_ + 7.0;
        auVar100._4_4_ = fStack_3dc;
        auVar100._0_4_ = local_3e0;
        auVar100._8_4_ = fStack_3d8;
        auVar100._12_4_ = fStack_3d4;
        auVar100._16_4_ = fStack_3d0;
        auVar100._20_4_ = fStack_3cc;
        auVar100._24_4_ = fStack_3c8;
        auVar100._28_4_ = uStack_3c4;
        auVar26 = vminps_avx(auVar100,auVar381);
        auVar26 = vmaxps_avx(auVar26,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar438 + fVar433 * (auVar26._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar439 + fVar434 * (auVar26._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar440 + fVar435 * (auVar26._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar189 + fVar437 * (auVar26._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar438 + fVar433 * (auVar26._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar439 + fVar434 * (auVar26._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar440 + fVar435 * (auVar26._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar189 + auVar26._28_4_ + 7.0;
        auVar81._4_4_ = auVar27._4_4_ * 0.99999976;
        auVar81._0_4_ = auVar27._0_4_ * 0.99999976;
        auVar81._8_4_ = auVar27._8_4_ * 0.99999976;
        auVar81._12_4_ = auVar27._12_4_ * 0.99999976;
        auVar81._16_4_ = auVar27._16_4_ * 0.99999976;
        auVar81._20_4_ = auVar27._20_4_ * 0.99999976;
        auVar81._24_4_ = auVar27._24_4_ * 0.99999976;
        auVar81._28_4_ = 0x3f7ffffc;
        auVar26 = vmaxps_avx(ZEXT832(0) << 0x20,auVar81);
        auVar82._4_4_ = auVar26._4_4_ * auVar26._4_4_;
        auVar82._0_4_ = auVar26._0_4_ * auVar26._0_4_;
        auVar82._8_4_ = auVar26._8_4_ * auVar26._8_4_;
        auVar82._12_4_ = auVar26._12_4_ * auVar26._12_4_;
        auVar82._16_4_ = auVar26._16_4_ * auVar26._16_4_;
        auVar82._20_4_ = auVar26._20_4_ * auVar26._20_4_;
        auVar82._24_4_ = auVar26._24_4_ * auVar26._24_4_;
        auVar82._28_4_ = auVar26._28_4_;
        auVar27 = vsubps_avx(local_720,auVar82);
        auVar83._4_4_ = auVar27._4_4_ * fStack_2bc;
        auVar83._0_4_ = auVar27._0_4_ * local_2c0;
        auVar83._8_4_ = auVar27._8_4_ * fStack_2b8;
        auVar83._12_4_ = auVar27._12_4_ * fStack_2b4;
        auVar83._16_4_ = auVar27._16_4_ * fStack_2b0;
        auVar83._20_4_ = auVar27._20_4_ * fStack_2ac;
        auVar83._24_4_ = auVar27._24_4_ * fStack_2a8;
        auVar83._28_4_ = auVar26._28_4_;
        auVar28 = vsubps_avx(local_740,auVar83);
        local_9a0 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,5);
        auVar26 = local_9a0;
        if ((((((((local_9a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_9a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_9a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_9a0 >> 0x7f,0) == '\0') &&
              (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_9a0 >> 0xbf,0) == '\0') &&
            (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_9a0[0x1f]) {
          auVar266 = ZEXT864(0) << 0x20;
          auVar250 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar416 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar422 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_b20 = ZEXT832(0) << 0x20;
          auVar313._8_4_ = 0x7f800000;
          auVar313._0_8_ = 0x7f8000007f800000;
          auVar313._12_4_ = 0x7f800000;
          auVar313._16_4_ = 0x7f800000;
          auVar313._20_4_ = 0x7f800000;
          auVar313._24_4_ = 0x7f800000;
          auVar313._28_4_ = 0x7f800000;
          auVar382._8_4_ = 0xff800000;
          auVar382._0_8_ = 0xff800000ff800000;
          auVar382._12_4_ = 0xff800000;
          auVar382._16_4_ = 0xff800000;
          auVar382._20_4_ = 0xff800000;
          auVar382._24_4_ = 0xff800000;
          auVar382._28_4_ = 0xff800000;
          auVar32 = auVar27;
          local_9a0 = auVar41;
        }
        else {
          auVar29 = vrcpps_avx(local_360);
          fVar138 = auVar29._0_4_;
          auVar223._0_4_ = local_360._0_4_ * fVar138;
          fVar137 = auVar29._4_4_;
          auVar223._4_4_ = local_360._4_4_ * fVar137;
          fVar232 = auVar29._8_4_;
          auVar223._8_4_ = local_360._8_4_ * fVar232;
          fVar269 = auVar29._12_4_;
          auVar223._12_4_ = local_360._12_4_ * fVar269;
          fVar281 = auVar29._16_4_;
          auVar223._16_4_ = local_360._16_4_ * fVar281;
          fVar253 = auVar29._20_4_;
          auVar223._20_4_ = local_360._20_4_ * fVar253;
          fVar277 = auVar29._24_4_;
          auVar223._24_4_ = local_360._24_4_ * fVar277;
          auVar223._28_4_ = 0;
          auVar365 = vsubps_avx(auVar381,auVar223);
          auVar30 = vsqrtps_avx(auVar28);
          fVar138 = fVar138 + fVar138 * auVar365._0_4_;
          fVar137 = fVar137 + fVar137 * auVar365._4_4_;
          fVar232 = fVar232 + fVar232 * auVar365._8_4_;
          fVar269 = fVar269 + fVar269 * auVar365._12_4_;
          fVar281 = fVar281 + fVar281 * auVar365._16_4_;
          fVar253 = fVar253 + fVar253 * auVar365._20_4_;
          fVar277 = fVar277 + fVar277 * auVar365._24_4_;
          auVar37 = vsubps_avx(local_340,auVar30);
          fVar433 = auVar37._0_4_ * fVar138;
          fVar434 = auVar37._4_4_ * fVar137;
          auVar84._4_4_ = fVar434;
          auVar84._0_4_ = fVar433;
          fVar435 = auVar37._8_4_ * fVar232;
          auVar84._8_4_ = fVar435;
          fVar437 = auVar37._12_4_ * fVar269;
          auVar84._12_4_ = fVar437;
          fVar438 = auVar37._16_4_ * fVar281;
          auVar84._16_4_ = fVar438;
          fVar439 = auVar37._20_4_ * fVar253;
          auVar84._20_4_ = fVar439;
          fVar440 = auVar37._24_4_ * fVar277;
          auVar84._24_4_ = fVar440;
          auVar84._28_4_ = fVar436;
          auVar37 = vsubps_avx(auVar30,local_320);
          fVar138 = auVar37._0_4_ * fVar138;
          fVar137 = auVar37._4_4_ * fVar137;
          auVar85._4_4_ = fVar137;
          auVar85._0_4_ = fVar138;
          fVar232 = auVar37._8_4_ * fVar232;
          auVar85._8_4_ = fVar232;
          fVar269 = auVar37._12_4_ * fVar269;
          auVar85._12_4_ = fVar269;
          fVar281 = auVar37._16_4_ * fVar281;
          auVar85._16_4_ = fVar281;
          fVar253 = auVar37._20_4_ * fVar253;
          auVar85._20_4_ = fVar253;
          fVar277 = auVar37._24_4_ * fVar277;
          auVar85._24_4_ = fVar277;
          auVar85._28_4_ = 0x7f800000;
          fVar286 = fVar299 * (fVar433 * local_680 + (float)local_aa0._0_4_);
          fVar293 = fVar315 * (fVar434 * fStack_67c + local_aa0._4_4_);
          fVar294 = fVar320 * (fVar435 * fStack_678 + local_aa0._8_4_);
          fVar295 = fVar325 * (fVar437 * fStack_674 + local_aa0._12_4_);
          fVar296 = fVar330 * (fVar438 * fStack_670 + local_aa0._16_4_);
          fVar297 = fVar335 * (fVar439 * fStack_66c + local_aa0._20_4_);
          fVar298 = fVar340 * (fVar440 * fStack_668 + local_aa0._24_4_);
          auVar129._0_4_ = fVar300 + fVar286 * fVar230;
          auVar129._4_4_ = fVar316 + fVar293 * fVar190;
          auVar129._8_4_ = fVar321 + fVar294 * fVar267;
          auVar129._12_4_ = fVar326 + fVar295 * fVar276;
          auVar129._16_4_ = fVar331 + fVar296 * fVar252;
          auVar129._20_4_ = fVar336 + fVar297 * fVar256;
          auVar129._24_4_ = fVar341 + fVar298 * fVar283;
          auVar129._28_4_ = fVar346 + auVar29._28_4_ + auVar365._28_4_ + local_aa0._28_4_;
          auVar86._4_4_ = (float)local_940._4_4_ * fVar434;
          auVar86._0_4_ = (float)local_940._0_4_ * fVar433;
          auVar86._8_4_ = fStack_938 * fVar435;
          auVar86._12_4_ = fStack_934 * fVar437;
          auVar86._16_4_ = fStack_930 * fVar438;
          auVar86._20_4_ = fStack_92c * fVar439;
          auVar86._24_4_ = fStack_928 * fVar440;
          auVar86._28_4_ = auVar30._28_4_;
          auVar29 = vsubps_avx(auVar86,auVar129);
          auVar32._4_4_ = fVar317;
          auVar32._0_4_ = fVar301;
          auVar32._8_4_ = fVar322;
          auVar32._12_4_ = fVar327;
          auVar32._16_4_ = fVar332;
          auVar32._20_4_ = fVar337;
          auVar32._24_4_ = fVar342;
          auVar32._28_4_ = fVar347;
          auVar245._0_4_ = fVar301 + fVar286 * fVar229;
          auVar245._4_4_ = fVar317 + fVar293 * fVar231;
          auVar245._8_4_ = fVar322 + fVar294 * fVar233;
          auVar245._12_4_ = fVar327 + fVar295 * fVar271;
          auVar245._16_4_ = fVar332 + fVar296 * fVar234;
          auVar245._20_4_ = fVar337 + fVar297 * fVar254;
          auVar245._24_4_ = fVar342 + fVar298 * fVar278;
          auVar245._28_4_ = fVar347 + auVar30._28_4_;
          auVar87._4_4_ = (float)local_760._4_4_ * fVar434;
          auVar87._0_4_ = (float)local_760._0_4_ * fVar433;
          auVar87._8_4_ = fStack_758 * fVar435;
          auVar87._12_4_ = fStack_754 * fVar437;
          auVar87._16_4_ = fStack_750 * fVar438;
          auVar87._20_4_ = fStack_74c * fVar439;
          auVar87._24_4_ = fStack_748 * fVar440;
          auVar87._28_4_ = 0x3e000000;
          local_ae0 = vsubps_avx(auVar87,auVar245);
          auVar224._0_4_ = local_a20 + fVar169 * fVar286;
          auVar224._4_4_ = fStack_a1c + fVar170 * fVar293;
          auVar224._8_4_ = fStack_a18 + fVar258 * fVar294;
          auVar224._12_4_ = fStack_a14 + fVar273 * fVar295;
          auVar224._16_4_ = fStack_a10 + fVar251 * fVar296;
          auVar224._20_4_ = fStack_a0c + fVar255 * fVar297;
          auVar224._24_4_ = fStack_a08 + fVar282 * fVar298;
          auVar224._28_4_ = fStack_a04 + auVar37._28_4_;
          auVar88._4_4_ = (float)local_780._4_4_ * fVar434;
          auVar88._0_4_ = (float)local_780._0_4_ * fVar433;
          auVar88._8_4_ = fStack_778 * fVar435;
          auVar88._12_4_ = fStack_774 * fVar437;
          auVar88._16_4_ = fStack_770 * fVar438;
          auVar88._20_4_ = fStack_76c * fVar439;
          auVar88._24_4_ = fStack_768 * fVar440;
          auVar88._28_4_ = auVar245._28_4_;
          _local_b20 = vsubps_avx(auVar88,auVar224);
          fVar299 = fVar299 * (fVar138 * local_680 + (float)local_aa0._0_4_);
          fVar315 = fVar315 * (fVar137 * fStack_67c + local_aa0._4_4_);
          fVar320 = fVar320 * (fVar232 * fStack_678 + local_aa0._8_4_);
          fVar325 = fVar325 * (fVar269 * fStack_674 + local_aa0._12_4_);
          fVar330 = fVar330 * (fVar281 * fStack_670 + local_aa0._16_4_);
          fVar335 = fVar335 * (fVar253 * fStack_66c + local_aa0._20_4_);
          fVar340 = fVar340 * (fVar277 * fStack_668 + local_aa0._24_4_);
          auVar225._0_4_ = fVar300 + fVar299 * fVar230;
          auVar225._4_4_ = fVar316 + fVar315 * fVar190;
          auVar225._8_4_ = fVar321 + fVar320 * fVar267;
          auVar225._12_4_ = fVar326 + fVar325 * fVar276;
          auVar225._16_4_ = fVar331 + fVar330 * fVar252;
          auVar225._20_4_ = fVar336 + fVar335 * fVar256;
          auVar225._24_4_ = fVar341 + fVar340 * fVar283;
          auVar225._28_4_ = fVar346 + local_b20._28_4_ + local_aa0._28_4_;
          auVar89._4_4_ = (float)local_940._4_4_ * fVar137;
          auVar89._0_4_ = (float)local_940._0_4_ * fVar138;
          auVar89._8_4_ = fStack_938 * fVar232;
          auVar89._12_4_ = fStack_934 * fVar269;
          auVar89._16_4_ = fStack_930 * fVar281;
          auVar89._20_4_ = fStack_92c * fVar253;
          auVar89._24_4_ = fStack_928 * fVar277;
          auVar89._28_4_ = 0x3e000000;
          auVar30 = vsubps_avx(auVar89,auVar225);
          auVar221 = auVar30._0_28_;
          auVar265._0_4_ = fVar301 + fVar299 * fVar229;
          auVar265._4_4_ = fVar317 + fVar315 * fVar231;
          auVar265._8_4_ = fVar322 + fVar320 * fVar233;
          auVar265._12_4_ = fVar327 + fVar325 * fVar271;
          auVar265._16_4_ = fVar332 + fVar330 * fVar234;
          auVar265._20_4_ = fVar337 + fVar335 * fVar254;
          auVar265._24_4_ = fVar342 + fVar340 * fVar278;
          auVar265._28_4_ = fVar347 + 0.125;
          auVar90._4_4_ = (float)local_760._4_4_ * fVar137;
          auVar90._0_4_ = (float)local_760._0_4_ * fVar138;
          auVar90._8_4_ = fStack_758 * fVar232;
          auVar90._12_4_ = fStack_754 * fVar269;
          auVar90._16_4_ = fStack_750 * fVar281;
          auVar90._20_4_ = fStack_74c * fVar253;
          auVar90._24_4_ = fStack_748 * fVar277;
          auVar90._28_4_ = fStack_924;
          auVar30 = vsubps_avx(auVar90,auVar265);
          auVar266 = ZEXT3264(auVar30);
          auVar246._0_4_ = local_a20 + fVar169 * fVar299;
          auVar246._4_4_ = fStack_a1c + fVar170 * fVar315;
          auVar246._8_4_ = fStack_a18 + fVar258 * fVar320;
          auVar246._12_4_ = fStack_a14 + fVar273 * fVar325;
          auVar246._16_4_ = fStack_a10 + fVar251 * fVar330;
          auVar246._20_4_ = fStack_a0c + fVar255 * fVar335;
          auVar246._24_4_ = fStack_a08 + fVar282 * fVar340;
          auVar246._28_4_ = fStack_a04 + auVar245._28_4_;
          auVar91._4_4_ = (float)local_780._4_4_ * fVar137;
          auVar91._0_4_ = (float)local_780._0_4_ * fVar138;
          auVar91._8_4_ = fStack_778 * fVar232;
          auVar91._12_4_ = fStack_774 * fVar269;
          auVar91._16_4_ = fStack_770 * fVar281;
          auVar91._20_4_ = fStack_76c * fVar253;
          auVar91._24_4_ = fStack_768 * fVar277;
          auVar91._28_4_ = fStack_924;
          auVar30 = vsubps_avx(auVar91,auVar246);
          auVar250 = ZEXT3264(auVar30);
          auVar28 = vcmpps_avx(auVar28,_DAT_01f7b000,5);
          auVar314._8_4_ = 0x7f800000;
          auVar314._0_8_ = 0x7f8000007f800000;
          auVar314._12_4_ = 0x7f800000;
          auVar314._16_4_ = 0x7f800000;
          auVar314._20_4_ = 0x7f800000;
          auVar314._24_4_ = 0x7f800000;
          auVar314._28_4_ = 0x7f800000;
          auVar313 = vblendvps_avx(auVar314,auVar84,auVar28);
          auVar126 = vmaxps_avx(local_660,auVar126);
          auVar92._4_4_ = auVar126._4_4_ * 1.9073486e-06;
          auVar92._0_4_ = auVar126._0_4_ * 1.9073486e-06;
          auVar92._8_4_ = auVar126._8_4_ * 1.9073486e-06;
          auVar92._12_4_ = auVar126._12_4_ * 1.9073486e-06;
          auVar92._16_4_ = auVar126._16_4_ * 1.9073486e-06;
          auVar92._20_4_ = auVar126._20_4_ * 1.9073486e-06;
          auVar92._24_4_ = auVar126._24_4_ * 1.9073486e-06;
          auVar92._28_4_ = auVar126._28_4_;
          auVar126 = vcmpps_avx(local_420,auVar92,1);
          auVar383._8_4_ = 0xff800000;
          auVar383._0_8_ = 0xff800000ff800000;
          auVar383._12_4_ = 0xff800000;
          auVar383._16_4_ = 0xff800000;
          auVar383._20_4_ = 0xff800000;
          auVar383._24_4_ = 0xff800000;
          auVar383._28_4_ = 0xff800000;
          auVar382 = vblendvps_avx(auVar383,auVar85,auVar28);
          auVar30 = auVar28 & auVar126;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            auVar126 = vandps_avx(auVar126,auVar28);
            auVar196 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
            auVar27 = vcmpps_avx(auVar27,_DAT_01f7b000,2);
            auVar135._8_4_ = 0xff800000;
            auVar135._0_8_ = 0xff800000ff800000;
            auVar135._12_4_ = 0xff800000;
            auVar135._16_4_ = 0xff800000;
            auVar135._20_4_ = 0xff800000;
            auVar135._24_4_ = 0xff800000;
            auVar135._28_4_ = 0xff800000;
            auVar291._8_4_ = 0x7f800000;
            auVar291._0_8_ = 0x7f8000007f800000;
            auVar291._12_4_ = 0x7f800000;
            auVar291._16_4_ = 0x7f800000;
            auVar291._20_4_ = 0x7f800000;
            auVar291._24_4_ = 0x7f800000;
            auVar291._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar291,auVar135,auVar27);
            auVar304 = vpmovsxwd_avx(auVar196);
            auVar196 = vpunpckhwd_avx(auVar196,auVar196);
            auVar426._16_16_ = auVar196;
            auVar426._0_16_ = auVar304;
            auVar313 = vblendvps_avx(auVar313,auVar26,auVar426);
            auVar26 = vblendvps_avx(auVar135,auVar291,auVar27);
            auVar382 = vblendvps_avx(auVar382,auVar26,auVar426);
            auVar209._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
            auVar209._8_4_ = auVar126._8_4_ ^ 0xffffffff;
            auVar209._12_4_ = auVar126._12_4_ ^ 0xffffffff;
            auVar209._16_4_ = auVar126._16_4_ ^ 0xffffffff;
            auVar209._20_4_ = auVar126._20_4_ ^ 0xffffffff;
            auVar209._24_4_ = auVar126._24_4_ ^ 0xffffffff;
            auVar209._28_4_ = auVar126._28_4_ ^ 0xffffffff;
            auVar32 = vorps_avx(auVar27,auVar209);
            auVar26 = vandps_avx(auVar28,auVar32);
          }
          auVar416 = auVar29._0_28_;
          auVar422 = local_ae0._0_28_;
        }
        auVar367 = ZEXT3264(auVar134);
        auVar402 = ZEXT3264(local_7a0);
        _local_4a0 = local_7a0;
        local_480 = vminps_avx(local_440,auVar313);
        _local_8e0 = vmaxps_avx(local_7a0,auVar382);
        _local_460 = _local_8e0;
        auVar126 = vcmpps_avx(local_7a0,local_480,2);
        local_6c0 = vandps_avx(auVar126,auVar134);
        auVar385 = ZEXT3264(local_6c0);
        auVar126 = vcmpps_avx(_local_8e0,local_440,2);
        local_900 = vandps_avx(auVar134,auVar126);
        auVar126 = vorps_avx(local_6c0,local_900);
        auVar292 = ZEXT3264(_local_940);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
          auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar356 = ZEXT3264(_local_a40);
        }
        else {
          auVar367 = ZEXT3264(_local_780);
          auVar185._0_8_ = auVar26._0_8_ ^ 0xffffffffffffffff;
          auVar185._8_4_ = auVar26._8_4_ ^ 0xffffffff;
          auVar185._12_4_ = auVar26._12_4_ ^ 0xffffffff;
          auVar185._16_4_ = auVar26._16_4_ ^ 0xffffffff;
          auVar185._20_4_ = auVar26._20_4_ ^ 0xffffffff;
          auVar185._24_4_ = auVar26._24_4_ ^ 0xffffffff;
          auVar185._28_4_ = (uint)auVar26._28_4_ ^ 0xffffffff;
          auVar161._0_4_ =
               (float)local_940._0_4_ * auVar221._0_4_ +
               (float)local_760._0_4_ * auVar266._0_4_ + (float)local_780._0_4_ * auVar250._0_4_;
          auVar161._4_4_ =
               (float)local_940._4_4_ * auVar221._4_4_ +
               (float)local_760._4_4_ * auVar266._4_4_ + (float)local_780._4_4_ * auVar250._4_4_;
          auVar161._8_4_ =
               fStack_938 * auVar221._8_4_ +
               fStack_758 * auVar266._8_4_ + fStack_778 * auVar250._8_4_;
          auVar161._12_4_ =
               fStack_934 * auVar221._12_4_ +
               fStack_754 * auVar266._12_4_ + fStack_774 * auVar250._12_4_;
          auVar161._16_4_ =
               fStack_930 * auVar221._16_4_ +
               fStack_750 * auVar266._16_4_ + fStack_770 * auVar250._16_4_;
          auVar161._20_4_ =
               fStack_92c * auVar221._20_4_ +
               fStack_74c * auVar266._20_4_ + fStack_76c * auVar250._20_4_;
          auVar161._24_4_ =
               fStack_928 * auVar221._24_4_ +
               fStack_748 * auVar266._24_4_ + fStack_768 * auVar250._24_4_;
          auVar161._28_4_ = auVar32._28_4_ + local_900._28_4_ + auVar126._28_4_;
          auVar226._8_4_ = 0x7fffffff;
          auVar226._0_8_ = 0x7fffffff7fffffff;
          auVar226._12_4_ = 0x7fffffff;
          auVar226._16_4_ = 0x7fffffff;
          auVar226._20_4_ = 0x7fffffff;
          auVar226._24_4_ = 0x7fffffff;
          auVar226._28_4_ = 0x7fffffff;
          auVar126 = vandps_avx(auVar161,auVar226);
          auVar247._8_4_ = 0x3e99999a;
          auVar247._0_8_ = 0x3e99999a3e99999a;
          auVar247._12_4_ = 0x3e99999a;
          auVar247._16_4_ = 0x3e99999a;
          auVar247._20_4_ = 0x3e99999a;
          auVar247._24_4_ = 0x3e99999a;
          auVar247._28_4_ = 0x3e99999a;
          auVar126 = vcmpps_avx(auVar126,auVar247,1);
          local_700 = vorps_avx(auVar126,auVar185);
          auVar130._0_4_ =
               auVar416._0_4_ * (float)local_940._0_4_ +
               (float)local_760._0_4_ * auVar422._0_4_ +
               (float)local_780._0_4_ * (float)local_b20._0_4_;
          auVar130._4_4_ =
               auVar416._4_4_ * (float)local_940._4_4_ +
               (float)local_760._4_4_ * auVar422._4_4_ +
               (float)local_780._4_4_ * (float)local_b20._4_4_;
          auVar130._8_4_ =
               auVar416._8_4_ * fStack_938 + fStack_758 * auVar422._8_4_ + fStack_778 * fStack_b18;
          auVar130._12_4_ =
               auVar416._12_4_ * fStack_934 + fStack_754 * auVar422._12_4_ + fStack_774 * fStack_b14
          ;
          auVar130._16_4_ =
               auVar416._16_4_ * fStack_930 + fStack_750 * auVar422._16_4_ + fStack_770 * fStack_b10
          ;
          auVar130._20_4_ =
               auVar416._20_4_ * fStack_92c + fStack_74c * auVar422._20_4_ + fStack_76c * fStack_b0c
          ;
          auVar130._24_4_ =
               auVar416._24_4_ * fStack_928 + fStack_748 * auVar422._24_4_ + fStack_768 * fStack_b08
          ;
          auVar130._28_4_ = auVar26._28_4_ + local_700._28_4_ + auVar32._28_4_;
          auVar126 = vandps_avx(auVar130,auVar226);
          auVar126 = vcmpps_avx(auVar126,auVar247,1);
          auVar126 = vorps_avx(auVar126,auVar185);
          auVar162._8_4_ = 3;
          auVar162._0_8_ = 0x300000003;
          auVar162._12_4_ = 3;
          auVar162._16_4_ = 3;
          auVar162._20_4_ = 3;
          auVar162._24_4_ = 3;
          auVar162._28_4_ = 3;
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar186,auVar162,auVar126);
          local_720 = ZEXT432(uVar108);
          auVar304 = vpshufd_avx(ZEXT416(uVar108),0);
          auVar196 = vpcmpgtd_avx(auVar126._16_16_,auVar304);
          local_740._0_16_ = auVar304;
          auVar304 = vpcmpgtd_avx(auVar126._0_16_,auVar304);
          auVar163._16_16_ = auVar196;
          auVar163._0_16_ = auVar304;
          local_6e0 = vblendps_avx(ZEXT1632(auVar304),auVar163,0xf0);
          auVar126 = vandnps_avx(local_6e0,local_6c0);
          local_9c0._4_4_ = local_7a0._4_4_ + (float)local_a40._4_4_;
          local_9c0._0_4_ = local_7a0._0_4_ + (float)local_a40._0_4_;
          fStack_9b8 = local_7a0._8_4_ + fStack_a38;
          fStack_9b4 = local_7a0._12_4_ + fStack_a34;
          fStack_9b0 = local_7a0._16_4_ + fStack_a30;
          fStack_9ac = local_7a0._20_4_ + fStack_a2c;
          fStack_9a8 = local_7a0._24_4_ + fStack_a28;
          fStack_9a4 = local_7a0._28_4_ + fStack_a24;
          while( true ) {
            local_4c0 = auVar126;
            local_c50._0_4_ = auVar34._0_4_;
            local_c50._4_4_ = auVar34._4_4_;
            fStack_c48 = auVar34._8_4_;
            fStack_c44 = auVar34._12_4_;
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0x7f,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0xbf,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar126[0x1f]) break;
            auVar164._8_4_ = 0x7f800000;
            auVar164._0_8_ = 0x7f8000007f800000;
            auVar164._12_4_ = 0x7f800000;
            auVar164._16_4_ = 0x7f800000;
            auVar164._20_4_ = 0x7f800000;
            auVar164._24_4_ = 0x7f800000;
            auVar164._28_4_ = 0x7f800000;
            auVar134 = vblendvps_avx(auVar164,local_7a0,auVar126);
            auVar26 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar26 = vminps_avx(auVar134,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar134 = vcmpps_avx(auVar134,auVar26,0);
            auVar26 = auVar126 & auVar134;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar134,auVar126);
            }
            uVar102 = vmovmskps_avx(auVar126);
            uVar110 = 0;
            if (uVar102 != 0) {
              for (; (uVar102 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
              }
            }
            uVar103 = (ulong)uVar110;
            *(undefined4 *)(local_4c0 + uVar103 * 4) = 0;
            fVar138 = local_1a0[uVar103];
            uVar110 = *(uint *)(local_4a0 + uVar103 * 4);
            fVar229 = auVar141._0_4_;
            if ((float)local_a60._0_4_ < 0.0) {
              auVar367 = ZEXT1664(auVar367._0_16_);
              auVar385 = ZEXT1664(auVar385._0_16_);
              auVar402 = ZEXT1664(auVar402._0_16_);
              fVar229 = sqrtf((float)local_a60._0_4_);
            }
            auVar292 = ZEXT464(uVar110);
            auVar266 = ZEXT464((uint)fVar138);
            auVar304 = vminps_avx(_local_ac0,_local_9e0);
            auVar196 = vmaxps_avx(_local_ac0,_local_9e0);
            auVar115 = vminps_avx(auVar34,_local_a00);
            auVar173 = vminps_avx(auVar304,auVar115);
            auVar304 = vmaxps_avx(auVar34,_local_a00);
            auVar115 = vmaxps_avx(auVar196,auVar304);
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
            auVar196 = vandps_avx(auVar173,auVar193);
            auVar304 = vandps_avx(auVar115,auVar193);
            auVar196 = vmaxps_avx(auVar196,auVar304);
            auVar304 = vmovshdup_avx(auVar196);
            auVar304 = vmaxss_avx(auVar304,auVar196);
            auVar196 = vshufpd_avx(auVar196,auVar196,1);
            auVar196 = vmaxss_avx(auVar196,auVar304);
            local_b20._0_4_ = auVar196._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar229 * 1.9073486e-06;
            local_aa0._0_16_ = vshufps_avx(auVar115,auVar115,0xff);
            auVar196 = vinsertps_avx(ZEXT416(uVar110),ZEXT416((uint)fVar138),0x10);
            auVar228 = ZEXT1664(auVar196);
            lVar105 = 5;
            do {
              do {
                auVar196 = auVar228._0_16_;
                bVar111 = lVar105 == 0;
                lVar105 = lVar105 + -1;
                if (bVar111) goto LAB_00ad02f4;
                auVar304 = vmovshdup_avx(auVar196);
                fVar138 = auVar304._0_4_;
                fVar137 = 1.0 - fVar138;
                fVar229 = fVar137 * fVar137 * fVar137;
                fVar169 = fVar138 * fVar138 * fVar138;
                fVar230 = fVar138 * fVar137;
                auVar304 = vshufps_avx(ZEXT416((uint)(fVar169 * 0.16666667)),
                                       ZEXT416((uint)(fVar169 * 0.16666667)),0);
                auVar115 = ZEXT416((uint)((fVar169 * 4.0 + fVar229 +
                                          fVar138 * fVar230 * 12.0 + fVar137 * fVar230 * 6.0) *
                                         0.16666667));
                auVar115 = vshufps_avx(auVar115,auVar115,0);
                auVar173 = ZEXT416((uint)((fVar229 * 4.0 + fVar169 +
                                          fVar137 * fVar230 * 12.0 + fVar138 * fVar230 * 6.0) *
                                         0.16666667));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar117 = vshufps_avx(auVar196,auVar196,0);
                auVar174._0_4_ = auVar117._0_4_ * (float)local_a50._0_4_ + 0.0;
                auVar174._4_4_ = auVar117._4_4_ * (float)local_a50._4_4_ + 0.0;
                auVar174._8_4_ = auVar117._8_4_ * fStack_a48 + 0.0;
                auVar174._12_4_ = auVar117._12_4_ * fStack_a44 + 0.0;
                auVar117 = vshufps_avx(ZEXT416((uint)(fVar229 * 0.16666667)),
                                       ZEXT416((uint)(fVar229 * 0.16666667)),0);
                auVar114._0_4_ =
                     auVar117._0_4_ * (float)local_ac0._0_4_ +
                     auVar173._0_4_ * (float)local_9e0._0_4_ +
                     auVar304._0_4_ * (float)local_a00._0_4_ +
                     auVar115._0_4_ * (float)local_c50._0_4_;
                auVar114._4_4_ =
                     auVar117._4_4_ * (float)local_ac0._4_4_ +
                     auVar173._4_4_ * (float)local_9e0._4_4_ +
                     auVar304._4_4_ * (float)local_a00._4_4_ +
                     auVar115._4_4_ * (float)local_c50._4_4_;
                auVar114._8_4_ =
                     auVar117._8_4_ * fStack_ab8 +
                     auVar173._8_4_ * fStack_9d8 +
                     auVar304._8_4_ * fStack_9f8 + auVar115._8_4_ * fStack_c48;
                auVar114._12_4_ =
                     auVar117._12_4_ * fStack_ab4 +
                     auVar173._12_4_ * fStack_9d4 +
                     auVar304._12_4_ * fStack_9f4 + auVar115._12_4_ * fStack_c44;
                local_ae0._0_16_ = auVar114;
                auVar304 = vsubps_avx(auVar174,auVar114);
                local_a20 = auVar304._0_4_;
                fStack_a1c = auVar304._4_4_;
                fStack_a18 = auVar304._8_4_;
                fStack_a14 = auVar304._12_4_;
                auVar304 = vdpps_avx(auVar304,auVar304,0x7f);
                fVar229 = auVar304._0_4_;
                if (fVar229 < 0.0) {
                  auVar266._0_4_ = sqrtf(fVar229);
                  auVar266._4_60_ = extraout_var;
                  auVar115 = auVar266._0_16_;
                }
                else {
                  auVar115 = vsqrtss_avx(auVar304,auVar304);
                }
                auVar385 = ZEXT1664(auVar115);
                auVar173 = ZEXT416((uint)(fVar138 * fVar138 * 0.5));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar117 = ZEXT416((uint)((fVar137 * fVar137 + fVar230 * 4.0) * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar142 = ZEXT416((uint)((fVar138 * -fVar138 - fVar230 * 4.0) * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar116 = ZEXT416((uint)(fVar137 * -fVar137 * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar305._0_4_ =
                     (float)local_ac0._0_4_ * auVar116._0_4_ +
                     (float)local_9e0._0_4_ * auVar142._0_4_ +
                     (float)local_a00._0_4_ * auVar173._0_4_ +
                     (float)local_c50._0_4_ * auVar117._0_4_;
                auVar305._4_4_ =
                     (float)local_ac0._4_4_ * auVar116._4_4_ +
                     (float)local_9e0._4_4_ * auVar142._4_4_ +
                     (float)local_a00._4_4_ * auVar173._4_4_ +
                     (float)local_c50._4_4_ * auVar117._4_4_;
                auVar305._8_4_ =
                     fStack_ab8 * auVar116._8_4_ +
                     fStack_9d8 * auVar142._8_4_ +
                     fStack_9f8 * auVar173._8_4_ + fStack_c48 * auVar117._8_4_;
                auVar305._12_4_ =
                     fStack_ab4 * auVar116._12_4_ +
                     fStack_9d4 * auVar142._12_4_ +
                     fStack_9f4 * auVar173._12_4_ + fStack_c44 * auVar117._12_4_;
                auVar173 = vshufps_avx(auVar196,auVar196,0x55);
                auVar117 = ZEXT416((uint)(fVar137 - (fVar138 + fVar138)));
                auVar142 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)(fVar138 - (fVar137 + fVar137)));
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar35 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
                auVar117 = vdpps_avx(auVar305,auVar305,0x7f);
                auVar143._0_4_ =
                     (float)local_ac0._0_4_ * auVar35._0_4_ +
                     (float)local_9e0._0_4_ * auVar116._0_4_ +
                     (float)local_a00._0_4_ * auVar173._0_4_ +
                     (float)local_c50._0_4_ * auVar142._0_4_;
                auVar143._4_4_ =
                     (float)local_ac0._4_4_ * auVar35._4_4_ +
                     (float)local_9e0._4_4_ * auVar116._4_4_ +
                     (float)local_a00._4_4_ * auVar173._4_4_ +
                     (float)local_c50._4_4_ * auVar142._4_4_;
                auVar143._8_4_ =
                     fStack_ab8 * auVar35._8_4_ +
                     fStack_9d8 * auVar116._8_4_ +
                     fStack_9f8 * auVar173._8_4_ + fStack_c48 * auVar142._8_4_;
                auVar143._12_4_ =
                     fStack_ab4 * auVar35._12_4_ +
                     fStack_9d4 * auVar116._12_4_ +
                     fStack_9f4 * auVar173._12_4_ + fStack_c44 * auVar142._12_4_;
                auVar173 = vblendps_avx(auVar117,_DAT_01f45a50,0xe);
                auVar142 = vrsqrtss_avx(auVar173,auVar173);
                fVar169 = auVar142._0_4_;
                fVar138 = auVar117._0_4_;
                auVar142 = vdpps_avx(auVar305,auVar143,0x7f);
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar116._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar116._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar116._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar116._12_4_;
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar213._0_4_ = auVar305._0_4_ * auVar142._0_4_;
                auVar213._4_4_ = auVar305._4_4_ * auVar142._4_4_;
                auVar213._8_4_ = auVar305._8_4_ * auVar142._8_4_;
                auVar213._12_4_ = auVar305._12_4_ * auVar142._12_4_;
                auVar35 = vsubps_avx(auVar144,auVar213);
                auVar142 = vrcpss_avx(auVar173,auVar173);
                auVar173 = vmaxss_avx(ZEXT416((uint)local_b20._0_4_),
                                      ZEXT416((uint)(auVar228._0_4_ * (float)local_9a0._0_4_)));
                auVar367 = ZEXT1664(auVar173);
                auVar142 = ZEXT416((uint)(auVar142._0_4_ * (2.0 - fVar138 * auVar142._0_4_)));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                uVar103 = CONCAT44(auVar305._4_4_,auVar305._0_4_);
                auVar237._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar237._8_4_ = -auVar305._8_4_;
                auVar237._12_4_ = -auVar305._12_4_;
                auVar116 = ZEXT416((uint)(fVar169 * 1.5 +
                                         fVar138 * -0.5 * fVar169 * fVar169 * fVar169));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar194._0_4_ = auVar116._0_4_ * auVar35._0_4_ * auVar142._0_4_;
                auVar194._4_4_ = auVar116._4_4_ * auVar35._4_4_ * auVar142._4_4_;
                auVar194._8_4_ = auVar116._8_4_ * auVar35._8_4_ * auVar142._8_4_;
                auVar194._12_4_ = auVar116._12_4_ * auVar35._12_4_ * auVar142._12_4_;
                auVar259._0_4_ = auVar305._0_4_ * auVar116._0_4_;
                auVar259._4_4_ = auVar305._4_4_ * auVar116._4_4_;
                auVar259._8_4_ = auVar305._8_4_ * auVar116._8_4_;
                auVar259._12_4_ = auVar305._12_4_ * auVar116._12_4_;
                if (fVar138 < 0.0) {
                  local_a80._0_16_ = auVar194;
                  fVar138 = sqrtf(fVar138);
                  auVar385 = ZEXT464(auVar115._0_4_);
                  auVar367 = ZEXT464(auVar173._0_4_);
                  auVar194 = local_a80._0_16_;
                }
                else {
                  auVar115 = vsqrtss_avx(auVar117,auVar117);
                  fVar138 = auVar115._0_4_;
                }
                auVar97._4_4_ = fStack_a1c;
                auVar97._0_4_ = local_a20;
                auVar97._8_4_ = fStack_a18;
                auVar97._12_4_ = fStack_a14;
                auVar115 = vdpps_avx(auVar97,auVar259,0x7f);
                fVar138 = ((float)local_b20._0_4_ / fVar138) * (auVar385._0_4_ + 1.0) +
                          auVar367._0_4_ + auVar385._0_4_ * (float)local_b20._0_4_;
                auVar117 = vdpps_avx(auVar237,auVar259,0x7f);
                auVar142 = vdpps_avx(auVar97,auVar194,0x7f);
                auVar116 = vdpps_avx(_local_a50,auVar259,0x7f);
                auVar35 = vdpps_avx(auVar97,auVar237,0x7f);
                fVar169 = auVar117._0_4_ + auVar142._0_4_;
                fVar230 = auVar115._0_4_;
                auVar118._0_4_ = fVar230 * fVar230;
                auVar118._4_4_ = auVar115._4_4_ * auVar115._4_4_;
                auVar118._8_4_ = auVar115._8_4_ * auVar115._8_4_;
                auVar118._12_4_ = auVar115._12_4_ * auVar115._12_4_;
                auVar142 = vsubps_avx(auVar304,auVar118);
                auVar117 = vdpps_avx(auVar97,_local_a50,0x7f);
                fVar137 = auVar35._0_4_ - fVar230 * fVar169;
                fVar231 = auVar117._0_4_ - fVar230 * auVar116._0_4_;
                auVar117 = vrsqrtss_avx(auVar142,auVar142);
                fVar170 = auVar142._0_4_;
                fVar230 = auVar117._0_4_;
                fVar230 = fVar230 * 1.5 + fVar170 * -0.5 * fVar230 * fVar230 * fVar230;
                if (fVar170 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar169);
                  local_880._0_4_ = fVar137;
                  local_8a0._0_4_ = fVar231;
                  local_8c0._0_4_ = fVar230;
                  auVar385 = ZEXT1664(auVar385._0_16_);
                  fVar170 = sqrtf(fVar170);
                  auVar367 = ZEXT464(auVar173._0_4_);
                  fVar230 = (float)local_8c0._0_4_;
                  fVar137 = (float)local_880._0_4_;
                  fVar231 = (float)local_8a0._0_4_;
                  auVar173 = local_a80._0_16_;
                }
                else {
                  auVar173 = vsqrtss_avx(auVar142,auVar142);
                  fVar170 = auVar173._0_4_;
                  auVar173 = ZEXT416((uint)fVar169);
                }
                auVar402 = ZEXT1664(auVar115);
                auVar292 = ZEXT1664(auVar304);
                auVar119 = vpermilps_avx(local_ae0._0_16_,0xff);
                auVar35 = vshufps_avx(auVar305,auVar305,0xff);
                fVar137 = fVar137 * fVar230 - auVar35._0_4_;
                auVar214._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar214._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar214._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar238._0_4_ = -fVar137;
                auVar238._4_4_ = 0x80000000;
                auVar238._8_4_ = 0x80000000;
                auVar238._12_4_ = 0x80000000;
                fVar169 = auVar173._0_4_ * fVar231 * fVar230;
                auVar266 = ZEXT464((uint)fVar169);
                auVar117 = vinsertps_avx(auVar238,ZEXT416((uint)(fVar231 * fVar230)),0x1c);
                auVar142 = vmovsldup_avx(ZEXT416((uint)(fVar169 - auVar116._0_4_ * fVar137)));
                auVar117 = vdivps_avx(auVar117,auVar142);
                auVar173 = vinsertps_avx(auVar173,auVar214,0x10);
                auVar173 = vdivps_avx(auVar173,auVar142);
                auVar142 = vmovsldup_avx(auVar115);
                auVar119 = ZEXT416((uint)(fVar170 - auVar119._0_4_));
                auVar116 = vmovsldup_avx(auVar119);
                auVar175._0_4_ = auVar142._0_4_ * auVar117._0_4_ + auVar116._0_4_ * auVar173._0_4_;
                auVar175._4_4_ = auVar142._4_4_ * auVar117._4_4_ + auVar116._4_4_ * auVar173._4_4_;
                auVar175._8_4_ = auVar142._8_4_ * auVar117._8_4_ + auVar116._8_4_ * auVar173._8_4_;
                auVar175._12_4_ =
                     auVar142._12_4_ * auVar117._12_4_ + auVar116._12_4_ * auVar173._12_4_;
                auVar173 = vsubps_avx(auVar196,auVar175);
                auVar228 = ZEXT1664(auVar173);
                auVar176._8_4_ = 0x7fffffff;
                auVar176._0_8_ = 0x7fffffff7fffffff;
                auVar176._12_4_ = 0x7fffffff;
                auVar196 = vandps_avx(auVar115,auVar176);
              } while (fVar138 <= auVar196._0_4_);
              auVar195._8_4_ = 0x7fffffff;
              auVar195._0_8_ = 0x7fffffff7fffffff;
              auVar195._12_4_ = 0x7fffffff;
              auVar196 = vandps_avx(auVar119,auVar195);
            } while ((float)local_aa0._0_4_ * 1.9073486e-06 + auVar367._0_4_ + fVar138 <=
                     auVar196._0_4_);
            fVar138 = auVar173._0_4_ + (float)local_970._0_4_;
            if (fVar210 <= fVar138) {
              fVar169 = *(float *)(ray + k * 4 + 0x80);
              auVar266 = ZEXT464((uint)fVar169);
              if (fVar138 <= fVar169) {
                auVar196 = vmovshdup_avx(auVar173);
                fVar230 = auVar196._0_4_;
                if ((0.0 <= fVar230) && (fVar230 <= 1.0)) {
                  auVar196 = vrsqrtss_avx(auVar304,auVar304);
                  fVar137 = auVar196._0_4_;
                  pGVar20 = (context->scene->geometries).items[uVar106].ptr;
                  if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar196 = ZEXT416((uint)(fVar137 * 1.5 +
                                             fVar229 * -0.5 * fVar137 * fVar137 * fVar137));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar197._0_4_ = auVar196._0_4_ * local_a20;
                    auVar197._4_4_ = auVar196._4_4_ * fStack_a1c;
                    auVar197._8_4_ = auVar196._8_4_ * fStack_a18;
                    auVar197._12_4_ = auVar196._12_4_ * fStack_a14;
                    auVar145._0_4_ = auVar305._0_4_ + auVar35._0_4_ * auVar197._0_4_;
                    auVar145._4_4_ = auVar305._4_4_ + auVar35._4_4_ * auVar197._4_4_;
                    auVar145._8_4_ = auVar305._8_4_ + auVar35._8_4_ * auVar197._8_4_;
                    auVar145._12_4_ = auVar305._12_4_ + auVar35._12_4_ * auVar197._12_4_;
                    auVar196 = vshufps_avx(auVar197,auVar197,0xc9);
                    auVar117 = vshufps_avx(auVar305,auVar305,0xc9);
                    auVar198._0_4_ = auVar117._0_4_ * auVar197._0_4_;
                    auVar198._4_4_ = auVar117._4_4_ * auVar197._4_4_;
                    auVar198._8_4_ = auVar117._8_4_ * auVar197._8_4_;
                    auVar198._12_4_ = auVar117._12_4_ * auVar197._12_4_;
                    auVar215._0_4_ = auVar305._0_4_ * auVar196._0_4_;
                    auVar215._4_4_ = auVar305._4_4_ * auVar196._4_4_;
                    auVar215._8_4_ = auVar305._8_4_ * auVar196._8_4_;
                    auVar215._12_4_ = auVar305._12_4_ * auVar196._12_4_;
                    auVar142 = vsubps_avx(auVar215,auVar198);
                    auVar196 = vshufps_avx(auVar142,auVar142,0xc9);
                    auVar117 = vshufps_avx(auVar145,auVar145,0xc9);
                    auVar216._0_4_ = auVar117._0_4_ * auVar196._0_4_;
                    auVar216._4_4_ = auVar117._4_4_ * auVar196._4_4_;
                    auVar216._8_4_ = auVar117._8_4_ * auVar196._8_4_;
                    auVar216._12_4_ = auVar117._12_4_ * auVar196._12_4_;
                    auVar196 = vshufps_avx(auVar142,auVar142,0xd2);
                    auVar146._0_4_ = auVar145._0_4_ * auVar196._0_4_;
                    auVar146._4_4_ = auVar145._4_4_ * auVar196._4_4_;
                    auVar146._8_4_ = auVar145._8_4_ * auVar196._8_4_;
                    auVar146._12_4_ = auVar145._12_4_ * auVar196._12_4_;
                    auVar196 = vsubps_avx(auVar216,auVar146);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar138;
                      uVar8 = vextractps_avx(auVar196,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                      uVar8 = vextractps_avx(auVar196,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                      *(int *)(ray + k * 4 + 0xe0) = auVar196._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar230;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_ae8;
                      *(uint *)(ray + k * 4 + 0x120) = uVar106;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_810 = vshufps_avx(auVar173,auVar173,0x55);
                      auVar173 = vshufps_avx(auVar196,auVar196,0x55);
                      auStack_830 = vshufps_avx(auVar196,auVar196,0xaa);
                      local_820 = vshufps_avx(auVar196,auVar196,0);
                      local_840 = (RTCHitN  [16])auVar173;
                      local_800 = ZEXT816(0) << 0x20;
                      local_7f0 = local_860._0_8_;
                      uStack_7e8 = local_860._8_8_;
                      local_7e0 = local_850;
                      vcmpps_avx(ZEXT1632(local_850),ZEXT1632(local_850),0xf);
                      uStack_7cc = context->user->instID[0];
                      local_7d0 = uStack_7cc;
                      uStack_7c8 = uStack_7cc;
                      uStack_7c4 = uStack_7cc;
                      uVar110 = context->user->instPrimID[0];
                      auVar147._4_4_ = uVar110;
                      auVar147._0_4_ = uVar110;
                      auVar147._8_4_ = uVar110;
                      auVar147._12_4_ = uVar110;
                      auStack_7c0 = auVar147;
                      *(float *)(ray + k * 4 + 0x80) = fVar138;
                      local_920._0_16_ = *local_af0;
                      local_b50.valid = (int *)local_920;
                      local_b50.geometryUserPtr = pGVar20->userPtr;
                      local_b50.context = context->user;
                      local_b50.hit = local_840;
                      local_b50.N = 4;
                      auVar196 = *local_af0;
                      local_b50.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar292 = ZEXT1664(auVar304);
                        auVar367 = ZEXT1664(auVar367._0_16_);
                        auVar385 = ZEXT1664(auVar385._0_16_);
                        auVar402 = ZEXT1664(auVar115);
                        (*pGVar20->intersectionFilterN)(&local_b50);
                        auVar356._8_56_ = extraout_var_01;
                        auVar356._0_8_ = extraout_XMM1_Qa;
                        auVar147 = auVar356._0_16_;
                        auVar196 = local_920._0_16_;
                      }
                      if (auVar196 == (undefined1  [16])0x0) {
                        auVar304 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar196 = vpcmpeqd_avx(auVar147,auVar147);
                        auVar304 = auVar304 ^ auVar196;
                      }
                      else {
                        p_Var25 = context->args->filter;
                        auVar115 = vpcmpeqd_avx(auVar173,auVar173);
                        if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar292 = ZEXT1664(auVar292._0_16_);
                          auVar367 = ZEXT1664(auVar367._0_16_);
                          auVar385 = ZEXT1664(auVar385._0_16_);
                          auVar402 = ZEXT1664(auVar402._0_16_);
                          (*p_Var25)(&local_b50);
                          auVar115 = vpcmpeqd_avx(auVar115,auVar115);
                          auVar196 = local_920._0_16_;
                        }
                        auVar173 = vpcmpeqd_avx(auVar196,_DAT_01f45a50);
                        auVar304 = auVar173 ^ auVar115;
                        if (auVar196 != (undefined1  [16])0x0) {
                          auVar173 = auVar173 ^ auVar115;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])local_b50.hit);
                          *(undefined1 (*) [16])(local_b50.ray + 0xc0) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x10));
                          *(undefined1 (*) [16])(local_b50.ray + 0xd0) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x20));
                          *(undefined1 (*) [16])(local_b50.ray + 0xe0) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x30));
                          *(undefined1 (*) [16])(local_b50.ray + 0xf0) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x40));
                          *(undefined1 (*) [16])(local_b50.ray + 0x100) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x50));
                          *(undefined1 (*) [16])(local_b50.ray + 0x110) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x60));
                          *(undefined1 (*) [16])(local_b50.ray + 0x120) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x70));
                          *(undefined1 (*) [16])(local_b50.ray + 0x130) = auVar196;
                          auVar196 = vmaskmovps_avx(auVar173,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x80));
                          *(undefined1 (*) [16])(local_b50.ray + 0x140) = auVar196;
                        }
                      }
                      auVar266 = ZEXT464((uint)fVar169);
                      auVar120._8_8_ = 0x100000001;
                      auVar120._0_8_ = 0x100000001;
                      if ((auVar120 & auVar304) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar169;
                      }
                    }
                  }
                }
              }
            }
LAB_00ad02f4:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar354._4_4_ = uVar8;
            auVar354._0_4_ = uVar8;
            auVar354._8_4_ = uVar8;
            auVar354._12_4_ = uVar8;
            auVar354._16_4_ = uVar8;
            auVar354._20_4_ = uVar8;
            auVar354._24_4_ = uVar8;
            auVar354._28_4_ = uVar8;
            auVar228 = ZEXT3264(auVar354);
            auVar126 = vcmpps_avx(_local_9c0,auVar354,2);
            auVar126 = vandps_avx(auVar126,local_4c0);
          }
          auVar131._0_4_ = (float)local_a40._0_4_ + (float)local_8e0._0_4_;
          auVar131._4_4_ = (float)local_a40._4_4_ + (float)local_8e0._4_4_;
          auVar131._8_4_ = fStack_a38 + fStack_8d8;
          auVar131._12_4_ = fStack_a34 + fStack_8d4;
          auVar131._16_4_ = fStack_a30 + fStack_8d0;
          auVar131._20_4_ = fStack_a2c + fStack_8cc;
          auVar131._24_4_ = fStack_a28 + fStack_8c8;
          auVar131._28_4_ = fStack_a24 + fStack_8c4;
          auVar196 = vshufps_avx(auVar228._0_16_,auVar228._0_16_,0);
          auVar165._16_16_ = auVar196;
          auVar165._0_16_ = auVar196;
          auVar126 = vcmpps_avx(auVar131,auVar165,2);
          _local_8e0 = vandps_avx(auVar126,local_900);
          auVar132._8_4_ = 3;
          auVar132._0_8_ = 0x300000003;
          auVar132._12_4_ = 3;
          auVar132._16_4_ = 3;
          auVar132._20_4_ = 3;
          auVar132._24_4_ = 3;
          auVar132._28_4_ = 3;
          auVar166._8_4_ = 2;
          auVar166._0_8_ = 0x200000002;
          auVar166._12_4_ = 2;
          auVar166._16_4_ = 2;
          auVar166._20_4_ = 2;
          auVar166._24_4_ = 2;
          auVar166._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar166,auVar132,local_700);
          auVar196 = vpcmpgtd_avx(auVar126._16_16_,local_740._0_16_);
          auVar304 = vpshufd_avx(local_720._0_16_,0);
          auVar304 = vpcmpgtd_avx(auVar126._0_16_,auVar304);
          auVar167._16_16_ = auVar196;
          auVar167._0_16_ = auVar304;
          local_900 = vblendps_avx(ZEXT1632(auVar304),auVar167,0xf0);
          local_920 = vandnps_avx(local_900,_local_8e0);
          local_7a0 = _local_460;
          local_9c0._4_4_ = (float)local_a40._4_4_ + (float)local_460._4_4_;
          local_9c0._0_4_ = (float)local_a40._0_4_ + (float)local_460._0_4_;
          fStack_9b8 = fStack_a38 + fStack_458;
          fStack_9b4 = fStack_a34 + fStack_454;
          fStack_9b0 = fStack_a30 + fStack_450;
          fStack_9ac = fStack_a2c + fStack_44c;
          fStack_9a8 = fStack_a28 + fStack_448;
          fStack_9a4 = fStack_a24 + fStack_444;
          for (; (((((((local_920 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_920 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_920 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_920 >> 0x7f,0) != '\0') ||
                   (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_920 >> 0xbf,0) != '\0') ||
                 (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_920[0x1f] < '\0'; local_920 = vandps_avx(auVar126,local_920)) {
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar126 = vblendvps_avx(auVar168,local_7a0,local_920);
            auVar134 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar134 = vminps_avx(auVar126,auVar134);
            auVar26 = vshufpd_avx(auVar134,auVar134,5);
            auVar134 = vminps_avx(auVar134,auVar26);
            auVar26 = vperm2f128_avx(auVar134,auVar134,1);
            auVar134 = vminps_avx(auVar134,auVar26);
            auVar134 = vcmpps_avx(auVar126,auVar134,0);
            auVar26 = local_920 & auVar134;
            auVar126 = local_920;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar134,local_920);
            }
            uVar102 = vmovmskps_avx(auVar126);
            uVar110 = 0;
            if (uVar102 != 0) {
              for (; (uVar102 >> uVar110 & 1) == 0; uVar110 = uVar110 + 1) {
              }
            }
            uVar103 = (ulong)uVar110;
            *(undefined4 *)(local_920 + uVar103 * 4) = 0;
            fVar138 = local_1c0[uVar103];
            uVar110 = *(uint *)(local_440 + uVar103 * 4);
            fVar229 = auVar33._0_4_;
            if ((float)local_a60._0_4_ < 0.0) {
              auVar367 = ZEXT1664(auVar367._0_16_);
              auVar385 = ZEXT1664(auVar385._0_16_);
              auVar402 = ZEXT1664(auVar402._0_16_);
              fVar229 = sqrtf((float)local_a60._0_4_);
            }
            auVar292 = ZEXT464(uVar110);
            auVar266 = ZEXT464((uint)fVar138);
            auVar304 = vminps_avx(_local_ac0,_local_9e0);
            auVar196 = vmaxps_avx(_local_ac0,_local_9e0);
            auVar115 = vminps_avx(auVar34,_local_a00);
            auVar173 = vminps_avx(auVar304,auVar115);
            auVar304 = vmaxps_avx(auVar34,_local_a00);
            auVar115 = vmaxps_avx(auVar196,auVar304);
            auVar199._8_4_ = 0x7fffffff;
            auVar199._0_8_ = 0x7fffffff7fffffff;
            auVar199._12_4_ = 0x7fffffff;
            auVar196 = vandps_avx(auVar173,auVar199);
            auVar304 = vandps_avx(auVar115,auVar199);
            auVar196 = vmaxps_avx(auVar196,auVar304);
            auVar304 = vmovshdup_avx(auVar196);
            auVar304 = vmaxss_avx(auVar304,auVar196);
            auVar196 = vshufpd_avx(auVar196,auVar196,1);
            auVar196 = vmaxss_avx(auVar196,auVar304);
            local_b20._0_4_ = auVar196._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar229 * 1.9073486e-06;
            local_aa0._0_16_ = vshufps_avx(auVar115,auVar115,0xff);
            auVar196 = vinsertps_avx(ZEXT416(uVar110),ZEXT416((uint)fVar138),0x10);
            auVar228 = ZEXT1664(auVar196);
            lVar105 = 5;
            do {
              do {
                auVar196 = auVar228._0_16_;
                bVar111 = lVar105 == 0;
                lVar105 = lVar105 + -1;
                if (bVar111) goto LAB_00ad0ebe;
                auVar304 = vmovshdup_avx(auVar196);
                fVar138 = auVar304._0_4_;
                fVar137 = 1.0 - fVar138;
                fVar229 = fVar137 * fVar137 * fVar137;
                fVar169 = fVar138 * fVar138 * fVar138;
                fVar230 = fVar138 * fVar137;
                auVar304 = vshufps_avx(ZEXT416((uint)(fVar169 * 0.16666667)),
                                       ZEXT416((uint)(fVar169 * 0.16666667)),0);
                auVar115 = ZEXT416((uint)((fVar169 * 4.0 + fVar229 +
                                          fVar138 * fVar230 * 12.0 + fVar137 * fVar230 * 6.0) *
                                         0.16666667));
                auVar115 = vshufps_avx(auVar115,auVar115,0);
                auVar173 = ZEXT416((uint)((fVar229 * 4.0 + fVar169 +
                                          fVar137 * fVar230 * 12.0 + fVar138 * fVar230 * 6.0) *
                                         0.16666667));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar117 = vshufps_avx(auVar196,auVar196,0);
                auVar177._0_4_ = auVar117._0_4_ * (float)local_a50._0_4_ + 0.0;
                auVar177._4_4_ = auVar117._4_4_ * (float)local_a50._4_4_ + 0.0;
                auVar177._8_4_ = auVar117._8_4_ * fStack_a48 + 0.0;
                auVar177._12_4_ = auVar117._12_4_ * fStack_a44 + 0.0;
                auVar117 = vshufps_avx(ZEXT416((uint)(fVar229 * 0.16666667)),
                                       ZEXT416((uint)(fVar229 * 0.16666667)),0);
                auVar121._0_4_ =
                     auVar117._0_4_ * (float)local_ac0._0_4_ +
                     auVar173._0_4_ * (float)local_9e0._0_4_ +
                     auVar304._0_4_ * (float)local_a00._0_4_ +
                     auVar115._0_4_ * (float)local_c50._0_4_;
                auVar121._4_4_ =
                     auVar117._4_4_ * (float)local_ac0._4_4_ +
                     auVar173._4_4_ * (float)local_9e0._4_4_ +
                     auVar304._4_4_ * (float)local_a00._4_4_ +
                     auVar115._4_4_ * (float)local_c50._4_4_;
                auVar121._8_4_ =
                     auVar117._8_4_ * fStack_ab8 +
                     auVar173._8_4_ * fStack_9d8 +
                     auVar304._8_4_ * fStack_9f8 + auVar115._8_4_ * fStack_c48;
                auVar121._12_4_ =
                     auVar117._12_4_ * fStack_ab4 +
                     auVar173._12_4_ * fStack_9d4 +
                     auVar304._12_4_ * fStack_9f4 + auVar115._12_4_ * fStack_c44;
                local_ae0._0_16_ = auVar121;
                auVar304 = vsubps_avx(auVar177,auVar121);
                local_a20 = auVar304._0_4_;
                fStack_a1c = auVar304._4_4_;
                fStack_a18 = auVar304._8_4_;
                fStack_a14 = auVar304._12_4_;
                auVar304 = vdpps_avx(auVar304,auVar304,0x7f);
                fVar229 = auVar304._0_4_;
                if (fVar229 < 0.0) {
                  auVar250._0_4_ = sqrtf(fVar229);
                  auVar250._4_60_ = extraout_var_00;
                  auVar115 = auVar250._0_16_;
                }
                else {
                  auVar115 = vsqrtss_avx(auVar304,auVar304);
                }
                auVar385 = ZEXT1664(auVar115);
                auVar173 = ZEXT416((uint)(fVar138 * fVar138 * 0.5));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar117 = ZEXT416((uint)((fVar137 * fVar137 + fVar230 * 4.0) * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar142 = ZEXT416((uint)((fVar138 * -fVar138 - fVar230 * 4.0) * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar116 = ZEXT416((uint)(fVar137 * -fVar137 * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar306._0_4_ =
                     (float)local_ac0._0_4_ * auVar116._0_4_ +
                     (float)local_9e0._0_4_ * auVar142._0_4_ +
                     (float)local_a00._0_4_ * auVar173._0_4_ +
                     (float)local_c50._0_4_ * auVar117._0_4_;
                auVar306._4_4_ =
                     (float)local_ac0._4_4_ * auVar116._4_4_ +
                     (float)local_9e0._4_4_ * auVar142._4_4_ +
                     (float)local_a00._4_4_ * auVar173._4_4_ +
                     (float)local_c50._4_4_ * auVar117._4_4_;
                auVar306._8_4_ =
                     fStack_ab8 * auVar116._8_4_ +
                     fStack_9d8 * auVar142._8_4_ +
                     fStack_9f8 * auVar173._8_4_ + fStack_c48 * auVar117._8_4_;
                auVar306._12_4_ =
                     fStack_ab4 * auVar116._12_4_ +
                     fStack_9d4 * auVar142._12_4_ +
                     fStack_9f4 * auVar173._12_4_ + fStack_c44 * auVar117._12_4_;
                auVar173 = vshufps_avx(auVar196,auVar196,0x55);
                auVar117 = ZEXT416((uint)(fVar137 - (fVar138 + fVar138)));
                auVar142 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)(fVar138 - (fVar137 + fVar137)));
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar35 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
                auVar117 = vdpps_avx(auVar306,auVar306,0x7f);
                auVar148._0_4_ =
                     (float)local_ac0._0_4_ * auVar35._0_4_ +
                     (float)local_9e0._0_4_ * auVar116._0_4_ +
                     (float)local_a00._0_4_ * auVar173._0_4_ +
                     (float)local_c50._0_4_ * auVar142._0_4_;
                auVar148._4_4_ =
                     (float)local_ac0._4_4_ * auVar35._4_4_ +
                     (float)local_9e0._4_4_ * auVar116._4_4_ +
                     (float)local_a00._4_4_ * auVar173._4_4_ +
                     (float)local_c50._4_4_ * auVar142._4_4_;
                auVar148._8_4_ =
                     fStack_ab8 * auVar35._8_4_ +
                     fStack_9d8 * auVar116._8_4_ +
                     fStack_9f8 * auVar173._8_4_ + fStack_c48 * auVar142._8_4_;
                auVar148._12_4_ =
                     fStack_ab4 * auVar35._12_4_ +
                     fStack_9d4 * auVar116._12_4_ +
                     fStack_9f4 * auVar173._12_4_ + fStack_c44 * auVar142._12_4_;
                auVar173 = vblendps_avx(auVar117,_DAT_01f45a50,0xe);
                auVar142 = vrsqrtss_avx(auVar173,auVar173);
                fVar169 = auVar142._0_4_;
                fVar138 = auVar117._0_4_;
                auVar142 = vdpps_avx(auVar306,auVar148,0x7f);
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar149._0_4_ = auVar148._0_4_ * auVar116._0_4_;
                auVar149._4_4_ = auVar148._4_4_ * auVar116._4_4_;
                auVar149._8_4_ = auVar148._8_4_ * auVar116._8_4_;
                auVar149._12_4_ = auVar148._12_4_ * auVar116._12_4_;
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar217._0_4_ = auVar306._0_4_ * auVar142._0_4_;
                auVar217._4_4_ = auVar306._4_4_ * auVar142._4_4_;
                auVar217._8_4_ = auVar306._8_4_ * auVar142._8_4_;
                auVar217._12_4_ = auVar306._12_4_ * auVar142._12_4_;
                auVar35 = vsubps_avx(auVar149,auVar217);
                auVar142 = vrcpss_avx(auVar173,auVar173);
                auVar173 = vmaxss_avx(ZEXT416((uint)local_b20._0_4_),
                                      ZEXT416((uint)(auVar228._0_4_ * (float)local_9a0._0_4_)));
                auVar367 = ZEXT1664(auVar173);
                auVar142 = ZEXT416((uint)(auVar142._0_4_ * (2.0 - fVar138 * auVar142._0_4_)));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                uVar103 = CONCAT44(auVar306._4_4_,auVar306._0_4_);
                auVar239._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar239._8_4_ = -auVar306._8_4_;
                auVar239._12_4_ = -auVar306._12_4_;
                auVar116 = ZEXT416((uint)(fVar169 * 1.5 +
                                         fVar138 * -0.5 * fVar169 * fVar169 * fVar169));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar200._0_4_ = auVar116._0_4_ * auVar35._0_4_ * auVar142._0_4_;
                auVar200._4_4_ = auVar116._4_4_ * auVar35._4_4_ * auVar142._4_4_;
                auVar200._8_4_ = auVar116._8_4_ * auVar35._8_4_ * auVar142._8_4_;
                auVar200._12_4_ = auVar116._12_4_ * auVar35._12_4_ * auVar142._12_4_;
                auVar260._0_4_ = auVar306._0_4_ * auVar116._0_4_;
                auVar260._4_4_ = auVar306._4_4_ * auVar116._4_4_;
                auVar260._8_4_ = auVar306._8_4_ * auVar116._8_4_;
                auVar260._12_4_ = auVar306._12_4_ * auVar116._12_4_;
                if (fVar138 < 0.0) {
                  local_a80._0_16_ = auVar200;
                  fVar138 = sqrtf(fVar138);
                  auVar385 = ZEXT464(auVar115._0_4_);
                  auVar367 = ZEXT464(auVar173._0_4_);
                  auVar200 = local_a80._0_16_;
                }
                else {
                  auVar115 = vsqrtss_avx(auVar117,auVar117);
                  fVar138 = auVar115._0_4_;
                }
                auVar98._4_4_ = fStack_a1c;
                auVar98._0_4_ = local_a20;
                auVar98._8_4_ = fStack_a18;
                auVar98._12_4_ = fStack_a14;
                auVar115 = vdpps_avx(auVar98,auVar260,0x7f);
                fVar138 = ((float)local_b20._0_4_ / fVar138) * (auVar385._0_4_ + 1.0) +
                          auVar367._0_4_ + auVar385._0_4_ * (float)local_b20._0_4_;
                auVar117 = vdpps_avx(auVar239,auVar260,0x7f);
                auVar142 = vdpps_avx(auVar98,auVar200,0x7f);
                auVar116 = vdpps_avx(_local_a50,auVar260,0x7f);
                auVar35 = vdpps_avx(auVar98,auVar239,0x7f);
                fVar169 = auVar117._0_4_ + auVar142._0_4_;
                fVar230 = auVar115._0_4_;
                auVar122._0_4_ = fVar230 * fVar230;
                auVar122._4_4_ = auVar115._4_4_ * auVar115._4_4_;
                auVar122._8_4_ = auVar115._8_4_ * auVar115._8_4_;
                auVar122._12_4_ = auVar115._12_4_ * auVar115._12_4_;
                auVar142 = vsubps_avx(auVar304,auVar122);
                auVar117 = vdpps_avx(auVar98,_local_a50,0x7f);
                fVar137 = auVar35._0_4_ - fVar230 * fVar169;
                fVar231 = auVar117._0_4_ - fVar230 * auVar116._0_4_;
                auVar117 = vrsqrtss_avx(auVar142,auVar142);
                fVar170 = auVar142._0_4_;
                fVar230 = auVar117._0_4_;
                fVar230 = fVar230 * 1.5 + fVar170 * -0.5 * fVar230 * fVar230 * fVar230;
                if (fVar170 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar169);
                  local_880._0_4_ = fVar137;
                  local_8a0._0_4_ = fVar231;
                  local_8c0._0_4_ = fVar230;
                  auVar385 = ZEXT1664(auVar385._0_16_);
                  fVar170 = sqrtf(fVar170);
                  auVar367 = ZEXT464(auVar173._0_4_);
                  fVar230 = (float)local_8c0._0_4_;
                  fVar137 = (float)local_880._0_4_;
                  fVar231 = (float)local_8a0._0_4_;
                  auVar173 = local_a80._0_16_;
                }
                else {
                  auVar173 = vsqrtss_avx(auVar142,auVar142);
                  fVar170 = auVar173._0_4_;
                  auVar173 = ZEXT416((uint)fVar169);
                }
                auVar402 = ZEXT1664(auVar115);
                auVar292 = ZEXT1664(auVar304);
                auVar119 = vpermilps_avx(local_ae0._0_16_,0xff);
                auVar35 = vshufps_avx(auVar306,auVar306,0xff);
                fVar137 = fVar137 * fVar230 - auVar35._0_4_;
                auVar218._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar218._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar218._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar240._0_4_ = -fVar137;
                auVar240._4_4_ = 0x80000000;
                auVar240._8_4_ = 0x80000000;
                auVar240._12_4_ = 0x80000000;
                fVar169 = auVar173._0_4_ * fVar231 * fVar230;
                auVar266 = ZEXT464((uint)fVar169);
                auVar117 = vinsertps_avx(auVar240,ZEXT416((uint)(fVar231 * fVar230)),0x1c);
                auVar142 = vmovsldup_avx(ZEXT416((uint)(fVar169 - auVar116._0_4_ * fVar137)));
                auVar117 = vdivps_avx(auVar117,auVar142);
                auVar173 = vinsertps_avx(auVar173,auVar218,0x10);
                auVar173 = vdivps_avx(auVar173,auVar142);
                auVar142 = vmovsldup_avx(auVar115);
                auVar119 = ZEXT416((uint)(fVar170 - auVar119._0_4_));
                auVar116 = vmovsldup_avx(auVar119);
                auVar178._0_4_ = auVar142._0_4_ * auVar117._0_4_ + auVar116._0_4_ * auVar173._0_4_;
                auVar178._4_4_ = auVar142._4_4_ * auVar117._4_4_ + auVar116._4_4_ * auVar173._4_4_;
                auVar178._8_4_ = auVar142._8_4_ * auVar117._8_4_ + auVar116._8_4_ * auVar173._8_4_;
                auVar178._12_4_ =
                     auVar142._12_4_ * auVar117._12_4_ + auVar116._12_4_ * auVar173._12_4_;
                auVar173 = vsubps_avx(auVar196,auVar178);
                auVar228 = ZEXT1664(auVar173);
                auVar179._8_4_ = 0x7fffffff;
                auVar179._0_8_ = 0x7fffffff7fffffff;
                auVar179._12_4_ = 0x7fffffff;
                auVar196 = vandps_avx(auVar115,auVar179);
              } while (fVar138 <= auVar196._0_4_);
              auVar201._8_4_ = 0x7fffffff;
              auVar201._0_8_ = 0x7fffffff7fffffff;
              auVar201._12_4_ = 0x7fffffff;
              auVar196 = vandps_avx(auVar119,auVar201);
            } while ((float)local_aa0._0_4_ * 1.9073486e-06 + auVar367._0_4_ + fVar138 <=
                     auVar196._0_4_);
            fVar138 = auVar173._0_4_ + (float)local_970._0_4_;
            if (fVar210 <= fVar138) {
              fVar169 = *(float *)(ray + k * 4 + 0x80);
              auVar266 = ZEXT464((uint)fVar169);
              if (fVar138 <= fVar169) {
                auVar196 = vmovshdup_avx(auVar173);
                fVar230 = auVar196._0_4_;
                if ((0.0 <= fVar230) && (fVar230 <= 1.0)) {
                  auVar196 = vrsqrtss_avx(auVar304,auVar304);
                  fVar137 = auVar196._0_4_;
                  pGVar20 = (context->scene->geometries).items[uVar106].ptr;
                  if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar196 = ZEXT416((uint)(fVar137 * 1.5 +
                                             fVar229 * -0.5 * fVar137 * fVar137 * fVar137));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar202._0_4_ = auVar196._0_4_ * local_a20;
                    auVar202._4_4_ = auVar196._4_4_ * fStack_a1c;
                    auVar202._8_4_ = auVar196._8_4_ * fStack_a18;
                    auVar202._12_4_ = auVar196._12_4_ * fStack_a14;
                    auVar150._0_4_ = auVar306._0_4_ + auVar35._0_4_ * auVar202._0_4_;
                    auVar150._4_4_ = auVar306._4_4_ + auVar35._4_4_ * auVar202._4_4_;
                    auVar150._8_4_ = auVar306._8_4_ + auVar35._8_4_ * auVar202._8_4_;
                    auVar150._12_4_ = auVar306._12_4_ + auVar35._12_4_ * auVar202._12_4_;
                    auVar196 = vshufps_avx(auVar202,auVar202,0xc9);
                    auVar117 = vshufps_avx(auVar306,auVar306,0xc9);
                    auVar203._0_4_ = auVar117._0_4_ * auVar202._0_4_;
                    auVar203._4_4_ = auVar117._4_4_ * auVar202._4_4_;
                    auVar203._8_4_ = auVar117._8_4_ * auVar202._8_4_;
                    auVar203._12_4_ = auVar117._12_4_ * auVar202._12_4_;
                    auVar219._0_4_ = auVar306._0_4_ * auVar196._0_4_;
                    auVar219._4_4_ = auVar306._4_4_ * auVar196._4_4_;
                    auVar219._8_4_ = auVar306._8_4_ * auVar196._8_4_;
                    auVar219._12_4_ = auVar306._12_4_ * auVar196._12_4_;
                    auVar142 = vsubps_avx(auVar219,auVar203);
                    auVar196 = vshufps_avx(auVar142,auVar142,0xc9);
                    auVar117 = vshufps_avx(auVar150,auVar150,0xc9);
                    auVar220._0_4_ = auVar117._0_4_ * auVar196._0_4_;
                    auVar220._4_4_ = auVar117._4_4_ * auVar196._4_4_;
                    auVar220._8_4_ = auVar117._8_4_ * auVar196._8_4_;
                    auVar220._12_4_ = auVar117._12_4_ * auVar196._12_4_;
                    auVar196 = vshufps_avx(auVar142,auVar142,0xd2);
                    auVar151._0_4_ = auVar150._0_4_ * auVar196._0_4_;
                    auVar151._4_4_ = auVar150._4_4_ * auVar196._4_4_;
                    auVar151._8_4_ = auVar150._8_4_ * auVar196._8_4_;
                    auVar151._12_4_ = auVar150._12_4_ * auVar196._12_4_;
                    auVar196 = vsubps_avx(auVar220,auVar151);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar138;
                      uVar8 = vextractps_avx(auVar196,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                      uVar8 = vextractps_avx(auVar196,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                      *(int *)(ray + k * 4 + 0xe0) = auVar196._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar230;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_ae8;
                      *(uint *)(ray + k * 4 + 0x120) = uVar106;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_810 = vshufps_avx(auVar173,auVar173,0x55);
                      auVar173 = vshufps_avx(auVar196,auVar196,0x55);
                      auStack_830 = vshufps_avx(auVar196,auVar196,0xaa);
                      local_820 = vshufps_avx(auVar196,auVar196,0);
                      local_840 = (RTCHitN  [16])auVar173;
                      local_800 = ZEXT816(0) << 0x20;
                      local_7f0 = local_860._0_8_;
                      uStack_7e8 = local_860._8_8_;
                      local_7e0 = local_850;
                      vcmpps_avx(ZEXT1632(local_850),ZEXT1632(local_850),0xf);
                      uStack_7cc = context->user->instID[0];
                      local_7d0 = uStack_7cc;
                      uStack_7c8 = uStack_7cc;
                      uStack_7c4 = uStack_7cc;
                      uVar110 = context->user->instPrimID[0];
                      auVar152._4_4_ = uVar110;
                      auVar152._0_4_ = uVar110;
                      auVar152._8_4_ = uVar110;
                      auVar152._12_4_ = uVar110;
                      auStack_7c0 = auVar152;
                      *(float *)(ray + k * 4 + 0x80) = fVar138;
                      local_960 = *local_af0;
                      local_b50.valid = (int *)local_960;
                      local_b50.geometryUserPtr = pGVar20->userPtr;
                      local_b50.context = context->user;
                      local_b50.hit = local_840;
                      local_b50.N = 4;
                      local_b50.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar292 = ZEXT1664(auVar304);
                        auVar367 = ZEXT1664(auVar367._0_16_);
                        auVar385 = ZEXT1664(auVar385._0_16_);
                        auVar402 = ZEXT1664(auVar115);
                        (*pGVar20->intersectionFilterN)(&local_b50);
                        auVar228._8_56_ = extraout_var_02;
                        auVar228._0_8_ = extraout_XMM1_Qa_00;
                        auVar152 = auVar228._0_16_;
                      }
                      if (local_960 == (undefined1  [16])0x0) {
                        auVar196 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar304 = vpcmpeqd_avx(auVar152,auVar152);
                        auVar196 = auVar196 ^ auVar304;
                      }
                      else {
                        p_Var25 = context->args->filter;
                        auVar304 = vpcmpeqd_avx(auVar173,auVar173);
                        if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar292 = ZEXT1664(auVar292._0_16_);
                          auVar367 = ZEXT1664(auVar367._0_16_);
                          auVar385 = ZEXT1664(auVar385._0_16_);
                          auVar402 = ZEXT1664(auVar402._0_16_);
                          (*p_Var25)(&local_b50);
                          auVar304 = vpcmpeqd_avx(auVar304,auVar304);
                        }
                        auVar115 = vpcmpeqd_avx(local_960,_DAT_01f45a50);
                        auVar196 = auVar115 ^ auVar304;
                        if (local_960 != (undefined1  [16])0x0) {
                          auVar115 = auVar115 ^ auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])local_b50.hit);
                          *(undefined1 (*) [16])(local_b50.ray + 0xc0) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x10));
                          *(undefined1 (*) [16])(local_b50.ray + 0xd0) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x20));
                          *(undefined1 (*) [16])(local_b50.ray + 0xe0) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x30));
                          *(undefined1 (*) [16])(local_b50.ray + 0xf0) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x40));
                          *(undefined1 (*) [16])(local_b50.ray + 0x100) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x50));
                          *(undefined1 (*) [16])(local_b50.ray + 0x110) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x60));
                          *(undefined1 (*) [16])(local_b50.ray + 0x120) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x70));
                          *(undefined1 (*) [16])(local_b50.ray + 0x130) = auVar304;
                          auVar304 = vmaskmovps_avx(auVar115,*(undefined1 (*) [16])
                                                              (local_b50.hit + 0x80));
                          *(undefined1 (*) [16])(local_b50.ray + 0x140) = auVar304;
                        }
                      }
                      auVar266 = ZEXT464((uint)fVar169);
                      auVar123._8_8_ = 0x100000001;
                      auVar123._0_8_ = 0x100000001;
                      if ((auVar123 & auVar196) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar169;
                      }
                    }
                  }
                }
              }
            }
LAB_00ad0ebe:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar355._4_4_ = uVar8;
            auVar355._0_4_ = uVar8;
            auVar355._8_4_ = uVar8;
            auVar355._12_4_ = uVar8;
            auVar355._16_4_ = uVar8;
            auVar355._20_4_ = uVar8;
            auVar355._24_4_ = uVar8;
            auVar355._28_4_ = uVar8;
            auVar228 = ZEXT3264(auVar355);
            auVar126 = vcmpps_avx(_local_9c0,auVar355,2);
          }
          auVar126 = vandps_avx(local_6e0,local_6c0);
          auVar134 = vandps_avx(local_900,_local_8e0);
          auVar187._0_4_ = local_a40._0_4_ + local_4a0._0_4_;
          auVar187._4_4_ = local_a40._4_4_ + local_4a0._4_4_;
          auVar187._8_4_ = local_a40._8_4_ + local_4a0._8_4_;
          auVar187._12_4_ = local_a40._12_4_ + local_4a0._12_4_;
          auVar187._16_4_ = local_a40._16_4_ + local_4a0._16_4_;
          auVar187._20_4_ = local_a40._20_4_ + local_4a0._20_4_;
          auVar187._24_4_ = local_a40._24_4_ + local_4a0._24_4_;
          auVar187._28_4_ = local_a40._28_4_ + local_4a0._28_4_;
          auVar196 = vshufps_avx(auVar228._0_16_,auVar228._0_16_,0);
          auVar356 = ZEXT3264(_local_a40);
          auVar227._16_16_ = auVar196;
          auVar227._0_16_ = auVar196;
          auVar26 = vcmpps_avx(auVar187,auVar227,2);
          auVar126 = vandps_avx(auVar26,auVar126);
          auVar248._0_4_ = local_a40._0_4_ + local_460._0_4_;
          auVar248._4_4_ = local_a40._4_4_ + local_460._4_4_;
          auVar248._8_4_ = local_a40._8_4_ + local_460._8_4_;
          auVar248._12_4_ = local_a40._12_4_ + local_460._12_4_;
          auVar248._16_4_ = local_a40._16_4_ + local_460._16_4_;
          auVar248._20_4_ = local_a40._20_4_ + local_460._20_4_;
          auVar248._24_4_ = local_a40._24_4_ + local_460._24_4_;
          auVar248._28_4_ = local_a40._28_4_ + local_460._28_4_;
          auVar250 = ZEXT3264(auVar248);
          auVar26 = vcmpps_avx(auVar248,auVar227,2);
          auVar134 = vandps_avx(auVar26,auVar134);
          auVar134 = vorps_avx(auVar126,auVar134);
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            uVar104 = (ulong)uVar109;
            *(undefined1 (*) [32])(auStack_180 + uVar104 * 0x60) = auVar134;
            auVar126 = vblendvps_avx(_local_460,_local_4a0,auVar126);
            *(undefined1 (*) [32])(auStack_160 + uVar104 * 0x60) = auVar126;
            uVar103 = vmovlps_avx(local_690);
            (&uStack_140)[uVar104 * 0xc] = uVar103;
            auStack_138[uVar104 * 0x18] = uVar108 + 1;
            uVar109 = uVar109 + 1;
          }
          auVar228 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
      }
    }
    do {
      uVar110 = uVar109;
      if (uVar110 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar136._4_4_ = uVar8;
        auVar136._0_4_ = uVar8;
        auVar136._8_4_ = uVar8;
        auVar136._12_4_ = uVar8;
        auVar136._16_4_ = uVar8;
        auVar136._20_4_ = uVar8;
        auVar136._24_4_ = uVar8;
        auVar136._28_4_ = uVar8;
        auVar126 = vcmpps_avx(local_3a0,auVar136,2);
        uVar106 = vmovmskps_avx(auVar126);
        uVar106 = (uint)local_948 - 1 & (uint)local_948 & uVar106;
        goto LAB_00ace738;
      }
      uVar103 = (ulong)(uVar110 - 1);
      lVar105 = uVar103 * 0x60;
      auVar126 = *(undefined1 (*) [32])(auStack_160 + lVar105);
      auVar133._0_4_ = auVar356._0_4_ + auVar126._0_4_;
      auVar133._4_4_ = auVar356._4_4_ + auVar126._4_4_;
      auVar133._8_4_ = auVar356._8_4_ + auVar126._8_4_;
      auVar133._12_4_ = auVar356._12_4_ + auVar126._12_4_;
      auVar133._16_4_ = auVar356._16_4_ + auVar126._16_4_;
      auVar133._20_4_ = auVar356._20_4_ + auVar126._20_4_;
      auVar133._24_4_ = auVar356._24_4_ + auVar126._24_4_;
      auVar133._28_4_ = auVar356._28_4_ + auVar126._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar207._4_4_ = uVar8;
      auVar207._0_4_ = uVar8;
      auVar207._8_4_ = uVar8;
      auVar207._12_4_ = uVar8;
      auVar207._16_4_ = uVar8;
      auVar207._20_4_ = uVar8;
      auVar207._24_4_ = uVar8;
      auVar207._28_4_ = uVar8;
      auVar26 = vcmpps_avx(auVar133,auVar207,2);
      auVar134 = vandps_avx(auVar26,*(undefined1 (*) [32])(auStack_180 + lVar105));
      _local_840 = auVar134;
      auVar26 = *(undefined1 (*) [32])(auStack_180 + lVar105) & auVar26;
      uVar109 = uVar110 - 1;
    } while ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar26 >> 0x7f,0) == '\0') &&
               (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar26 >> 0xbf,0) == '\0') &&
             (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar26[0x1f]);
    auVar188._8_4_ = 0x7f800000;
    auVar188._0_8_ = 0x7f8000007f800000;
    auVar188._12_4_ = 0x7f800000;
    auVar188._16_4_ = 0x7f800000;
    auVar188._20_4_ = 0x7f800000;
    auVar188._24_4_ = 0x7f800000;
    auVar188._28_4_ = 0x7f800000;
    auVar126 = vblendvps_avx(auVar188,auVar126,auVar134);
    auVar26 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar26 = vminps_avx(auVar126,auVar26);
    auVar27 = vshufpd_avx(auVar26,auVar26,5);
    auVar26 = vminps_avx(auVar26,auVar27);
    auVar27 = vperm2f128_avx(auVar26,auVar26,1);
    auVar26 = vminps_avx(auVar26,auVar27);
    auVar126 = vcmpps_avx(auVar126,auVar26,0);
    auVar26 = auVar134 & auVar126;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar134 = vandps_avx(auVar126,auVar134);
    }
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (&uStack_140)[uVar103 * 0xc];
    uVar108 = auStack_138[uVar103 * 0x18];
    uVar109 = vmovmskps_avx(auVar134);
    uVar102 = 0;
    if (uVar109 != 0) {
      for (; (uVar109 >> uVar102 & 1) == 0; uVar102 = uVar102 + 1) {
      }
    }
    *(undefined4 *)(local_840 + (ulong)uVar102 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar105) = _local_840;
    uVar109 = uVar110 - 1;
    if ((((((((_local_840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_840 >> 0x7f,0) != '\0') ||
          (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_840 >> 0xbf,0) != '\0') ||
        (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_840[0x1f] < '\0') {
      uVar109 = uVar110;
    }
    auVar196 = vshufps_avx(auVar153,auVar153,0);
    auVar304 = vshufps_avx(auVar153,auVar153,0x55);
    auVar304 = vsubps_avx(auVar304,auVar196);
    local_4a0._4_4_ = auVar196._4_4_ + auVar304._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar196._0_4_ + auVar304._0_4_ * 0.0;
    fStack_498 = auVar196._8_4_ + auVar304._8_4_ * 0.2857143;
    fStack_494 = auVar196._12_4_ + auVar304._12_4_ * 0.42857146;
    fStack_490 = auVar196._0_4_ + auVar304._0_4_ * 0.5714286;
    fStack_48c = auVar196._4_4_ + auVar304._4_4_ * 0.71428573;
    fStack_488 = auVar196._8_4_ + auVar304._8_4_ * 0.8571429;
    fStack_484 = auVar196._12_4_ + auVar304._12_4_;
    local_690._8_8_ = 0;
    local_690._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar102 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }